

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersectorK<4,8>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined1 (*pauVar7) [28];
  undefined1 (*pauVar8) [28];
  undefined1 (*pauVar9) [32];
  undefined1 (*pauVar10) [16];
  Primitive PVar11;
  uint uVar12;
  uint uVar13;
  Geometry *pGVar14;
  __int_type_conflict _Var15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined8 uVar106;
  undefined8 uVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [28];
  undefined1 auVar115 [28];
  undefined1 auVar116 [28];
  undefined1 auVar117 [24];
  undefined1 auVar118 [28];
  undefined1 auVar119 [12];
  uint uVar120;
  uint uVar121;
  uint uVar122;
  ulong uVar123;
  ulong uVar124;
  uint uVar125;
  long lVar126;
  long lVar127;
  long lVar128;
  undefined4 uVar129;
  undefined8 unaff_R13;
  float fVar130;
  float fVar152;
  float fVar153;
  vint4 ai;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar131;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar157;
  float fVar159;
  float fVar161;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar158;
  float fVar160;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar166;
  float fVar182;
  float fVar184;
  undefined1 auVar168 [16];
  float fVar167;
  float fVar183;
  float fVar185;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar187;
  undefined1 auVar174 [32];
  float fVar186;
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar188;
  float fVar203;
  float fVar204;
  vint4 bi_2;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  float fVar206;
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar205;
  undefined1 auVar202 [64];
  float fVar207;
  float fVar224;
  float fVar226;
  vint4 bi;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar208;
  undefined1 auVar212 [16];
  float fVar229;
  float fVar233;
  float fVar234;
  float fVar236;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar225;
  float fVar227;
  float fVar228;
  float fVar230;
  float fVar231;
  float fVar235;
  float fVar237;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar232;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar249;
  float fVar250;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  float fVar251;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar252;
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  vint4 ai_1;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  vint4 bi_1;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  float fVar264;
  undefined1 auVar263 [32];
  float fVar265;
  float fVar266;
  float fVar274;
  float fVar276;
  vint4 ai_2;
  undefined1 auVar267 [16];
  float fVar277;
  undefined1 auVar268 [16];
  undefined1 auVar270 [32];
  float fVar278;
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  float fVar275;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  undefined1 auVar273 [64];
  float fVar289;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  float fVar291;
  undefined1 auVar286 [32];
  float fVar290;
  float fVar292;
  float fVar294;
  float fVar296;
  undefined1 auVar287 [32];
  float fVar293;
  float fVar295;
  undefined1 auVar288 [64];
  float fVar297;
  float fVar298;
  float fVar308;
  float fVar310;
  undefined1 auVar299 [16];
  float fVar312;
  undefined1 auVar300 [16];
  float fVar314;
  float fVar315;
  float fVar316;
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  float fVar309;
  float fVar311;
  float fVar313;
  undefined1 auVar307 [64];
  undefined1 auVar317 [16];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  float fVar322;
  float fVar323;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  float fVar331;
  float fVar332;
  float fVar333;
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  float fVar348;
  undefined1 auVar344 [16];
  float fVar350;
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  float fVar349;
  undefined1 auVar347 [64];
  float fVar351;
  float fVar352;
  float fVar357;
  undefined1 auVar354 [32];
  float fVar356;
  float fVar358;
  float fVar359;
  undefined1 auVar355 [64];
  float fVar360;
  float fVar361;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_868;
  undefined8 uStack_858;
  RTCFilterFunctionNArguments local_850;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [8];
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  ulong local_770;
  undefined8 uStack_768;
  undefined1 *local_760;
  undefined1 (*local_758) [16];
  undefined1 (*local_750) [32];
  Precalculations *local_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [16];
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  LinearSpace3fa *local_610;
  Primitive *local_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [8];
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  uint local_360;
  uint local_35c;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined1 local_320 [16];
  float local_2e0 [4];
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  RTCHitN local_260 [16];
  undefined1 auStack_250 [16];
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar269 [16];
  undefined1 auVar285 [32];
  undefined1 auVar306 [64];
  undefined1 auVar353 [16];
  undefined1 auVar362 [16];
  
  PVar11 = prim[1];
  uVar123 = (ulong)(byte)PVar11;
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar123 * 4 + 6)));
  lVar128 = uVar123 * 0x25;
  auVar213 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar123 * 5 + 6)));
  auVar215 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar123 * 6 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar123 * 0xf + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar11 * 0x10 + 6)));
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar123 * 0x11 + 6)));
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar123 * 0x1a + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar123 * 0x1b + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar123 * 0x1c + 6)));
  auVar170 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar170 = vinsertps_avx(auVar170,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar195 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar195 = vinsertps_avx(auVar195,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar170 = vsubps_avx(auVar170,*(undefined1 (*) [16])(prim + lVar128 + 6));
  fVar322 = *(float *)(prim + lVar128 + 0x12);
  auVar238._0_4_ = fVar322 * auVar170._0_4_;
  auVar238._4_4_ = fVar322 * auVar170._4_4_;
  auVar238._8_4_ = fVar322 * auVar170._8_4_;
  auVar238._12_4_ = fVar322 * auVar170._12_4_;
  auVar324._0_4_ = fVar322 * auVar195._0_4_;
  auVar324._4_4_ = fVar322 * auVar195._4_4_;
  auVar324._8_4_ = fVar322 * auVar195._8_4_;
  auVar324._12_4_ = fVar322 * auVar195._12_4_;
  auVar214 = vcvtdq2ps_avx(auVar213);
  auVar215 = vcvtdq2ps_avx(auVar215);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar170 = vshufps_avx(auVar324,auVar324,0x55);
  auVar195 = vshufps_avx(auVar324,auVar324,0xaa);
  fVar265 = auVar195._0_4_;
  fVar274 = auVar195._4_4_;
  fVar276 = auVar195._8_4_;
  fVar277 = auVar195._12_4_;
  fVar167 = auVar170._0_4_;
  fVar183 = auVar170._4_4_;
  fVar185 = auVar170._8_4_;
  fVar232 = auVar170._12_4_;
  auVar19 = vcvtdq2ps_avx(auVar196);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar170 = vshufps_avx(auVar324,auVar324,0);
  fVar322 = auVar170._0_4_;
  fVar327 = auVar170._4_4_;
  fVar329 = auVar170._8_4_;
  fVar331 = auVar170._12_4_;
  auVar299._0_4_ = fVar322 * auVar19._0_4_ + fVar167 * auVar214._0_4_ + fVar265 * auVar215._0_4_;
  auVar299._4_4_ = fVar327 * auVar19._4_4_ + fVar183 * auVar214._4_4_ + fVar274 * auVar215._4_4_;
  auVar299._8_4_ = fVar329 * auVar19._8_4_ + fVar185 * auVar214._8_4_ + fVar276 * auVar215._8_4_;
  auVar299._12_4_ = fVar331 * auVar19._12_4_ + fVar232 * auVar214._12_4_ + fVar277 * auVar215._12_4_
  ;
  auVar189._0_4_ = fVar322 * auVar20._0_4_ + fVar265 * auVar22._0_4_ + fVar167 * auVar21._0_4_;
  auVar189._4_4_ = fVar327 * auVar20._4_4_ + fVar274 * auVar22._4_4_ + fVar183 * auVar21._4_4_;
  auVar189._8_4_ = fVar329 * auVar20._8_4_ + fVar276 * auVar22._8_4_ + fVar185 * auVar21._8_4_;
  auVar189._12_4_ = fVar331 * auVar20._12_4_ + fVar277 * auVar22._12_4_ + fVar232 * auVar21._12_4_;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = *(ulong *)(prim + uVar123 * 7 + 6);
  auVar133 = vpmovsxwd_avx(auVar170);
  auVar170 = vcvtdq2ps_avx(auVar132);
  auVar325._0_4_ = fVar167 * auVar23._0_4_ + fVar265 * auVar24._0_4_ + fVar322 * auVar170._0_4_;
  auVar325._4_4_ = fVar183 * auVar23._4_4_ + fVar274 * auVar24._4_4_ + fVar327 * auVar170._4_4_;
  auVar325._8_4_ = fVar185 * auVar23._8_4_ + fVar276 * auVar24._8_4_ + fVar329 * auVar170._8_4_;
  auVar325._12_4_ = fVar232 * auVar23._12_4_ + fVar277 * auVar24._12_4_ + fVar331 * auVar170._12_4_;
  auVar195 = vshufps_avx(auVar238,auVar238,0xaa);
  fVar265 = auVar195._0_4_;
  fVar274 = auVar195._4_4_;
  fVar276 = auVar195._8_4_;
  fVar277 = auVar195._12_4_;
  auVar195 = vshufps_avx(auVar238,auVar238,0x55);
  fVar322 = auVar195._0_4_;
  fVar329 = auVar195._4_4_;
  fVar167 = auVar195._8_4_;
  fVar185 = auVar195._12_4_;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *(ulong *)(prim + uVar123 * 0xb + 6);
  auVar132 = vpmovsxwd_avx(auVar195);
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *(ulong *)(prim + uVar123 * 9 + 6);
  auVar134 = vpmovsxwd_avx(auVar196);
  auVar213._8_8_ = 0;
  auVar213._0_8_ = *(ulong *)(prim + uVar123 * 0xd + 6);
  auVar213 = vpmovsxwd_avx(auVar213);
  auVar195 = vshufps_avx(auVar238,auVar238,0);
  fVar327 = auVar195._0_4_;
  fVar331 = auVar195._4_4_;
  fVar183 = auVar195._8_4_;
  fVar232 = auVar195._12_4_;
  auVar317._0_4_ = auVar214._0_4_ * fVar322 + fVar265 * auVar215._0_4_ + auVar19._0_4_ * fVar327;
  auVar317._4_4_ = auVar214._4_4_ * fVar329 + fVar274 * auVar215._4_4_ + auVar19._4_4_ * fVar331;
  auVar317._8_4_ = auVar214._8_4_ * fVar167 + fVar276 * auVar215._8_4_ + auVar19._8_4_ * fVar183;
  auVar317._12_4_ = auVar214._12_4_ * fVar185 + fVar277 * auVar215._12_4_ + auVar19._12_4_ * fVar232
  ;
  auVar283._0_4_ = auVar22._0_4_ * fVar265 + fVar322 * auVar21._0_4_ + auVar20._0_4_ * fVar327;
  auVar283._4_4_ = auVar22._4_4_ * fVar274 + fVar329 * auVar21._4_4_ + auVar20._4_4_ * fVar331;
  auVar283._8_4_ = auVar22._8_4_ * fVar276 + fVar167 * auVar21._8_4_ + auVar20._8_4_ * fVar183;
  auVar283._12_4_ = auVar22._12_4_ * fVar277 + fVar185 * auVar21._12_4_ + auVar20._12_4_ * fVar232;
  auVar239._0_4_ = fVar322 * auVar23._0_4_ + fVar265 * auVar24._0_4_ + auVar170._0_4_ * fVar327;
  auVar239._4_4_ = fVar329 * auVar23._4_4_ + fVar274 * auVar24._4_4_ + auVar170._4_4_ * fVar331;
  auVar239._8_4_ = fVar167 * auVar23._8_4_ + fVar276 * auVar24._8_4_ + auVar170._8_4_ * fVar183;
  auVar239._12_4_ = fVar185 * auVar23._12_4_ + fVar277 * auVar24._12_4_ + auVar170._12_4_ * fVar232;
  auVar344._8_4_ = 0x7fffffff;
  auVar344._0_8_ = 0x7fffffff7fffffff;
  auVar344._12_4_ = 0x7fffffff;
  auVar170 = vandps_avx(auVar299,auVar344);
  auVar334._8_4_ = 0x219392ef;
  auVar334._0_8_ = 0x219392ef219392ef;
  auVar334._12_4_ = 0x219392ef;
  auVar170 = vcmpps_avx(auVar170,auVar334,1);
  auVar195 = vblendvps_avx(auVar299,auVar334,auVar170);
  auVar170 = vandps_avx(auVar344,auVar189);
  auVar170 = vcmpps_avx(auVar170,auVar334,1);
  auVar196 = vblendvps_avx(auVar189,auVar334,auVar170);
  auVar170 = vandps_avx(auVar325,auVar344);
  auVar170 = vcmpps_avx(auVar170,auVar334,1);
  auVar170 = vblendvps_avx(auVar325,auVar334,auVar170);
  auVar214 = vrcpps_avx(auVar195);
  fVar265 = auVar214._0_4_;
  auVar267._0_4_ = fVar265 * auVar195._0_4_;
  fVar274 = auVar214._4_4_;
  auVar267._4_4_ = fVar274 * auVar195._4_4_;
  fVar276 = auVar214._8_4_;
  auVar267._8_4_ = fVar276 * auVar195._8_4_;
  fVar277 = auVar214._12_4_;
  auVar267._12_4_ = fVar277 * auVar195._12_4_;
  auVar335._8_4_ = 0x3f800000;
  auVar335._0_8_ = 0x3f8000003f800000;
  auVar335._12_4_ = 0x3f800000;
  auVar195 = vsubps_avx(auVar335,auVar267);
  fVar265 = fVar265 + fVar265 * auVar195._0_4_;
  fVar274 = fVar274 + fVar274 * auVar195._4_4_;
  fVar276 = fVar276 + fVar276 * auVar195._8_4_;
  fVar277 = fVar277 + fVar277 * auVar195._12_4_;
  auVar195 = vrcpps_avx(auVar196);
  fVar297 = auVar195._0_4_;
  auVar190._0_4_ = fVar297 * auVar196._0_4_;
  fVar308 = auVar195._4_4_;
  auVar190._4_4_ = fVar308 * auVar196._4_4_;
  fVar310 = auVar195._8_4_;
  auVar190._8_4_ = fVar310 * auVar196._8_4_;
  fVar312 = auVar195._12_4_;
  auVar190._12_4_ = fVar312 * auVar196._12_4_;
  auVar195 = vsubps_avx(auVar335,auVar190);
  fVar297 = fVar297 + fVar297 * auVar195._0_4_;
  fVar308 = fVar308 + fVar308 * auVar195._4_4_;
  fVar310 = fVar310 + fVar310 * auVar195._8_4_;
  fVar312 = fVar312 + fVar312 * auVar195._12_4_;
  auVar195 = vrcpps_avx(auVar170);
  fVar322 = auVar195._0_4_;
  auVar326._0_4_ = auVar170._0_4_ * fVar322;
  fVar327 = auVar195._4_4_;
  auVar326._4_4_ = auVar170._4_4_ * fVar327;
  fVar329 = auVar195._8_4_;
  auVar326._8_4_ = auVar170._8_4_ * fVar329;
  fVar331 = auVar195._12_4_;
  auVar326._12_4_ = auVar170._12_4_ * fVar331;
  auVar170 = vsubps_avx(auVar335,auVar326);
  fVar322 = auVar170._0_4_ * fVar322 + fVar322;
  fVar327 = auVar170._4_4_ * fVar327 + fVar327;
  fVar329 = auVar170._8_4_ * fVar329 + fVar329;
  fVar331 = auVar170._12_4_ * fVar331 + fVar331;
  auVar196 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) -
                                          *(float *)(prim + lVar128 + 0x16)) *
                                         *(float *)(prim + lVar128 + 0x1a))),0);
  auVar170 = vcvtdq2ps_avx(auVar133);
  auVar195 = vcvtdq2ps_avx(auVar132);
  auVar195 = vsubps_avx(auVar195,auVar170);
  fVar167 = auVar196._0_4_;
  fVar183 = auVar196._4_4_;
  fVar185 = auVar196._8_4_;
  fVar232 = auVar196._12_4_;
  auVar132._0_4_ = fVar167 * auVar195._0_4_ + auVar170._0_4_;
  auVar132._4_4_ = fVar183 * auVar195._4_4_ + auVar170._4_4_;
  auVar132._8_4_ = fVar185 * auVar195._8_4_ + auVar170._8_4_;
  auVar132._12_4_ = fVar232 * auVar195._12_4_ + auVar170._12_4_;
  auVar170 = vcvtdq2ps_avx(auVar134);
  auVar195 = vcvtdq2ps_avx(auVar213);
  auVar195 = vsubps_avx(auVar195,auVar170);
  auVar209._0_4_ = fVar167 * auVar195._0_4_ + auVar170._0_4_;
  auVar209._4_4_ = fVar183 * auVar195._4_4_ + auVar170._4_4_;
  auVar209._8_4_ = fVar185 * auVar195._8_4_ + auVar170._8_4_;
  auVar209._12_4_ = fVar232 * auVar195._12_4_ + auVar170._12_4_;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = *(ulong *)(prim + uVar123 * 0x12 + 6);
  auVar170 = vpmovsxwd_avx(auVar214);
  auVar170 = vcvtdq2ps_avx(auVar170);
  auVar215._8_8_ = 0;
  auVar215._0_8_ = *(ulong *)(prim + uVar123 * 0x16 + 6);
  auVar195 = vpmovsxwd_avx(auVar215);
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar195 = vsubps_avx(auVar195,auVar170);
  auVar253._0_4_ = fVar167 * auVar195._0_4_ + auVar170._0_4_;
  auVar253._4_4_ = fVar183 * auVar195._4_4_ + auVar170._4_4_;
  auVar253._8_4_ = fVar185 * auVar195._8_4_ + auVar170._8_4_;
  auVar253._12_4_ = fVar232 * auVar195._12_4_ + auVar170._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar123 * 0x14 + 6);
  auVar170 = vpmovsxwd_avx(auVar21);
  auVar170 = vcvtdq2ps_avx(auVar170);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar123 * 0x18 + 6);
  auVar195 = vpmovsxwd_avx(auVar22);
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar196 = vsubps_avx(auVar195,auVar170);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar123 * 0x1d + 6);
  auVar195 = vpmovsxwd_avx(auVar19);
  auVar257._0_4_ = auVar196._0_4_ * fVar167 + auVar170._0_4_;
  auVar257._4_4_ = auVar196._4_4_ * fVar183 + auVar170._4_4_;
  auVar257._8_4_ = auVar196._8_4_ * fVar185 + auVar170._8_4_;
  auVar257._12_4_ = auVar196._12_4_ * fVar232 + auVar170._12_4_;
  auVar170 = vcvtdq2ps_avx(auVar195);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar123 * 0x21 + 6);
  auVar195 = vpmovsxwd_avx(auVar20);
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar195 = vsubps_avx(auVar195,auVar170);
  auVar336._0_4_ = auVar195._0_4_ * fVar167 + auVar170._0_4_;
  auVar336._4_4_ = auVar195._4_4_ * fVar183 + auVar170._4_4_;
  auVar336._8_4_ = auVar195._8_4_ * fVar185 + auVar170._8_4_;
  auVar336._12_4_ = auVar195._12_4_ * fVar232 + auVar170._12_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar123 * 0x1f + 6);
  auVar170 = vpmovsxwd_avx(auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar123 * 0x23 + 6);
  auVar195 = vpmovsxwd_avx(auVar24);
  auVar170 = vcvtdq2ps_avx(auVar170);
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar195 = vsubps_avx(auVar195,auVar170);
  auVar191._0_4_ = auVar170._0_4_ + auVar195._0_4_ * fVar167;
  auVar191._4_4_ = auVar170._4_4_ + auVar195._4_4_ * fVar183;
  auVar191._8_4_ = auVar170._8_4_ + auVar195._8_4_ * fVar185;
  auVar191._12_4_ = auVar170._12_4_ + auVar195._12_4_ * fVar232;
  auVar170 = vsubps_avx(auVar132,auVar317);
  auVar133._0_4_ = fVar265 * auVar170._0_4_;
  auVar133._4_4_ = fVar274 * auVar170._4_4_;
  auVar133._8_4_ = fVar276 * auVar170._8_4_;
  auVar133._12_4_ = fVar277 * auVar170._12_4_;
  auVar170 = vsubps_avx(auVar209,auVar317);
  auVar210._0_4_ = fVar265 * auVar170._0_4_;
  auVar210._4_4_ = fVar274 * auVar170._4_4_;
  auVar210._8_4_ = fVar276 * auVar170._8_4_;
  auVar210._12_4_ = fVar277 * auVar170._12_4_;
  auVar170 = vsubps_avx(auVar253,auVar283);
  auVar254._0_4_ = fVar297 * auVar170._0_4_;
  auVar254._4_4_ = fVar308 * auVar170._4_4_;
  auVar254._8_4_ = fVar310 * auVar170._8_4_;
  auVar254._12_4_ = fVar312 * auVar170._12_4_;
  auVar170 = vsubps_avx(auVar257,auVar283);
  auVar258._0_4_ = fVar297 * auVar170._0_4_;
  auVar258._4_4_ = fVar308 * auVar170._4_4_;
  auVar258._8_4_ = fVar310 * auVar170._8_4_;
  auVar258._12_4_ = fVar312 * auVar170._12_4_;
  auVar170 = vsubps_avx(auVar336,auVar239);
  auVar268._0_4_ = fVar322 * auVar170._0_4_;
  auVar268._4_4_ = fVar327 * auVar170._4_4_;
  auVar268._8_4_ = fVar329 * auVar170._8_4_;
  auVar268._12_4_ = fVar331 * auVar170._12_4_;
  auVar170 = vsubps_avx(auVar191,auVar239);
  auVar192._0_4_ = fVar322 * auVar170._0_4_;
  auVar192._4_4_ = fVar327 * auVar170._4_4_;
  auVar192._8_4_ = fVar329 * auVar170._8_4_;
  auVar192._12_4_ = fVar331 * auVar170._12_4_;
  auVar170 = vpminsd_avx(auVar133,auVar210);
  auVar195 = vpminsd_avx(auVar254,auVar258);
  auVar170 = vmaxps_avx(auVar170,auVar195);
  auVar195 = vpminsd_avx(auVar268,auVar192);
  uVar129 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar300._4_4_ = uVar129;
  auVar300._0_4_ = uVar129;
  auVar300._8_4_ = uVar129;
  auVar300._12_4_ = uVar129;
  auVar306 = ZEXT1664(auVar300);
  auVar195 = vmaxps_avx(auVar195,auVar300);
  auVar170 = vmaxps_avx(auVar170,auVar195);
  local_3d0._0_4_ = auVar170._0_4_ * 0.99999964;
  local_3d0._4_4_ = auVar170._4_4_ * 0.99999964;
  local_3d0._8_4_ = auVar170._8_4_ * 0.99999964;
  local_3d0._12_4_ = auVar170._12_4_ * 0.99999964;
  auVar170 = vpmaxsd_avx(auVar133,auVar210);
  auVar195 = vpmaxsd_avx(auVar254,auVar258);
  auVar170 = vminps_avx(auVar170,auVar195);
  auVar195 = vpmaxsd_avx(auVar268,auVar192);
  uVar129 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar211._4_4_ = uVar129;
  auVar211._0_4_ = uVar129;
  auVar211._8_4_ = uVar129;
  auVar211._12_4_ = uVar129;
  auVar195 = vminps_avx(auVar195,auVar211);
  auVar170 = vminps_avx(auVar170,auVar195);
  auVar134._0_4_ = auVar170._0_4_ * 1.0000004;
  auVar134._4_4_ = auVar170._4_4_ * 1.0000004;
  auVar134._8_4_ = auVar170._8_4_ * 1.0000004;
  auVar134._12_4_ = auVar170._12_4_ * 1.0000004;
  auVar170 = vpshufd_avx(ZEXT116((byte)PVar11),0);
  auVar195 = vpcmpgtd_avx(auVar170,_DAT_01f4ad30);
  auVar170 = vcmpps_avx(local_3d0,auVar134,2);
  auVar170 = vandps_avx(auVar170,auVar195);
  uVar129 = vmovmskps_avx(auVar170);
  uVar123 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar129);
  local_610 = pre->ray_space + k;
  local_600 = mm_lookupmask_ps._16_8_;
  uStack_5f8 = mm_lookupmask_ps._24_8_;
  uStack_5f0 = mm_lookupmask_ps._16_8_;
  uStack_5e8 = mm_lookupmask_ps._24_8_;
  uVar125 = 1 << ((byte)k & 0x1f);
  local_750 = (undefined1 (*) [32])&local_180;
  local_758 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar125 & 0xf) << 4));
  local_760 = mm_lookupmask_ps + (long)((int)uVar125 >> 4) * 0x10;
  local_748 = pre;
  local_608 = prim;
  do {
    if (uVar123 == 0) {
      return;
    }
    auVar144 = auVar306._0_32_;
    lVar128 = 0;
    if (uVar123 != 0) {
      for (; (uVar123 >> lVar128 & 1) == 0; lVar128 = lVar128 + 1) {
      }
    }
    uVar121 = *(uint *)(local_608 + 2);
    uVar12 = *(uint *)(local_608 + lVar128 * 4 + 6);
    pGVar14 = (context->scene->geometries).items[CONCAT44(0,uVar121)].ptr;
    uVar124 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                              (ulong)uVar12 *
                              pGVar14[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar322 = (pGVar14->time_range).lower;
    fVar322 = pGVar14->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0xe0) - fVar322) / ((pGVar14->time_range).upper - fVar322))
    ;
    auVar170 = vroundss_avx(ZEXT416((uint)fVar322),ZEXT416((uint)fVar322),9);
    auVar170 = vminss_avx(auVar170,ZEXT416((uint)(pGVar14->fnumTimeSegments + -1.0)));
    auVar170 = vmaxss_avx(ZEXT816(0) << 0x20,auVar170);
    fVar322 = fVar322 - auVar170._0_4_;
    _Var15 = pGVar14[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar127 = (long)(int)auVar170._0_4_ * 0x38;
    lVar128 = *(long *)(_Var15 + 0x10 + lVar127);
    lVar126 = *(long *)(_Var15 + 0x38 + lVar127);
    lVar16 = *(long *)(_Var15 + 0x48 + lVar127);
    auVar170 = vshufps_avx(ZEXT416((uint)fVar322),ZEXT416((uint)fVar322),0);
    pfVar1 = (float *)(lVar126 + uVar124 * lVar16);
    fVar167 = auVar170._0_4_;
    fVar183 = auVar170._4_4_;
    fVar185 = auVar170._8_4_;
    fVar232 = auVar170._12_4_;
    pfVar2 = (float *)(lVar126 + (uVar124 + 1) * lVar16);
    pfVar3 = (float *)(lVar126 + (uVar124 + 2) * lVar16);
    pfVar4 = (float *)(lVar126 + lVar16 * (uVar124 + 3));
    lVar126 = *(long *)(_Var15 + lVar127);
    auVar170 = vshufps_avx(ZEXT416((uint)(1.0 - fVar322)),ZEXT416((uint)(1.0 - fVar322)),0);
    pfVar5 = (float *)(lVar126 + lVar128 * uVar124);
    fVar322 = auVar170._0_4_;
    fVar327 = auVar170._4_4_;
    fVar329 = auVar170._8_4_;
    fVar331 = auVar170._12_4_;
    pfVar6 = (float *)(lVar126 + lVar128 * (uVar124 + 1));
    fVar266 = fVar167 * *pfVar1 + fVar322 * *pfVar5;
    fVar275 = fVar183 * pfVar1[1] + fVar327 * pfVar5[1];
    auVar269._0_8_ = CONCAT44(fVar275,fVar266);
    auVar269._8_4_ = fVar185 * pfVar1[2] + fVar329 * pfVar5[2];
    auVar269._12_4_ = fVar232 * pfVar1[3] + fVar331 * pfVar5[3];
    fVar351 = fVar322 * *pfVar6 + fVar167 * *pfVar2;
    fVar356 = fVar327 * pfVar6[1] + fVar183 * pfVar2[1];
    auVar353._0_8_ = CONCAT44(fVar356,fVar351);
    auVar353._8_4_ = fVar329 * pfVar6[2] + fVar185 * pfVar2[2];
    auVar353._12_4_ = fVar331 * pfVar6[3] + fVar232 * pfVar2[3];
    pfVar1 = (float *)(lVar126 + lVar128 * (uVar124 + 2));
    fVar360 = fVar322 * *pfVar1 + fVar167 * *pfVar3;
    fVar365 = fVar327 * pfVar1[1] + fVar183 * pfVar3[1];
    auVar362._0_8_ = CONCAT44(fVar365,fVar360);
    auVar362._8_4_ = fVar329 * pfVar1[2] + fVar185 * pfVar3[2];
    auVar362._12_4_ = fVar331 * pfVar1[3] + fVar232 * pfVar3[3];
    pfVar1 = (float *)(lVar126 + lVar128 * (uVar124 + 3));
    auVar337._0_4_ = fVar322 * *pfVar1 + fVar167 * *pfVar4;
    auVar337._4_4_ = fVar327 * pfVar1[1] + fVar183 * pfVar4[1];
    auVar337._8_4_ = fVar329 * pfVar1[2] + fVar185 * pfVar4[2];
    auVar337._12_4_ = fVar331 * pfVar1[3] + fVar232 * pfVar4[3];
    uVar13 = (uint)pGVar14[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar170 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                             0x1c);
    auVar213 = vinsertps_avx(auVar170,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar196 = vsubps_avx(auVar269,auVar213);
    auVar170 = vshufps_avx(auVar196,auVar196,0);
    auVar195 = vshufps_avx(auVar196,auVar196,0x55);
    auVar196 = vshufps_avx(auVar196,auVar196,0xaa);
    fVar322 = (local_610->vx).field_0.m128[0];
    fVar327 = (local_610->vx).field_0.m128[1];
    fVar329 = (local_610->vx).field_0.m128[2];
    fVar331 = (local_610->vx).field_0.m128[3];
    fVar167 = (local_610->vy).field_0.m128[0];
    fVar183 = (local_610->vy).field_0.m128[1];
    fVar185 = (local_610->vy).field_0.m128[2];
    fVar232 = (local_610->vy).field_0.m128[3];
    fVar265 = (local_610->vz).field_0.m128[0];
    fVar274 = (local_610->vz).field_0.m128[1];
    fVar276 = (local_610->vz).field_0.m128[2];
    fVar277 = (local_610->vz).field_0.m128[3];
    auVar240._0_4_ = auVar170._0_4_ * fVar322 + auVar195._0_4_ * fVar167 + fVar265 * auVar196._0_4_;
    auVar240._4_4_ = auVar170._4_4_ * fVar327 + auVar195._4_4_ * fVar183 + fVar274 * auVar196._4_4_;
    auVar240._8_4_ = auVar170._8_4_ * fVar329 + auVar195._8_4_ * fVar185 + fVar276 * auVar196._8_4_;
    auVar240._12_4_ =
         auVar170._12_4_ * fVar331 + auVar195._12_4_ * fVar232 + fVar277 * auVar196._12_4_;
    auVar170 = vblendps_avx(auVar240,auVar269,8);
    auVar214 = vsubps_avx(auVar353,auVar213);
    auVar195 = vshufps_avx(auVar214,auVar214,0);
    auVar196 = vshufps_avx(auVar214,auVar214,0x55);
    auVar214 = vshufps_avx(auVar214,auVar214,0xaa);
    auVar241._0_8_ =
         CONCAT44(auVar195._4_4_ * fVar327 + auVar196._4_4_ * fVar183 + fVar274 * auVar214._4_4_,
                  auVar195._0_4_ * fVar322 + auVar196._0_4_ * fVar167 + fVar265 * auVar214._0_4_);
    auVar241._8_4_ = auVar195._8_4_ * fVar329 + auVar196._8_4_ * fVar185 + fVar276 * auVar214._8_4_;
    auVar241._12_4_ =
         auVar195._12_4_ * fVar331 + auVar196._12_4_ * fVar232 + fVar277 * auVar214._12_4_;
    auVar195 = vblendps_avx(auVar241,auVar353,8);
    auVar215 = vsubps_avx(auVar362,auVar213);
    auVar196 = vshufps_avx(auVar215,auVar215,0);
    auVar214 = vshufps_avx(auVar215,auVar215,0x55);
    auVar215 = vshufps_avx(auVar215,auVar215,0xaa);
    auVar242._0_4_ = auVar196._0_4_ * fVar322 + auVar214._0_4_ * fVar167 + auVar215._0_4_ * fVar265;
    auVar242._4_4_ = auVar196._4_4_ * fVar327 + auVar214._4_4_ * fVar183 + auVar215._4_4_ * fVar274;
    auVar242._8_4_ = auVar196._8_4_ * fVar329 + auVar214._8_4_ * fVar185 + auVar215._8_4_ * fVar276;
    auVar242._12_4_ =
         auVar196._12_4_ * fVar331 + auVar214._12_4_ * fVar232 + auVar215._12_4_ * fVar277;
    auVar196 = vblendps_avx(auVar242,auVar362,8);
    auVar215 = vsubps_avx(auVar337,auVar213);
    auVar213 = vshufps_avx(auVar215,auVar215,0);
    auVar214 = vshufps_avx(auVar215,auVar215,0x55);
    auVar215 = vshufps_avx(auVar215,auVar215,0xaa);
    auVar168._0_4_ = auVar213._0_4_ * fVar322 + auVar214._0_4_ * fVar167 + fVar265 * auVar215._0_4_;
    auVar168._4_4_ = auVar213._4_4_ * fVar327 + auVar214._4_4_ * fVar183 + fVar274 * auVar215._4_4_;
    auVar168._8_4_ = auVar213._8_4_ * fVar329 + auVar214._8_4_ * fVar185 + fVar276 * auVar215._8_4_;
    auVar168._12_4_ =
         auVar213._12_4_ * fVar331 + auVar214._12_4_ * fVar232 + fVar277 * auVar215._12_4_;
    auVar213 = vblendps_avx(auVar168,auVar337,8);
    auVar212._8_4_ = 0x7fffffff;
    auVar212._0_8_ = 0x7fffffff7fffffff;
    auVar212._12_4_ = 0x7fffffff;
    auVar170 = vandps_avx(auVar170,auVar212);
    auVar195 = vandps_avx(auVar195,auVar212);
    auVar214 = vmaxps_avx(auVar170,auVar195);
    auVar170 = vandps_avx(auVar196,auVar212);
    auVar195 = vandps_avx(auVar213,auVar212);
    auVar170 = vmaxps_avx(auVar170,auVar195);
    auVar170 = vmaxps_avx(auVar214,auVar170);
    auVar195 = vmovshdup_avx(auVar170);
    auVar195 = vmaxss_avx(auVar195,auVar170);
    auVar170 = vshufpd_avx(auVar170,auVar170,1);
    auVar170 = vmaxss_avx(auVar170,auVar195);
    lVar128 = (long)(int)uVar13 * 0x44;
    fVar322 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar128 + 0x908);
    fVar327 = *(float *)(catmullrom_basis0 + lVar128 + 0x90c);
    fVar329 = *(float *)(catmullrom_basis0 + lVar128 + 0x910);
    fVar331 = *(float *)(catmullrom_basis0 + lVar128 + 0x914);
    fVar167 = *(float *)(catmullrom_basis0 + lVar128 + 0x918);
    fVar183 = *(float *)(catmullrom_basis0 + lVar128 + 0x91c);
    fVar185 = *(float *)(catmullrom_basis0 + lVar128 + 0x920);
    auVar115 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar128 + 0x908);
    auVar195 = vshufps_avx(auVar242,auVar242,0);
    auVar174._16_16_ = auVar195;
    auVar174._0_16_ = auVar195;
    auVar196 = vshufps_avx(auVar242,auVar242,0x55);
    fVar232 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar128 + 0xd8c);
    fVar265 = *(float *)(catmullrom_basis0 + lVar128 + 0xd90);
    fVar274 = *(float *)(catmullrom_basis0 + lVar128 + 0xd94);
    fVar276 = *(float *)(catmullrom_basis0 + lVar128 + 0xd98);
    fVar277 = *(float *)(catmullrom_basis0 + lVar128 + 0xd9c);
    fVar297 = *(float *)(catmullrom_basis0 + lVar128 + 0xda0);
    fVar308 = *(float *)(catmullrom_basis0 + lVar128 + 0xda4);
    auVar114 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar128 + 0xd8c);
    fVar310 = *(float *)(catmullrom_basis0 + lVar128 + 0xda8);
    auVar213 = vshufps_avx(auVar168,auVar168,0);
    register0x00001210 = auVar213;
    _local_560 = auVar213;
    fVar131 = auVar213._0_4_;
    fVar152 = auVar213._4_4_;
    fVar154 = auVar213._8_4_;
    fVar156 = auVar213._12_4_;
    fVar166 = auVar195._0_4_;
    fVar182 = auVar195._4_4_;
    fVar184 = auVar195._8_4_;
    fVar186 = auVar195._12_4_;
    auVar195 = vshufps_avx(auVar168,auVar168,0x55);
    register0x000014d0 = auVar195;
    _local_720 = auVar195;
    fVar323 = auVar195._0_4_;
    fVar328 = auVar195._4_4_;
    fVar330 = auVar195._8_4_;
    fVar332 = auVar195._12_4_;
    fVar188 = auVar196._0_4_;
    fVar203 = auVar196._4_4_;
    fVar204 = auVar196._8_4_;
    fVar205 = auVar196._12_4_;
    auVar195 = vshufps_avx(auVar362,auVar362,0xff);
    register0x00001490 = auVar195;
    _local_80 = auVar195;
    auVar196 = vshufps_avx(auVar337,auVar337,0xff);
    register0x000013d0 = auVar196;
    _local_a0 = auVar196;
    fVar264 = auVar196._0_4_;
    fVar249 = auVar196._4_4_;
    fVar250 = auVar196._8_4_;
    fVar251 = auVar196._12_4_;
    fVar309 = auVar195._0_4_;
    fVar311 = auVar195._4_4_;
    fVar313 = auVar195._8_4_;
    auVar108._8_4_ = auVar241._8_4_;
    auVar108._0_8_ = auVar241._0_8_;
    auVar108._12_4_ = auVar241._12_4_;
    auVar196 = vshufps_avx(auVar108,auVar108,0);
    register0x00001550 = auVar196;
    _local_740 = auVar196;
    fVar312 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar128 + 0x484);
    fVar333 = *(float *)(catmullrom_basis0 + lVar128 + 0x488);
    fVar187 = *(float *)(catmullrom_basis0 + lVar128 + 0x48c);
    fVar228 = *(float *)(catmullrom_basis0 + lVar128 + 0x490);
    fVar278 = *(float *)(catmullrom_basis0 + lVar128 + 0x494);
    fVar289 = *(float *)(catmullrom_basis0 + lVar128 + 0x498);
    fVar290 = *(float *)(catmullrom_basis0 + lVar128 + 0x49c);
    auVar116 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar128 + 0x484);
    fVar314 = auVar196._0_4_;
    fVar315 = auVar196._4_4_;
    fVar316 = auVar196._8_4_;
    fVar349 = auVar196._12_4_;
    auVar196 = vshufps_avx(auVar108,auVar108,0x55);
    register0x000015d0 = auVar196;
    _local_7c0 = auVar196;
    fVar361 = auVar196._0_4_;
    fVar366 = auVar196._4_4_;
    fVar367 = auVar196._8_4_;
    fVar368 = auVar196._12_4_;
    auVar196 = vshufps_avx(auVar353,auVar353,0xff);
    register0x00001590 = auVar196;
    _local_280 = auVar196;
    fVar348 = auVar196._0_4_;
    fVar350 = auVar196._4_4_;
    fVar352 = auVar196._8_4_;
    fVar357 = auVar196._12_4_;
    auVar196 = vshufps_avx(auVar240,auVar240,0);
    register0x00001310 = auVar196;
    _local_420 = auVar196;
    fVar231 = *(float *)(catmullrom_basis0 + lVar128);
    fVar279 = *(float *)(catmullrom_basis0 + lVar128 + 4);
    fVar291 = *(float *)(catmullrom_basis0 + lVar128 + 8);
    fVar292 = *(float *)(catmullrom_basis0 + lVar128 + 0xc);
    fVar159 = *(float *)(catmullrom_basis0 + lVar128 + 0x10);
    fVar162 = *(float *)(catmullrom_basis0 + lVar128 + 0x14);
    fVar293 = *(float *)(catmullrom_basis0 + lVar128 + 0x18);
    fVar158 = auVar196._0_4_;
    fVar160 = auVar196._4_4_;
    fVar163 = auVar196._8_4_;
    fVar165 = auVar196._12_4_;
    auVar284._0_4_ = fVar158 * fVar231 + fVar314 * fVar312 + fVar166 * fVar322 + fVar131 * fVar232;
    auVar284._4_4_ = fVar160 * fVar279 + fVar315 * fVar333 + fVar182 * fVar327 + fVar152 * fVar265;
    auVar284._8_4_ = fVar163 * fVar291 + fVar316 * fVar187 + fVar184 * fVar329 + fVar154 * fVar274;
    auVar284._12_4_ = fVar165 * fVar292 + fVar349 * fVar228 + fVar186 * fVar331 + fVar156 * fVar276;
    auVar285._16_4_ = fVar158 * fVar159 + fVar314 * fVar278 + fVar166 * fVar167 + fVar131 * fVar277;
    auVar285._0_16_ = auVar284;
    auVar285._20_4_ = fVar160 * fVar162 + fVar315 * fVar289 + fVar182 * fVar183 + fVar152 * fVar297;
    auVar285._24_4_ = fVar163 * fVar293 + fVar316 * fVar290 + fVar184 * fVar185 + fVar154 * fVar308;
    auVar285._28_4_ = fVar310 + fVar186 + fVar156 + 0.0;
    auVar196 = vshufps_avx(auVar240,auVar240,0x55);
    register0x000012d0 = auVar196;
    _local_800 = auVar196;
    fVar207 = auVar196._0_4_;
    fVar224 = auVar196._4_4_;
    fVar226 = auVar196._8_4_;
    fVar229 = auVar196._12_4_;
    auVar338._0_4_ = fVar207 * fVar231 + fVar361 * fVar312 + fVar188 * fVar322 + fVar323 * fVar232;
    auVar338._4_4_ = fVar224 * fVar279 + fVar366 * fVar333 + fVar203 * fVar327 + fVar328 * fVar265;
    auVar338._8_4_ = fVar226 * fVar291 + fVar367 * fVar187 + fVar204 * fVar329 + fVar330 * fVar274;
    auVar338._12_4_ = fVar229 * fVar292 + fVar368 * fVar228 + fVar205 * fVar331 + fVar332 * fVar276;
    auVar338._16_4_ = fVar207 * fVar159 + fVar361 * fVar278 + fVar188 * fVar167 + fVar323 * fVar277;
    auVar338._20_4_ = fVar224 * fVar162 + fVar366 * fVar289 + fVar203 * fVar183 + fVar328 * fVar297;
    auVar338._24_4_ = fVar226 * fVar293 + fVar367 * fVar290 + fVar204 * fVar185 + fVar330 * fVar308;
    auVar338._28_4_ = fVar229 + fVar205 + 0.0 + 0.0;
    auVar196 = vpermilps_avx(auVar269,0xff);
    register0x00001450 = auVar196;
    _local_c0 = auVar196;
    fVar280 = auVar196._0_4_;
    fVar282 = auVar196._4_4_;
    fVar298 = auVar196._8_4_;
    auVar139._0_4_ = fVar280 * fVar231 + fVar348 * fVar312 + fVar309 * fVar322 + fVar264 * fVar232;
    auVar139._4_4_ = fVar282 * fVar279 + fVar350 * fVar333 + fVar311 * fVar327 + fVar249 * fVar265;
    auVar139._8_4_ = fVar298 * fVar291 + fVar352 * fVar187 + fVar313 * fVar329 + fVar250 * fVar274;
    auVar139._12_4_ =
         auVar196._12_4_ * fVar292 +
         fVar357 * fVar228 + auVar195._12_4_ * fVar331 + fVar251 * fVar276;
    auVar139._16_4_ = fVar280 * fVar159 + fVar348 * fVar278 + fVar309 * fVar167 + fVar264 * fVar277;
    auVar139._20_4_ = fVar282 * fVar162 + fVar350 * fVar289 + fVar311 * fVar183 + fVar249 * fVar297;
    auVar139._24_4_ = fVar298 * fVar293 + fVar352 * fVar290 + fVar313 * fVar185 + fVar250 * fVar308;
    auVar139._28_4_ = 0;
    fVar312 = *(float *)(catmullrom_basis1 + lVar128 + 0x908);
    fVar333 = *(float *)(catmullrom_basis1 + lVar128 + 0x90c);
    fVar187 = *(float *)(catmullrom_basis1 + lVar128 + 0x910);
    fVar228 = *(float *)(catmullrom_basis1 + lVar128 + 0x914);
    fVar278 = *(float *)(catmullrom_basis1 + lVar128 + 0x918);
    fVar289 = *(float *)(catmullrom_basis1 + lVar128 + 0x91c);
    fVar290 = *(float *)(catmullrom_basis1 + lVar128 + 0x920);
    fVar294 = *(float *)(catmullrom_basis1 + lVar128 + 0xd8c);
    fVar235 = *(float *)(catmullrom_basis1 + lVar128 + 0xd90);
    fVar281 = *(float *)(catmullrom_basis1 + lVar128 + 0xd94);
    fVar295 = *(float *)(catmullrom_basis1 + lVar128 + 0xd98);
    fVar296 = *(float *)(catmullrom_basis1 + lVar128 + 0xd9c);
    fVar237 = *(float *)(catmullrom_basis1 + lVar128 + 0xda0);
    fVar130 = *(float *)(catmullrom_basis1 + lVar128 + 0xda4);
    fVar206 = *(float *)(catmullrom_basis1 + lVar128 + 0x484);
    fVar153 = *(float *)(catmullrom_basis1 + lVar128 + 0x488);
    fVar155 = *(float *)(catmullrom_basis1 + lVar128 + 0x48c);
    fVar157 = *(float *)(catmullrom_basis1 + lVar128 + 0x490);
    fVar164 = *(float *)(catmullrom_basis1 + lVar128 + 0x494);
    fVar252 = *(float *)(catmullrom_basis1 + lVar128 + 0x498);
    fVar161 = *(float *)(catmullrom_basis1 + lVar128 + 0x49c);
    fVar327 = fVar349 + fVar229 + 0.0;
    fVar208 = *(float *)(catmullrom_basis1 + lVar128);
    fVar225 = *(float *)(catmullrom_basis1 + lVar128 + 4);
    fVar227 = *(float *)(catmullrom_basis1 + lVar128 + 8);
    fVar230 = *(float *)(catmullrom_basis1 + lVar128 + 0xc);
    fVar233 = *(float *)(catmullrom_basis1 + lVar128 + 0x10);
    fVar234 = *(float *)(catmullrom_basis1 + lVar128 + 0x14);
    fVar236 = *(float *)(catmullrom_basis1 + lVar128 + 0x18);
    auVar243._0_4_ = fVar158 * fVar208 + fVar314 * fVar206 + fVar312 * fVar166 + fVar294 * fVar131;
    auVar243._4_4_ = fVar160 * fVar225 + fVar315 * fVar153 + fVar333 * fVar182 + fVar235 * fVar152;
    auVar243._8_4_ = fVar163 * fVar227 + fVar316 * fVar155 + fVar187 * fVar184 + fVar281 * fVar154;
    auVar243._12_4_ = fVar165 * fVar230 + fVar349 * fVar157 + fVar228 * fVar186 + fVar295 * fVar156;
    auVar243._16_4_ = fVar158 * fVar233 + fVar314 * fVar164 + fVar278 * fVar166 + fVar296 * fVar131;
    auVar243._20_4_ = fVar160 * fVar234 + fVar315 * fVar252 + fVar289 * fVar182 + fVar237 * fVar152;
    auVar243._24_4_ = fVar163 * fVar236 + fVar316 * fVar161 + fVar290 * fVar184 + fVar130 * fVar154;
    auVar243._28_4_ = fVar357 + fVar327;
    local_680._0_4_ = fVar207 * fVar208 + fVar361 * fVar206 + fVar312 * fVar188 + fVar323 * fVar294;
    local_680._4_4_ = fVar224 * fVar225 + fVar366 * fVar153 + fVar333 * fVar203 + fVar328 * fVar235;
    fStack_678 = fVar226 * fVar227 + fVar367 * fVar155 + fVar187 * fVar204 + fVar330 * fVar281;
    fStack_674 = fVar229 * fVar230 + fVar368 * fVar157 + fVar228 * fVar205 + fVar332 * fVar295;
    auVar216._16_4_ = fVar207 * fVar233 + fVar361 * fVar164 + fVar278 * fVar188 + fVar323 * fVar296;
    auVar216._0_16_ = _local_680;
    auVar216._20_4_ = fVar224 * fVar234 + fVar366 * fVar252 + fVar289 * fVar203 + fVar328 * fVar237;
    auVar216._24_4_ = fVar226 * fVar236 + fVar367 * fVar161 + fVar290 * fVar204 + fVar330 * fVar130;
    auVar216._28_4_ = fVar327 + fVar349 + fVar310 + fVar229;
    auVar255._0_4_ = fVar348 * fVar206 + fVar309 * fVar312 + fVar264 * fVar294 + fVar280 * fVar208;
    auVar255._4_4_ = fVar350 * fVar153 + fVar311 * fVar333 + fVar249 * fVar235 + fVar282 * fVar225;
    auVar255._8_4_ = fVar352 * fVar155 + fVar313 * fVar187 + fVar250 * fVar281 + fVar298 * fVar227;
    auVar255._12_4_ =
         fVar357 * fVar157 + auVar195._12_4_ * fVar228 + fVar251 * fVar295 +
         auVar196._12_4_ * fVar230;
    auVar255._16_4_ = fVar348 * fVar164 + fVar309 * fVar278 + fVar264 * fVar296 + fVar280 * fVar233;
    auVar255._20_4_ = fVar350 * fVar252 + fVar311 * fVar289 + fVar249 * fVar237 + fVar282 * fVar234;
    auVar255._24_4_ = fVar352 * fVar161 + fVar313 * fVar290 + fVar250 * fVar130 + fVar298 * fVar236;
    auVar255._28_4_ = fVar349 + fVar251 + fVar310 + fVar327;
    auVar303 = vsubps_avx(auVar243,auVar285);
    auVar25 = vsubps_avx(auVar216,auVar338);
    fVar322 = auVar303._0_4_;
    fVar329 = auVar303._4_4_;
    auVar223._4_4_ = auVar338._4_4_ * fVar329;
    auVar223._0_4_ = auVar338._0_4_ * fVar322;
    fVar167 = auVar303._8_4_;
    auVar223._8_4_ = auVar338._8_4_ * fVar167;
    fVar185 = auVar303._12_4_;
    auVar223._12_4_ = auVar338._12_4_ * fVar185;
    fVar265 = auVar303._16_4_;
    auVar223._16_4_ = auVar338._16_4_ * fVar265;
    fVar276 = auVar303._20_4_;
    auVar223._20_4_ = auVar338._20_4_ * fVar276;
    fVar297 = auVar303._24_4_;
    auVar223._24_4_ = auVar338._24_4_ * fVar297;
    auVar223._28_4_ = fVar327;
    fVar327 = auVar25._0_4_;
    fVar331 = auVar25._4_4_;
    auVar26._4_4_ = auVar284._4_4_ * fVar331;
    auVar26._0_4_ = auVar284._0_4_ * fVar327;
    fVar183 = auVar25._8_4_;
    auVar26._8_4_ = auVar284._8_4_ * fVar183;
    fVar232 = auVar25._12_4_;
    auVar26._12_4_ = auVar284._12_4_ * fVar232;
    fVar274 = auVar25._16_4_;
    auVar26._16_4_ = auVar285._16_4_ * fVar274;
    fVar277 = auVar25._20_4_;
    auVar26._20_4_ = auVar285._20_4_ * fVar277;
    fVar308 = auVar25._24_4_;
    auVar26._24_4_ = auVar285._24_4_ * fVar308;
    auVar26._28_4_ = auVar216._28_4_;
    auVar26 = vsubps_avx(auVar223,auVar26);
    auVar223 = vmaxps_avx(auVar139,auVar255);
    auVar30._4_4_ = auVar223._4_4_ * auVar223._4_4_ * (fVar329 * fVar329 + fVar331 * fVar331);
    auVar30._0_4_ = auVar223._0_4_ * auVar223._0_4_ * (fVar322 * fVar322 + fVar327 * fVar327);
    auVar30._8_4_ = auVar223._8_4_ * auVar223._8_4_ * (fVar167 * fVar167 + fVar183 * fVar183);
    auVar30._12_4_ = auVar223._12_4_ * auVar223._12_4_ * (fVar185 * fVar185 + fVar232 * fVar232);
    auVar30._16_4_ = auVar223._16_4_ * auVar223._16_4_ * (fVar265 * fVar265 + fVar274 * fVar274);
    auVar30._20_4_ = auVar223._20_4_ * auVar223._20_4_ * (fVar276 * fVar276 + fVar277 * fVar277);
    auVar30._24_4_ = auVar223._24_4_ * auVar223._24_4_ * (fVar297 * fVar297 + fVar308 * fVar308);
    auVar30._28_4_ = auVar243._28_4_ + auVar216._28_4_;
    auVar18._4_4_ = auVar26._4_4_ * auVar26._4_4_;
    auVar18._0_4_ = auVar26._0_4_ * auVar26._0_4_;
    auVar18._8_4_ = auVar26._8_4_ * auVar26._8_4_;
    auVar18._12_4_ = auVar26._12_4_ * auVar26._12_4_;
    auVar18._16_4_ = auVar26._16_4_ * auVar26._16_4_;
    auVar18._20_4_ = auVar26._20_4_ * auVar26._20_4_;
    auVar18._24_4_ = auVar26._24_4_ * auVar26._24_4_;
    auVar18._28_4_ = auVar26._28_4_;
    auVar223 = vcmpps_avx(auVar18,auVar30,2);
    auVar202 = ZEXT3264(auVar223);
    local_500._0_4_ = (undefined4)(int)uVar13;
    register0x000012c4 = auVar284._4_12_;
    auVar195 = vshufps_avx(_local_500,_local_500,0);
    auVar217._16_16_ = auVar195;
    auVar217._0_16_ = auVar195;
    auVar26 = vcmpps_avx(_DAT_01f7b060,auVar217,1);
    auVar195 = vpermilps_avx(auVar240,0xaa);
    register0x00001450 = auVar195;
    _local_5c0 = auVar195;
    auVar109._8_4_ = auVar241._8_4_;
    auVar109._0_8_ = auVar241._0_8_;
    auVar109._12_4_ = auVar241._12_4_;
    auVar196 = vpermilps_avx(auVar109,0xaa);
    register0x00001550 = auVar196;
    _local_e0 = auVar196;
    auVar213 = vpermilps_avx(auVar242,0xaa);
    register0x00001590 = auVar213;
    _local_100 = auVar213;
    auVar355 = ZEXT3264(_local_100);
    auVar214 = vpermilps_avx(auVar168,0xaa);
    register0x00001310 = auVar214;
    _local_400 = auVar214;
    auVar30 = auVar26 & auVar223;
    uVar125 = *(uint *)(ray + k * 4 + 0x60);
    uStack_768 = auVar242._8_8_;
    local_770 = CONCAT44(0,uVar121);
    local_540._0_16_ = ZEXT416(uVar121);
    local_520._0_16_ = ZEXT416(uVar12);
    auVar170 = ZEXT416((uint)(auVar170._0_4_ * 4.7683716e-07));
    _local_820 = auVar170;
    uStack_8e8 = auVar269._8_8_;
    uStack_858 = auVar353._8_8_;
    uStack_868 = auVar362._8_8_;
    fVar322 = fVar207;
    fVar327 = fVar224;
    fVar329 = fVar226;
    fVar331 = fVar323;
    fVar167 = fVar328;
    fVar183 = fVar330;
    fVar185 = fVar332;
    if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar30 >> 0x7f,0) == '\0') &&
          (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar30 >> 0xbf,0) == '\0') &&
        (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar30[0x1f]) {
      auVar306 = ZEXT3264(auVar144);
      auVar347 = ZEXT3264(_local_740);
      auVar273 = ZEXT3264(_local_7c0);
    }
    else {
      local_440 = vandps_avx(auVar223,auVar26);
      fVar280 = auVar195._0_4_;
      fVar282 = auVar195._4_4_;
      fVar298 = auVar195._8_4_;
      fVar309 = auVar195._12_4_;
      fVar311 = auVar196._0_4_;
      fVar313 = auVar196._4_4_;
      fVar348 = auVar196._8_4_;
      fVar350 = auVar196._12_4_;
      fVar352 = auVar213._0_4_;
      fVar357 = auVar213._4_4_;
      fVar358 = auVar213._8_4_;
      fVar359 = auVar213._12_4_;
      fVar264 = auVar214._0_4_;
      fVar249 = auVar214._4_4_;
      fVar250 = auVar214._8_4_;
      fVar251 = auVar214._12_4_;
      local_580 = fVar280 * fVar208 + fVar311 * fVar206 + fVar352 * fVar312 + fVar264 * fVar294;
      fStack_57c = fVar282 * fVar225 + fVar313 * fVar153 + fVar357 * fVar333 + fVar249 * fVar235;
      fStack_578 = fVar298 * fVar227 + fVar348 * fVar155 + fVar358 * fVar187 + fVar250 * fVar281;
      fStack_574 = fVar309 * fVar230 + fVar350 * fVar157 + fVar359 * fVar228 + fVar251 * fVar295;
      fStack_570 = fVar280 * fVar233 + fVar311 * fVar164 + fVar352 * fVar278 + fVar264 * fVar296;
      fStack_56c = fVar282 * fVar234 + fVar313 * fVar252 + fVar357 * fVar289 + fVar249 * fVar237;
      fStack_568 = fVar298 * fVar236 + fVar348 * fVar161 + fVar358 * fVar290 + fVar250 * fVar130;
      fStack_564 = local_440._28_4_ +
                   auVar26._28_4_ + *(float *)(catmullrom_basis1 + lVar128 + 0x924) + 0.0;
      local_700._0_4_ = auVar116._0_4_;
      local_700._4_4_ = auVar116._4_4_;
      fStack_6f8 = auVar116._8_4_;
      fStack_6f4 = auVar116._12_4_;
      fStack_6f0 = auVar116._16_4_;
      fStack_6ec = auVar116._20_4_;
      fStack_6e8 = auVar116._24_4_;
      local_6a0._0_4_ = auVar115._0_4_;
      local_6a0._4_4_ = auVar115._4_4_;
      uStack_698._0_4_ = auVar115._8_4_;
      uStack_698._4_4_ = auVar115._12_4_;
      uStack_690._0_4_ = auVar115._16_4_;
      uStack_690._4_4_ = auVar115._20_4_;
      uStack_688._0_4_ = auVar115._24_4_;
      local_980._0_4_ = auVar114._0_4_;
      local_980._4_4_ = auVar114._4_4_;
      fStack_978 = auVar114._8_4_;
      fStack_974 = auVar114._12_4_;
      fStack_970 = auVar114._16_4_;
      fStack_96c = auVar114._20_4_;
      fStack_968 = auVar114._24_4_;
      local_6a0._0_4_ =
           fVar280 * fVar231 +
           fVar311 * (float)local_700._0_4_ +
           fVar352 * (float)local_6a0._0_4_ + fVar264 * (float)local_980._0_4_;
      local_6a0._4_4_ =
           fVar282 * fVar279 +
           fVar313 * (float)local_700._4_4_ +
           fVar357 * (float)local_6a0._4_4_ + fVar249 * (float)local_980._4_4_;
      uStack_698._0_4_ =
           fVar298 * fVar291 +
           fVar348 * fStack_6f8 + fVar358 * (float)uStack_698 + fVar250 * fStack_978;
      uStack_698._4_4_ =
           fVar309 * fVar292 +
           fVar350 * fStack_6f4 + fVar359 * uStack_698._4_4_ + fVar251 * fStack_974;
      uStack_690._0_4_ =
           fVar280 * fVar159 +
           fVar311 * fStack_6f0 + fVar352 * (float)uStack_690 + fVar264 * fStack_970;
      uStack_690._4_4_ =
           fVar282 * fVar162 +
           fVar313 * fStack_6ec + fVar357 * uStack_690._4_4_ + fVar249 * fStack_96c;
      uStack_688._0_4_ =
           fVar298 * fVar293 +
           fVar348 * fStack_6e8 + fVar358 * (float)uStack_688 + fVar250 * fStack_968;
      uStack_688._4_4_ = fVar229 + fStack_564 + local_440._28_4_ + auVar26._28_4_;
      fVar232 = *(float *)(catmullrom_basis0 + lVar128 + 0x1210);
      fVar265 = *(float *)(catmullrom_basis0 + lVar128 + 0x1214);
      fVar274 = *(float *)(catmullrom_basis0 + lVar128 + 0x1218);
      fVar276 = *(float *)(catmullrom_basis0 + lVar128 + 0x121c);
      fVar277 = *(float *)(catmullrom_basis0 + lVar128 + 0x1220);
      fVar297 = *(float *)(catmullrom_basis0 + lVar128 + 0x1224);
      fVar308 = *(float *)(catmullrom_basis0 + lVar128 + 0x1228);
      fVar310 = *(float *)(catmullrom_basis0 + lVar128 + 0x1694);
      fVar312 = *(float *)(catmullrom_basis0 + lVar128 + 0x1698);
      fVar333 = *(float *)(catmullrom_basis0 + lVar128 + 0x169c);
      fVar187 = *(float *)(catmullrom_basis0 + lVar128 + 0x16a0);
      fVar228 = *(float *)(catmullrom_basis0 + lVar128 + 0x16a4);
      fVar278 = *(float *)(catmullrom_basis0 + lVar128 + 0x16a8);
      fVar289 = *(float *)(catmullrom_basis0 + lVar128 + 0x16ac);
      fVar290 = *(float *)(catmullrom_basis0 + lVar128 + 0x1b18);
      fVar231 = *(float *)(catmullrom_basis0 + lVar128 + 0x1b1c);
      fVar279 = *(float *)(catmullrom_basis0 + lVar128 + 0x1b20);
      fVar291 = *(float *)(catmullrom_basis0 + lVar128 + 0x1b24);
      fVar292 = *(float *)(catmullrom_basis0 + lVar128 + 0x1b28);
      fVar159 = *(float *)(catmullrom_basis0 + lVar128 + 0x1b2c);
      fVar162 = *(float *)(catmullrom_basis0 + lVar128 + 0x1b30);
      fVar293 = *(float *)(catmullrom_basis0 + lVar128 + 0x1f9c);
      fVar294 = *(float *)(catmullrom_basis0 + lVar128 + 0x1fa0);
      fVar235 = *(float *)(catmullrom_basis0 + lVar128 + 0x1fa4);
      fVar281 = *(float *)(catmullrom_basis0 + lVar128 + 0x1fa8);
      fVar295 = *(float *)(catmullrom_basis0 + lVar128 + 0x1fac);
      fVar296 = *(float *)(catmullrom_basis0 + lVar128 + 0x1fb0);
      fVar237 = *(float *)(catmullrom_basis0 + lVar128 + 0x1fb4);
      fVar130 = *(float *)(catmullrom_basis0 + lVar128 + 0x1b34) +
                *(float *)(catmullrom_basis0 + lVar128 + 0x1fb8);
      fVar153 = fVar309 + auVar338._28_4_ +
                fVar309 + *(float *)(catmullrom_basis1 + lVar128 + 0x4a0);
      fVar206 = *(float *)(catmullrom_basis0 + lVar128 + 0x16b0) + fVar130;
      local_6c0 = fVar158 * fVar232 + fVar314 * fVar310 + fVar166 * fVar290 + fVar131 * fVar293;
      fStack_6bc = fVar160 * fVar265 + fVar315 * fVar312 + fVar182 * fVar231 + fVar152 * fVar294;
      fStack_6b8 = fVar163 * fVar274 + fVar316 * fVar333 + fVar184 * fVar279 + fVar154 * fVar235;
      fStack_6b4 = fVar165 * fVar276 + fVar349 * fVar187 + fVar186 * fVar291 + fVar156 * fVar281;
      fStack_6b0 = fVar158 * fVar277 + fVar314 * fVar228 + fVar166 * fVar292 + fVar131 * fVar295;
      fStack_6ac = fVar160 * fVar297 + fVar315 * fVar278 + fVar182 * fVar159 + fVar152 * fVar296;
      fStack_6a8 = fVar163 * fVar308 + fVar316 * fVar289 + fVar184 * fVar162 + fVar154 * fVar237;
      fStack_6a4 = *(float *)(catmullrom_basis0 + lVar128 + 0x16b0) +
                   *(float *)(catmullrom_basis0 + lVar128 + 0x1fb8) +
                   fVar309 + *(float *)(catmullrom_basis1 + lVar128 + 0x4a0);
      local_480._4_4_ =
           fVar203 * fVar231 + fVar328 * fVar294 + fVar366 * fVar312 + fVar224 * fVar265;
      local_480._0_4_ =
           fVar188 * fVar290 + fVar323 * fVar293 + fVar361 * fVar310 + fVar207 * fVar232;
      fStack_478 = fVar204 * fVar279 + fVar330 * fVar235 + fVar367 * fVar333 + fVar226 * fVar274;
      fStack_474 = fVar205 * fVar291 + fVar332 * fVar281 + fVar368 * fVar187 + fVar229 * fVar276;
      fStack_470 = fVar188 * fVar292 + fVar323 * fVar295 + fVar361 * fVar228 + fVar207 * fVar277;
      fStack_46c = fVar203 * fVar159 + fVar328 * fVar296 + fVar366 * fVar278 + fVar224 * fVar297;
      fStack_468 = fVar204 * fVar162 + fVar330 * fVar237 + fVar367 * fVar289 + fVar226 * fVar308;
      fStack_464 = fVar153 + fVar130;
      local_460._4_4_ =
           fVar313 * fVar312 + fVar357 * fVar231 + fVar249 * fVar294 + fVar282 * fVar265;
      local_460._0_4_ =
           fVar311 * fVar310 + fVar352 * fVar290 + fVar264 * fVar293 + fVar280 * fVar232;
      fStack_458 = fVar348 * fVar333 + fVar358 * fVar279 + fVar250 * fVar235 + fVar298 * fVar274;
      fStack_454 = fVar350 * fVar187 + fVar359 * fVar291 + fVar251 * fVar281 + fVar309 * fVar276;
      fStack_450 = fVar311 * fVar228 + fVar352 * fVar292 + fVar264 * fVar295 + fVar280 * fVar277;
      fStack_44c = fVar313 * fVar278 + fVar357 * fVar159 + fVar249 * fVar296 + fVar282 * fVar297;
      fStack_448 = fVar348 * fVar289 + fVar358 * fVar162 + fVar250 * fVar237 + fVar298 * fVar308;
      fStack_444 = fVar206 + *(float *)(catmullrom_basis0 + lVar128 + 0x122c);
      fVar232 = *(float *)(catmullrom_basis1 + lVar128 + 0x1b18);
      fVar265 = *(float *)(catmullrom_basis1 + lVar128 + 0x1b1c);
      fVar274 = *(float *)(catmullrom_basis1 + lVar128 + 0x1b20);
      fVar276 = *(float *)(catmullrom_basis1 + lVar128 + 0x1b24);
      fVar277 = *(float *)(catmullrom_basis1 + lVar128 + 0x1b28);
      fVar297 = *(float *)(catmullrom_basis1 + lVar128 + 0x1b2c);
      fVar308 = *(float *)(catmullrom_basis1 + lVar128 + 0x1b30);
      fVar310 = *(float *)(catmullrom_basis1 + lVar128 + 0x1f9c);
      fVar312 = *(float *)(catmullrom_basis1 + lVar128 + 0x1fa0);
      fVar333 = *(float *)(catmullrom_basis1 + lVar128 + 0x1fa4);
      fVar187 = *(float *)(catmullrom_basis1 + lVar128 + 0x1fa8);
      fVar228 = *(float *)(catmullrom_basis1 + lVar128 + 0x1fac);
      fVar278 = *(float *)(catmullrom_basis1 + lVar128 + 0x1fb0);
      fVar289 = *(float *)(catmullrom_basis1 + lVar128 + 0x1fb4);
      fVar290 = *(float *)(catmullrom_basis1 + lVar128 + 0x1694);
      fVar231 = *(float *)(catmullrom_basis1 + lVar128 + 0x1698);
      fVar279 = *(float *)(catmullrom_basis1 + lVar128 + 0x169c);
      fVar291 = *(float *)(catmullrom_basis1 + lVar128 + 0x16a0);
      fVar292 = *(float *)(catmullrom_basis1 + lVar128 + 0x16a4);
      fVar159 = *(float *)(catmullrom_basis1 + lVar128 + 0x16a8);
      fVar162 = *(float *)(catmullrom_basis1 + lVar128 + 0x16ac);
      fVar293 = *(float *)(catmullrom_basis1 + lVar128 + 0x1210);
      fVar294 = *(float *)(catmullrom_basis1 + lVar128 + 0x1214);
      fVar235 = *(float *)(catmullrom_basis1 + lVar128 + 0x1218);
      fVar281 = *(float *)(catmullrom_basis1 + lVar128 + 0x121c);
      fVar295 = *(float *)(catmullrom_basis1 + lVar128 + 0x1220);
      fVar296 = *(float *)(catmullrom_basis1 + lVar128 + 0x1224);
      fVar237 = *(float *)(catmullrom_basis1 + lVar128 + 0x1228);
      auVar270._0_4_ = fVar158 * fVar293 + fVar314 * fVar290 + fVar166 * fVar232 + fVar131 * fVar310
      ;
      auVar270._4_4_ = fVar160 * fVar294 + fVar315 * fVar231 + fVar182 * fVar265 + fVar152 * fVar312
      ;
      auVar270._8_4_ = fVar163 * fVar235 + fVar316 * fVar279 + fVar184 * fVar274 + fVar154 * fVar333
      ;
      auVar270._12_4_ =
           fVar165 * fVar281 + fVar349 * fVar291 + fVar186 * fVar276 + fVar156 * fVar187;
      auVar270._16_4_ =
           fVar158 * fVar295 + fVar314 * fVar292 + fVar166 * fVar277 + fVar131 * fVar228;
      auVar270._20_4_ =
           fVar160 * fVar296 + fVar315 * fVar159 + fVar182 * fVar297 + fVar152 * fVar278;
      auVar270._24_4_ =
           fVar163 * fVar237 + fVar316 * fVar162 + fVar184 * fVar308 + fVar154 * fVar289;
      auVar270._28_4_ = fVar205 + fVar205 + fVar153 + fVar206;
      auVar301._0_4_ = fVar207 * fVar293 + fVar361 * fVar290 + fVar188 * fVar232 + fVar323 * fVar310
      ;
      auVar301._4_4_ = fVar224 * fVar294 + fVar366 * fVar231 + fVar203 * fVar265 + fVar328 * fVar312
      ;
      auVar301._8_4_ = fVar226 * fVar235 + fVar367 * fVar279 + fVar204 * fVar274 + fVar330 * fVar333
      ;
      auVar301._12_4_ =
           fVar229 * fVar281 + fVar368 * fVar291 + fVar205 * fVar276 + fVar332 * fVar187;
      auVar301._16_4_ =
           fVar207 * fVar295 + fVar361 * fVar292 + fVar188 * fVar277 + fVar323 * fVar228;
      auVar301._20_4_ =
           fVar224 * fVar296 + fVar366 * fVar159 + fVar203 * fVar297 + fVar328 * fVar278;
      auVar301._24_4_ =
           fVar226 * fVar237 + fVar367 * fVar162 + fVar204 * fVar308 + fVar330 * fVar289;
      auVar301._28_4_ = fVar205 + fVar205 + fVar205 + fVar153;
      auVar199._0_4_ = fVar280 * fVar293 + fVar311 * fVar290 + fVar352 * fVar232 + fVar264 * fVar310
      ;
      auVar199._4_4_ = fVar282 * fVar294 + fVar313 * fVar231 + fVar357 * fVar265 + fVar249 * fVar312
      ;
      auVar199._8_4_ = fVar298 * fVar235 + fVar348 * fVar279 + fVar358 * fVar274 + fVar250 * fVar333
      ;
      auVar199._12_4_ =
           fVar309 * fVar281 + fVar350 * fVar291 + fVar359 * fVar276 + fVar251 * fVar187;
      auVar199._16_4_ =
           fVar280 * fVar295 + fVar311 * fVar292 + fVar352 * fVar277 + fVar264 * fVar228;
      auVar199._20_4_ =
           fVar282 * fVar296 + fVar313 * fVar159 + fVar357 * fVar297 + fVar249 * fVar278;
      auVar199._24_4_ =
           fVar298 * fVar237 + fVar348 * fVar162 + fVar358 * fVar308 + fVar250 * fVar289;
      auVar199._28_4_ =
           *(float *)(catmullrom_basis1 + lVar128 + 0x122c) +
           *(float *)(catmullrom_basis1 + lVar128 + 0x16b0) +
           *(float *)(catmullrom_basis1 + lVar128 + 0x1b34) +
           *(float *)(catmullrom_basis1 + lVar128 + 0x1fb8);
      auVar244._8_4_ = 0x7fffffff;
      auVar244._0_8_ = 0x7fffffff7fffffff;
      auVar244._12_4_ = 0x7fffffff;
      auVar244._16_4_ = 0x7fffffff;
      auVar244._20_4_ = 0x7fffffff;
      auVar244._24_4_ = 0x7fffffff;
      auVar244._28_4_ = 0x7fffffff;
      auVar111._4_4_ = fStack_6bc;
      auVar111._0_4_ = local_6c0;
      auVar111._8_4_ = fStack_6b8;
      auVar111._12_4_ = fStack_6b4;
      auVar111._16_4_ = fStack_6b0;
      auVar111._20_4_ = fStack_6ac;
      auVar111._24_4_ = fStack_6a8;
      auVar111._28_4_ = fStack_6a4;
      auVar223 = vandps_avx(auVar111,auVar244);
      auVar26 = vandps_avx(_local_480,auVar244);
      auVar26 = vmaxps_avx(auVar223,auVar26);
      auVar223 = vandps_avx(auVar244,_local_460);
      auVar223 = vmaxps_avx(auVar26,auVar223);
      auVar170 = vpermilps_avx(auVar170,0);
      auVar259._16_16_ = auVar170;
      auVar259._0_16_ = auVar170;
      auVar223 = vcmpps_avx(auVar223,auVar259,1);
      auVar30 = vblendvps_avx(auVar111,auVar303,auVar223);
      auVar18 = vblendvps_avx(_local_480,auVar25,auVar223);
      auVar223 = vandps_avx(auVar270,auVar244);
      auVar26 = vandps_avx(auVar301,auVar244);
      auVar217 = vmaxps_avx(auVar223,auVar26);
      auVar223 = vandps_avx(auVar199,auVar244);
      auVar223 = vmaxps_avx(auVar217,auVar223);
      auVar217 = vcmpps_avx(auVar223,auVar259,1);
      auVar223 = vblendvps_avx(auVar270,auVar303,auVar217);
      auVar303 = vblendvps_avx(auVar301,auVar25,auVar217);
      fVar206 = auVar30._0_4_;
      fVar153 = auVar30._4_4_;
      fVar155 = auVar30._8_4_;
      fVar157 = auVar30._12_4_;
      fVar164 = auVar30._16_4_;
      fVar252 = auVar30._20_4_;
      fVar161 = auVar30._24_4_;
      fVar208 = auVar223._0_4_;
      fVar225 = auVar223._4_4_;
      fVar227 = auVar223._8_4_;
      fVar230 = auVar223._12_4_;
      fVar233 = auVar223._16_4_;
      fVar234 = auVar223._20_4_;
      fVar236 = auVar223._24_4_;
      fVar131 = -auVar223._28_4_;
      fVar232 = auVar18._0_4_;
      fVar277 = auVar18._4_4_;
      fVar312 = auVar18._8_4_;
      fVar278 = auVar18._12_4_;
      fVar279 = auVar18._16_4_;
      fVar162 = auVar18._20_4_;
      fVar281 = auVar18._24_4_;
      auVar140._0_4_ = fVar232 * fVar232 + fVar206 * fVar206;
      auVar140._4_4_ = fVar277 * fVar277 + fVar153 * fVar153;
      auVar140._8_4_ = fVar312 * fVar312 + fVar155 * fVar155;
      auVar140._12_4_ = fVar278 * fVar278 + fVar157 * fVar157;
      auVar140._16_4_ = fVar279 * fVar279 + fVar164 * fVar164;
      auVar140._20_4_ = fVar162 * fVar162 + fVar252 * fVar252;
      auVar140._24_4_ = fVar281 * fVar281 + fVar161 * fVar161;
      auVar140._28_4_ = auVar301._28_4_ + auVar30._28_4_;
      auVar25 = vrsqrtps_avx(auVar140);
      fVar265 = auVar25._0_4_;
      fVar274 = auVar25._4_4_;
      auVar29._4_4_ = fVar274 * 1.5;
      auVar29._0_4_ = fVar265 * 1.5;
      fVar276 = auVar25._8_4_;
      auVar29._8_4_ = fVar276 * 1.5;
      fVar297 = auVar25._12_4_;
      auVar29._12_4_ = fVar297 * 1.5;
      fVar308 = auVar25._16_4_;
      auVar29._16_4_ = fVar308 * 1.5;
      fVar310 = auVar25._20_4_;
      auVar29._20_4_ = fVar310 * 1.5;
      fVar333 = auVar25._24_4_;
      fVar130 = auVar26._28_4_;
      auVar29._24_4_ = fVar333 * 1.5;
      auVar29._28_4_ = fVar130;
      auVar25._4_4_ = fVar274 * fVar274 * fVar274 * auVar140._4_4_ * 0.5;
      auVar25._0_4_ = fVar265 * fVar265 * fVar265 * auVar140._0_4_ * 0.5;
      auVar25._8_4_ = fVar276 * fVar276 * fVar276 * auVar140._8_4_ * 0.5;
      auVar25._12_4_ = fVar297 * fVar297 * fVar297 * auVar140._12_4_ * 0.5;
      auVar25._16_4_ = fVar308 * fVar308 * fVar308 * auVar140._16_4_ * 0.5;
      auVar25._20_4_ = fVar310 * fVar310 * fVar310 * auVar140._20_4_ * 0.5;
      auVar25._24_4_ = fVar333 * fVar333 * fVar333 * auVar140._24_4_ * 0.5;
      auVar25._28_4_ = auVar140._28_4_;
      auVar26 = vsubps_avx(auVar29,auVar25);
      fVar265 = auVar26._0_4_;
      fVar297 = auVar26._4_4_;
      fVar333 = auVar26._8_4_;
      fVar289 = auVar26._12_4_;
      fVar291 = auVar26._16_4_;
      fVar293 = auVar26._20_4_;
      fVar295 = auVar26._24_4_;
      fVar274 = auVar303._0_4_;
      fVar308 = auVar303._4_4_;
      fVar187 = auVar303._8_4_;
      fVar290 = auVar303._12_4_;
      fVar292 = auVar303._16_4_;
      fVar294 = auVar303._20_4_;
      fVar296 = auVar303._24_4_;
      auVar141._0_4_ = fVar274 * fVar274 + fVar208 * fVar208;
      auVar141._4_4_ = fVar308 * fVar308 + fVar225 * fVar225;
      auVar141._8_4_ = fVar187 * fVar187 + fVar227 * fVar227;
      auVar141._12_4_ = fVar290 * fVar290 + fVar230 * fVar230;
      auVar141._16_4_ = fVar292 * fVar292 + fVar233 * fVar233;
      auVar141._20_4_ = fVar294 * fVar294 + fVar234 * fVar234;
      auVar141._24_4_ = fVar296 * fVar296 + fVar236 * fVar236;
      auVar141._28_4_ = auVar223._28_4_ + auVar26._28_4_;
      auVar223 = vrsqrtps_avx(auVar141);
      fVar276 = auVar223._0_4_;
      fVar310 = auVar223._4_4_;
      auVar27._4_4_ = fVar310 * 1.5;
      auVar27._0_4_ = fVar276 * 1.5;
      fVar228 = auVar223._8_4_;
      auVar27._8_4_ = fVar228 * 1.5;
      fVar231 = auVar223._12_4_;
      auVar27._12_4_ = fVar231 * 1.5;
      fVar159 = auVar223._16_4_;
      auVar27._16_4_ = fVar159 * 1.5;
      fVar235 = auVar223._20_4_;
      auVar27._20_4_ = fVar235 * 1.5;
      fVar237 = auVar223._24_4_;
      auVar27._24_4_ = fVar237 * 1.5;
      auVar27._28_4_ = fVar130;
      auVar28._4_4_ = fVar310 * fVar310 * fVar310 * auVar141._4_4_ * 0.5;
      auVar28._0_4_ = fVar276 * fVar276 * fVar276 * auVar141._0_4_ * 0.5;
      auVar28._8_4_ = fVar228 * fVar228 * fVar228 * auVar141._8_4_ * 0.5;
      auVar28._12_4_ = fVar231 * fVar231 * fVar231 * auVar141._12_4_ * 0.5;
      auVar28._16_4_ = fVar159 * fVar159 * fVar159 * auVar141._16_4_ * 0.5;
      auVar28._20_4_ = fVar235 * fVar235 * fVar235 * auVar141._20_4_ * 0.5;
      auVar28._24_4_ = fVar237 * fVar237 * fVar237 * auVar141._24_4_ * 0.5;
      auVar28._28_4_ = auVar141._28_4_;
      auVar223 = vsubps_avx(auVar27,auVar28);
      fVar276 = auVar223._0_4_;
      fVar310 = auVar223._4_4_;
      fVar228 = auVar223._8_4_;
      fVar231 = auVar223._12_4_;
      fVar159 = auVar223._16_4_;
      fVar235 = auVar223._20_4_;
      fVar237 = auVar223._24_4_;
      fVar232 = auVar139._0_4_ * fVar232 * fVar265;
      fVar277 = auVar139._4_4_ * fVar277 * fVar297;
      auVar31._4_4_ = fVar277;
      auVar31._0_4_ = fVar232;
      fVar312 = auVar139._8_4_ * fVar312 * fVar333;
      auVar31._8_4_ = fVar312;
      fVar278 = auVar139._12_4_ * fVar278 * fVar289;
      auVar31._12_4_ = fVar278;
      fVar279 = auVar139._16_4_ * fVar279 * fVar291;
      auVar31._16_4_ = fVar279;
      fVar162 = auVar139._20_4_ * fVar162 * fVar293;
      auVar31._20_4_ = fVar162;
      fVar281 = auVar139._24_4_ * fVar281 * fVar295;
      auVar31._24_4_ = fVar281;
      auVar31._28_4_ = fVar131;
      local_980._4_4_ = auVar284._4_4_ + fVar277;
      local_980._0_4_ = auVar284._0_4_ + fVar232;
      fStack_978 = auVar284._8_4_ + fVar312;
      fStack_974 = auVar284._12_4_ + fVar278;
      fStack_970 = auVar285._16_4_ + fVar279;
      fStack_96c = auVar285._20_4_ + fVar162;
      fStack_968 = auVar285._24_4_ + fVar281;
      fStack_964 = auVar285._28_4_ + fVar131;
      fVar232 = auVar139._0_4_ * fVar265 * -fVar206;
      fVar277 = auVar139._4_4_ * fVar297 * -fVar153;
      auVar32._4_4_ = fVar277;
      auVar32._0_4_ = fVar232;
      fVar312 = auVar139._8_4_ * fVar333 * -fVar155;
      auVar32._8_4_ = fVar312;
      fVar278 = auVar139._12_4_ * fVar289 * -fVar157;
      auVar32._12_4_ = fVar278;
      fVar279 = auVar139._16_4_ * fVar291 * -fVar164;
      auVar32._16_4_ = fVar279;
      fVar162 = auVar139._20_4_ * fVar293 * -fVar252;
      auVar32._20_4_ = fVar162;
      fVar281 = auVar139._24_4_ * fVar295 * -fVar161;
      auVar32._24_4_ = fVar281;
      auVar32._28_4_ = fVar130;
      local_700._4_4_ = fVar277 + auVar338._4_4_;
      local_700._0_4_ = fVar232 + auVar338._0_4_;
      fStack_6f8 = fVar312 + auVar338._8_4_;
      fStack_6f4 = fVar278 + auVar338._12_4_;
      fStack_6f0 = fVar279 + auVar338._16_4_;
      fStack_6ec = fVar162 + auVar338._20_4_;
      fStack_6e8 = fVar281 + auVar338._24_4_;
      fStack_6e4 = fVar130 + auVar338._28_4_;
      fVar232 = fVar265 * 0.0 * auVar139._0_4_;
      fVar265 = fVar297 * 0.0 * auVar139._4_4_;
      auVar33._4_4_ = fVar265;
      auVar33._0_4_ = fVar232;
      fVar277 = fVar333 * 0.0 * auVar139._8_4_;
      auVar33._8_4_ = fVar277;
      fVar297 = fVar289 * 0.0 * auVar139._12_4_;
      auVar33._12_4_ = fVar297;
      fVar312 = fVar291 * 0.0 * auVar139._16_4_;
      auVar33._16_4_ = fVar312;
      fVar333 = fVar293 * 0.0 * auVar139._20_4_;
      auVar33._20_4_ = fVar333;
      fVar278 = fVar295 * 0.0 * auVar139._24_4_;
      auVar33._24_4_ = fVar278;
      auVar33._28_4_ = fVar368;
      auVar260._0_4_ = fVar232 + (float)local_6a0._0_4_;
      auVar260._4_4_ = fVar265 + (float)local_6a0._4_4_;
      auVar260._8_4_ = fVar277 + (float)uStack_698;
      auVar260._12_4_ = fVar297 + uStack_698._4_4_;
      auVar260._16_4_ = fVar312 + (float)uStack_690;
      auVar260._20_4_ = fVar333 + uStack_690._4_4_;
      auVar260._24_4_ = fVar278 + (float)uStack_688;
      auVar260._28_4_ = fVar368 + uStack_688._4_4_;
      fVar232 = auVar255._0_4_ * fVar274 * fVar276;
      fVar265 = auVar255._4_4_ * fVar308 * fVar310;
      auVar34._4_4_ = fVar265;
      auVar34._0_4_ = fVar232;
      fVar274 = auVar255._8_4_ * fVar187 * fVar228;
      auVar34._8_4_ = fVar274;
      fVar277 = auVar255._12_4_ * fVar290 * fVar231;
      auVar34._12_4_ = fVar277;
      fVar297 = auVar255._16_4_ * fVar292 * fVar159;
      auVar34._16_4_ = fVar297;
      fVar308 = auVar255._20_4_ * fVar294 * fVar235;
      auVar34._20_4_ = fVar308;
      fVar312 = auVar255._24_4_ * fVar296 * fVar237;
      auVar34._24_4_ = fVar312;
      auVar34._28_4_ = auVar303._28_4_;
      auVar217 = vsubps_avx(auVar285,auVar31);
      auVar302._0_4_ = auVar243._0_4_ + fVar232;
      auVar302._4_4_ = auVar243._4_4_ + fVar265;
      auVar302._8_4_ = auVar243._8_4_ + fVar274;
      auVar302._12_4_ = auVar243._12_4_ + fVar277;
      auVar302._16_4_ = auVar243._16_4_ + fVar297;
      auVar302._20_4_ = auVar243._20_4_ + fVar308;
      auVar302._24_4_ = auVar243._24_4_ + fVar312;
      auVar302._28_4_ = auVar243._28_4_ + auVar303._28_4_;
      fVar232 = auVar255._0_4_ * fVar276 * -fVar208;
      fVar265 = auVar255._4_4_ * fVar310 * -fVar225;
      auVar303._4_4_ = fVar265;
      auVar303._0_4_ = fVar232;
      fVar274 = auVar255._8_4_ * fVar228 * -fVar227;
      auVar303._8_4_ = fVar274;
      fVar277 = auVar255._12_4_ * fVar231 * -fVar230;
      auVar303._12_4_ = fVar277;
      fVar297 = auVar255._16_4_ * fVar159 * -fVar233;
      auVar303._16_4_ = fVar297;
      fVar308 = auVar255._20_4_ * fVar235 * -fVar234;
      auVar303._20_4_ = fVar308;
      fVar312 = auVar255._24_4_ * fVar237 * -fVar236;
      auVar303._24_4_ = fVar312;
      auVar303._28_4_ = fVar350;
      auVar338 = vsubps_avx(auVar338,auVar32);
      auVar318._0_4_ = fVar232 + (float)local_680._0_4_;
      auVar318._4_4_ = fVar265 + (float)local_680._4_4_;
      auVar318._8_4_ = fVar274 + fStack_678;
      auVar318._12_4_ = fVar277 + fStack_674;
      auVar318._16_4_ = fVar297 + auVar216._16_4_;
      auVar318._20_4_ = fVar308 + auVar216._20_4_;
      auVar318._24_4_ = fVar312 + auVar216._24_4_;
      auVar318._28_4_ = fVar350 + auVar216._28_4_;
      fVar232 = auVar255._0_4_ * fVar276 * 0.0;
      fVar265 = auVar255._4_4_ * fVar310 * 0.0;
      auVar35._4_4_ = fVar265;
      auVar35._0_4_ = fVar232;
      fVar274 = auVar255._8_4_ * fVar228 * 0.0;
      auVar35._8_4_ = fVar274;
      fVar276 = auVar255._12_4_ * fVar231 * 0.0;
      auVar35._12_4_ = fVar276;
      fVar277 = auVar255._16_4_ * fVar159 * 0.0;
      auVar35._16_4_ = fVar277;
      fVar297 = auVar255._20_4_ * fVar235 * 0.0;
      auVar35._20_4_ = fVar297;
      fVar308 = auVar255._24_4_ * fVar237 * 0.0;
      auVar35._24_4_ = fVar308;
      auVar35._28_4_ = 0x3f000000;
      auVar29 = vsubps_avx(_local_6a0,auVar33);
      auVar113._4_4_ = fStack_57c;
      auVar113._0_4_ = local_580;
      auVar113._8_4_ = fStack_578;
      auVar113._12_4_ = fStack_574;
      auVar113._16_4_ = fStack_570;
      auVar113._20_4_ = fStack_56c;
      auVar113._24_4_ = fStack_568;
      auVar113._28_4_ = fStack_564;
      auVar354._0_4_ = fVar232 + local_580;
      auVar354._4_4_ = fVar265 + fStack_57c;
      auVar354._8_4_ = fVar274 + fStack_578;
      auVar354._12_4_ = fVar276 + fStack_574;
      auVar354._16_4_ = fVar277 + fStack_570;
      auVar354._20_4_ = fVar297 + fStack_56c;
      auVar354._24_4_ = fVar308 + fStack_568;
      auVar354._28_4_ = fStack_564 + 0.5;
      auVar223 = vsubps_avx(auVar243,auVar34);
      auVar26 = vsubps_avx(auVar216,auVar303);
      auVar27 = vsubps_avx(auVar113,auVar35);
      auVar303 = vsubps_avx(auVar318,auVar338);
      auVar25 = vsubps_avx(auVar354,auVar29);
      auVar36._4_4_ = auVar29._4_4_ * auVar303._4_4_;
      auVar36._0_4_ = auVar29._0_4_ * auVar303._0_4_;
      auVar36._8_4_ = auVar29._8_4_ * auVar303._8_4_;
      auVar36._12_4_ = auVar29._12_4_ * auVar303._12_4_;
      auVar36._16_4_ = auVar29._16_4_ * auVar303._16_4_;
      auVar36._20_4_ = auVar29._20_4_ * auVar303._20_4_;
      auVar36._24_4_ = auVar29._24_4_ * auVar303._24_4_;
      auVar36._28_4_ = fVar349;
      auVar37._4_4_ = auVar338._4_4_ * auVar25._4_4_;
      auVar37._0_4_ = auVar338._0_4_ * auVar25._0_4_;
      auVar37._8_4_ = auVar338._8_4_ * auVar25._8_4_;
      auVar37._12_4_ = auVar338._12_4_ * auVar25._12_4_;
      auVar37._16_4_ = auVar338._16_4_ * auVar25._16_4_;
      auVar37._20_4_ = auVar338._20_4_ * auVar25._20_4_;
      auVar37._24_4_ = auVar338._24_4_ * auVar25._24_4_;
      auVar37._28_4_ = auVar216._28_4_;
      auVar30 = vsubps_avx(auVar37,auVar36);
      auVar38._4_4_ = auVar217._4_4_ * auVar25._4_4_;
      auVar38._0_4_ = auVar217._0_4_ * auVar25._0_4_;
      auVar38._8_4_ = auVar217._8_4_ * auVar25._8_4_;
      auVar38._12_4_ = auVar217._12_4_ * auVar25._12_4_;
      auVar38._16_4_ = auVar217._16_4_ * auVar25._16_4_;
      auVar38._20_4_ = auVar217._20_4_ * auVar25._20_4_;
      auVar38._24_4_ = auVar217._24_4_ * auVar25._24_4_;
      auVar38._28_4_ = auVar25._28_4_;
      auVar18 = vsubps_avx(auVar302,auVar217);
      auVar39._4_4_ = auVar29._4_4_ * auVar18._4_4_;
      auVar39._0_4_ = auVar29._0_4_ * auVar18._0_4_;
      auVar39._8_4_ = auVar29._8_4_ * auVar18._8_4_;
      auVar39._12_4_ = auVar29._12_4_ * auVar18._12_4_;
      auVar39._16_4_ = auVar29._16_4_ * auVar18._16_4_;
      auVar39._20_4_ = auVar29._20_4_ * auVar18._20_4_;
      auVar39._24_4_ = auVar29._24_4_ * auVar18._24_4_;
      auVar39._28_4_ = auVar243._28_4_;
      auVar216 = vsubps_avx(auVar39,auVar38);
      auVar40._4_4_ = auVar18._4_4_ * auVar338._4_4_;
      auVar40._0_4_ = auVar18._0_4_ * auVar338._0_4_;
      auVar40._8_4_ = auVar18._8_4_ * auVar338._8_4_;
      auVar40._12_4_ = auVar18._12_4_ * auVar338._12_4_;
      auVar40._16_4_ = auVar18._16_4_ * auVar338._16_4_;
      auVar40._20_4_ = auVar18._20_4_ * auVar338._20_4_;
      auVar40._24_4_ = auVar18._24_4_ * auVar338._24_4_;
      auVar40._28_4_ = auVar25._28_4_;
      auVar41._4_4_ = auVar217._4_4_ * auVar303._4_4_;
      auVar41._0_4_ = auVar217._0_4_ * auVar303._0_4_;
      auVar41._8_4_ = auVar217._8_4_ * auVar303._8_4_;
      auVar41._12_4_ = auVar217._12_4_ * auVar303._12_4_;
      auVar41._16_4_ = auVar217._16_4_ * auVar303._16_4_;
      auVar41._20_4_ = auVar217._20_4_ * auVar303._20_4_;
      auVar41._24_4_ = auVar217._24_4_ * auVar303._24_4_;
      auVar41._28_4_ = auVar303._28_4_;
      auVar303 = vsubps_avx(auVar41,auVar40);
      auVar142._0_4_ = auVar30._0_4_ * 0.0 + auVar303._0_4_ + auVar216._0_4_ * 0.0;
      auVar142._4_4_ = auVar30._4_4_ * 0.0 + auVar303._4_4_ + auVar216._4_4_ * 0.0;
      auVar142._8_4_ = auVar30._8_4_ * 0.0 + auVar303._8_4_ + auVar216._8_4_ * 0.0;
      auVar142._12_4_ = auVar30._12_4_ * 0.0 + auVar303._12_4_ + auVar216._12_4_ * 0.0;
      auVar142._16_4_ = auVar30._16_4_ * 0.0 + auVar303._16_4_ + auVar216._16_4_ * 0.0;
      auVar142._20_4_ = auVar30._20_4_ * 0.0 + auVar303._20_4_ + auVar216._20_4_ * 0.0;
      auVar142._24_4_ = auVar30._24_4_ * 0.0 + auVar303._24_4_ + auVar216._24_4_ * 0.0;
      auVar142._28_4_ = auVar303._28_4_ + auVar303._28_4_ + auVar216._28_4_;
      auVar285 = vcmpps_avx(auVar142,ZEXT432(0) << 0x20,2);
      auVar202 = ZEXT3264(auVar285);
      auVar223 = vblendvps_avx(auVar223,_local_980,auVar285);
      auVar26 = vblendvps_avx(auVar26,_local_700,auVar285);
      auVar303 = vblendvps_avx(auVar27,auVar260,auVar285);
      auVar25 = vblendvps_avx(auVar217,auVar302,auVar285);
      auVar30 = vblendvps_avx(auVar338,auVar318,auVar285);
      auVar18 = vblendvps_avx(auVar29,auVar354,auVar285);
      auVar216 = vblendvps_avx(auVar302,auVar217,auVar285);
      auVar217 = vblendvps_avx(auVar318,auVar338,auVar285);
      auVar170 = vpackssdw_avx(local_440._0_16_,local_440._16_16_);
      auVar243 = vblendvps_avx(auVar354,auVar29,auVar285);
      auVar216 = vsubps_avx(auVar216,auVar223);
      auVar338 = vsubps_avx(auVar217,auVar26);
      auVar243 = vsubps_avx(auVar243,auVar303);
      auVar28 = vsubps_avx(auVar26,auVar30);
      fVar232 = auVar338._0_4_;
      fVar161 = auVar303._0_4_;
      fVar297 = auVar338._4_4_;
      fVar208 = auVar303._4_4_;
      auVar42._4_4_ = fVar208 * fVar297;
      auVar42._0_4_ = fVar161 * fVar232;
      fVar187 = auVar338._8_4_;
      fVar225 = auVar303._8_4_;
      auVar42._8_4_ = fVar225 * fVar187;
      fVar231 = auVar338._12_4_;
      fVar227 = auVar303._12_4_;
      auVar42._12_4_ = fVar227 * fVar231;
      fVar162 = auVar338._16_4_;
      fVar230 = auVar303._16_4_;
      auVar42._16_4_ = fVar230 * fVar162;
      fVar295 = auVar338._20_4_;
      fVar233 = auVar303._20_4_;
      auVar42._20_4_ = fVar233 * fVar295;
      fVar153 = auVar338._24_4_;
      fVar234 = auVar303._24_4_;
      auVar42._24_4_ = fVar234 * fVar153;
      auVar42._28_4_ = auVar217._28_4_;
      fVar265 = auVar26._0_4_;
      fVar163 = auVar243._0_4_;
      fVar308 = auVar26._4_4_;
      fVar165 = auVar243._4_4_;
      auVar43._4_4_ = fVar165 * fVar308;
      auVar43._0_4_ = fVar163 * fVar265;
      fVar228 = auVar26._8_4_;
      fVar264 = auVar243._8_4_;
      auVar43._8_4_ = fVar264 * fVar228;
      fVar279 = auVar26._12_4_;
      fVar249 = auVar243._12_4_;
      auVar43._12_4_ = fVar249 * fVar279;
      fVar293 = auVar26._16_4_;
      fVar250 = auVar243._16_4_;
      auVar43._16_4_ = fVar250 * fVar293;
      fVar296 = auVar26._20_4_;
      fVar251 = auVar243._20_4_;
      auVar43._20_4_ = fVar251 * fVar296;
      fVar155 = auVar26._24_4_;
      fVar280 = auVar243._24_4_;
      uVar129 = auVar27._28_4_;
      auVar43._24_4_ = fVar280 * fVar155;
      auVar43._28_4_ = uVar129;
      auVar26 = vsubps_avx(auVar43,auVar42);
      fVar274 = auVar223._0_4_;
      fVar310 = auVar223._4_4_;
      auVar44._4_4_ = fVar165 * fVar310;
      auVar44._0_4_ = fVar163 * fVar274;
      fVar278 = auVar223._8_4_;
      auVar44._8_4_ = fVar264 * fVar278;
      fVar291 = auVar223._12_4_;
      auVar44._12_4_ = fVar249 * fVar291;
      fVar294 = auVar223._16_4_;
      auVar44._16_4_ = fVar250 * fVar294;
      fVar237 = auVar223._20_4_;
      auVar44._20_4_ = fVar251 * fVar237;
      fVar157 = auVar223._24_4_;
      auVar44._24_4_ = fVar280 * fVar157;
      auVar44._28_4_ = uVar129;
      fVar276 = auVar216._0_4_;
      fVar312 = auVar216._4_4_;
      auVar45._4_4_ = fVar208 * fVar312;
      auVar45._0_4_ = fVar161 * fVar276;
      fVar289 = auVar216._8_4_;
      auVar45._8_4_ = fVar225 * fVar289;
      fVar292 = auVar216._12_4_;
      auVar45._12_4_ = fVar227 * fVar292;
      fVar235 = auVar216._16_4_;
      auVar45._16_4_ = fVar230 * fVar235;
      fVar130 = auVar216._20_4_;
      auVar45._20_4_ = fVar233 * fVar130;
      fVar164 = auVar216._24_4_;
      auVar45._24_4_ = fVar234 * fVar164;
      auVar45._28_4_ = auVar354._28_4_;
      auVar217 = vsubps_avx(auVar45,auVar44);
      auVar46._4_4_ = fVar308 * fVar312;
      auVar46._0_4_ = fVar265 * fVar276;
      auVar46._8_4_ = fVar228 * fVar289;
      auVar46._12_4_ = fVar279 * fVar292;
      auVar46._16_4_ = fVar293 * fVar235;
      auVar46._20_4_ = fVar296 * fVar130;
      auVar46._24_4_ = fVar155 * fVar164;
      auVar46._28_4_ = uVar129;
      auVar363._0_4_ = fVar274 * fVar232;
      auVar363._4_4_ = fVar310 * fVar297;
      auVar363._8_4_ = fVar278 * fVar187;
      auVar363._12_4_ = fVar291 * fVar231;
      auVar363._16_4_ = fVar294 * fVar162;
      auVar363._20_4_ = fVar237 * fVar295;
      auVar363._24_4_ = fVar157 * fVar153;
      auVar363._28_4_ = 0;
      auVar29 = vsubps_avx(auVar363,auVar46);
      auVar27 = vsubps_avx(auVar303,auVar18);
      fVar277 = auVar29._28_4_ + auVar217._28_4_;
      auVar175._0_4_ = auVar29._0_4_ + auVar217._0_4_ * 0.0 + auVar26._0_4_ * 0.0;
      auVar175._4_4_ = auVar29._4_4_ + auVar217._4_4_ * 0.0 + auVar26._4_4_ * 0.0;
      auVar175._8_4_ = auVar29._8_4_ + auVar217._8_4_ * 0.0 + auVar26._8_4_ * 0.0;
      auVar175._12_4_ = auVar29._12_4_ + auVar217._12_4_ * 0.0 + auVar26._12_4_ * 0.0;
      auVar175._16_4_ = auVar29._16_4_ + auVar217._16_4_ * 0.0 + auVar26._16_4_ * 0.0;
      auVar175._20_4_ = auVar29._20_4_ + auVar217._20_4_ * 0.0 + auVar26._20_4_ * 0.0;
      auVar175._24_4_ = auVar29._24_4_ + auVar217._24_4_ * 0.0 + auVar26._24_4_ * 0.0;
      auVar175._28_4_ = fVar277 + auVar26._28_4_;
      fVar236 = auVar28._0_4_;
      fVar131 = auVar28._4_4_;
      auVar47._4_4_ = fVar131 * auVar18._4_4_;
      auVar47._0_4_ = fVar236 * auVar18._0_4_;
      fVar152 = auVar28._8_4_;
      auVar47._8_4_ = fVar152 * auVar18._8_4_;
      fVar154 = auVar28._12_4_;
      auVar47._12_4_ = fVar154 * auVar18._12_4_;
      fVar156 = auVar28._16_4_;
      auVar47._16_4_ = fVar156 * auVar18._16_4_;
      fVar158 = auVar28._20_4_;
      auVar47._20_4_ = fVar158 * auVar18._20_4_;
      fVar160 = auVar28._24_4_;
      auVar47._24_4_ = fVar160 * auVar18._24_4_;
      auVar47._28_4_ = fVar277;
      fVar277 = auVar27._0_4_;
      fVar333 = auVar27._4_4_;
      auVar48._4_4_ = auVar30._4_4_ * fVar333;
      auVar48._0_4_ = auVar30._0_4_ * fVar277;
      fVar290 = auVar27._8_4_;
      auVar48._8_4_ = auVar30._8_4_ * fVar290;
      fVar159 = auVar27._12_4_;
      auVar48._12_4_ = auVar30._12_4_ * fVar159;
      fVar281 = auVar27._16_4_;
      auVar48._16_4_ = auVar30._16_4_ * fVar281;
      fVar206 = auVar27._20_4_;
      auVar48._20_4_ = auVar30._20_4_ * fVar206;
      fVar252 = auVar27._24_4_;
      auVar48._24_4_ = auVar30._24_4_ * fVar252;
      auVar48._28_4_ = auVar29._28_4_;
      auVar217 = vsubps_avx(auVar48,auVar47);
      auVar223 = vsubps_avx(auVar223,auVar25);
      fVar282 = auVar223._0_4_;
      fVar298 = auVar223._4_4_;
      auVar49._4_4_ = fVar298 * auVar18._4_4_;
      auVar49._0_4_ = fVar282 * auVar18._0_4_;
      fVar309 = auVar223._8_4_;
      auVar49._8_4_ = fVar309 * auVar18._8_4_;
      fVar311 = auVar223._12_4_;
      auVar49._12_4_ = fVar311 * auVar18._12_4_;
      fVar313 = auVar223._16_4_;
      auVar49._16_4_ = fVar313 * auVar18._16_4_;
      fVar314 = auVar223._20_4_;
      auVar49._20_4_ = fVar314 * auVar18._20_4_;
      fVar315 = auVar223._24_4_;
      auVar49._24_4_ = fVar315 * auVar18._24_4_;
      auVar49._28_4_ = auVar18._28_4_;
      auVar50._4_4_ = auVar25._4_4_ * fVar333;
      auVar50._0_4_ = auVar25._0_4_ * fVar277;
      auVar50._8_4_ = auVar25._8_4_ * fVar290;
      auVar50._12_4_ = auVar25._12_4_ * fVar159;
      auVar50._16_4_ = auVar25._16_4_ * fVar281;
      auVar50._20_4_ = auVar25._20_4_ * fVar206;
      auVar50._24_4_ = auVar25._24_4_ * fVar252;
      auVar50._28_4_ = auVar26._28_4_;
      auVar223 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = auVar30._4_4_ * fVar298;
      auVar51._0_4_ = auVar30._0_4_ * fVar282;
      auVar51._8_4_ = auVar30._8_4_ * fVar309;
      auVar51._12_4_ = auVar30._12_4_ * fVar311;
      auVar51._16_4_ = auVar30._16_4_ * fVar313;
      auVar51._20_4_ = auVar30._20_4_ * fVar314;
      auVar51._24_4_ = auVar30._24_4_ * fVar315;
      auVar51._28_4_ = auVar18._28_4_;
      auVar52._4_4_ = auVar25._4_4_ * fVar131;
      auVar52._0_4_ = auVar25._0_4_ * fVar236;
      auVar52._8_4_ = auVar25._8_4_ * fVar152;
      auVar52._12_4_ = auVar25._12_4_ * fVar154;
      auVar52._16_4_ = auVar25._16_4_ * fVar156;
      auVar52._20_4_ = auVar25._20_4_ * fVar158;
      auVar52._24_4_ = auVar25._24_4_ * fVar160;
      auVar52._28_4_ = auVar25._28_4_;
      auVar26 = vsubps_avx(auVar52,auVar51);
      auVar245._0_4_ = auVar217._0_4_ * 0.0 + auVar26._0_4_ + auVar223._0_4_ * 0.0;
      auVar245._4_4_ = auVar217._4_4_ * 0.0 + auVar26._4_4_ + auVar223._4_4_ * 0.0;
      auVar245._8_4_ = auVar217._8_4_ * 0.0 + auVar26._8_4_ + auVar223._8_4_ * 0.0;
      auVar245._12_4_ = auVar217._12_4_ * 0.0 + auVar26._12_4_ + auVar223._12_4_ * 0.0;
      auVar245._16_4_ = auVar217._16_4_ * 0.0 + auVar26._16_4_ + auVar223._16_4_ * 0.0;
      auVar245._20_4_ = auVar217._20_4_ * 0.0 + auVar26._20_4_ + auVar223._20_4_ * 0.0;
      auVar245._24_4_ = auVar217._24_4_ * 0.0 + auVar26._24_4_ + auVar223._24_4_ * 0.0;
      auVar245._28_4_ = auVar26._28_4_ + auVar26._28_4_ + auVar223._28_4_;
      auVar223 = vmaxps_avx(auVar175,auVar245);
      auVar223 = vcmpps_avx(auVar223,ZEXT832(0) << 0x20,2);
      auVar195 = vpackssdw_avx(auVar223._0_16_,auVar223._16_16_);
      auVar170 = vpand_avx(auVar195,auVar170);
      auVar195 = vpmovsxwd_avx(auVar170);
      auVar196 = vpunpckhwd_avx(auVar170,auVar170);
      auVar218._16_16_ = auVar196;
      auVar218._0_16_ = auVar195;
      if ((((((((auVar218 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar218 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar218 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar218 >> 0x7f,0) == '\0') &&
            (auVar218 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar196 >> 0x3f,0) == '\0') &&
          (auVar218 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar196[0xf]
         ) {
LAB_009402a9:
        auVar307 = ZEXT3264(CONCAT824(uStack_5e8,
                                      CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
        auVar223 = vcmpps_avx(auVar28,auVar28,0xf);
        auVar288 = ZEXT3264(auVar223);
        auVar306 = ZEXT3264(auVar144);
      }
      else {
        auVar53._4_4_ = fVar333 * fVar297;
        auVar53._0_4_ = fVar277 * fVar232;
        auVar53._8_4_ = fVar290 * fVar187;
        auVar53._12_4_ = fVar159 * fVar231;
        auVar53._16_4_ = fVar281 * fVar162;
        auVar53._20_4_ = fVar206 * fVar295;
        auVar53._24_4_ = fVar252 * fVar153;
        auVar53._28_4_ = auVar196._12_4_;
        auVar339._0_4_ = fVar236 * fVar163;
        auVar339._4_4_ = fVar131 * fVar165;
        auVar339._8_4_ = fVar152 * fVar264;
        auVar339._12_4_ = fVar154 * fVar249;
        auVar339._16_4_ = fVar156 * fVar250;
        auVar339._20_4_ = fVar158 * fVar251;
        auVar339._24_4_ = fVar160 * fVar280;
        auVar339._28_4_ = 0;
        auVar223 = vsubps_avx(auVar339,auVar53);
        auVar54._4_4_ = fVar298 * fVar165;
        auVar54._0_4_ = fVar282 * fVar163;
        auVar54._8_4_ = fVar309 * fVar264;
        auVar54._12_4_ = fVar311 * fVar249;
        auVar54._16_4_ = fVar313 * fVar250;
        auVar54._20_4_ = fVar314 * fVar251;
        auVar54._24_4_ = fVar315 * fVar280;
        auVar54._28_4_ = auVar243._28_4_;
        auVar55._4_4_ = fVar333 * fVar312;
        auVar55._0_4_ = fVar277 * fVar276;
        auVar55._8_4_ = fVar290 * fVar289;
        auVar55._12_4_ = fVar159 * fVar292;
        auVar55._16_4_ = fVar281 * fVar235;
        auVar55._20_4_ = fVar206 * fVar130;
        auVar55._24_4_ = fVar252 * fVar164;
        auVar55._28_4_ = auVar27._28_4_;
        auVar26 = vsubps_avx(auVar55,auVar54);
        auVar56._4_4_ = fVar131 * fVar312;
        auVar56._0_4_ = fVar236 * fVar276;
        auVar56._8_4_ = fVar152 * fVar289;
        auVar56._12_4_ = fVar154 * fVar292;
        auVar56._16_4_ = fVar156 * fVar235;
        auVar56._20_4_ = fVar158 * fVar130;
        auVar56._24_4_ = fVar160 * fVar164;
        auVar56._28_4_ = auVar175._28_4_;
        auVar57._4_4_ = fVar298 * fVar297;
        auVar57._0_4_ = fVar282 * fVar232;
        auVar57._8_4_ = fVar309 * fVar187;
        auVar57._12_4_ = fVar311 * fVar231;
        auVar57._16_4_ = fVar313 * fVar162;
        auVar57._20_4_ = fVar314 * fVar295;
        auVar57._24_4_ = fVar315 * fVar153;
        auVar57._28_4_ = auVar338._28_4_;
        auVar28 = vsubps_avx(auVar57,auVar56);
        auVar271._0_4_ = auVar223._0_4_ * 0.0 + auVar28._0_4_ + auVar26._0_4_ * 0.0;
        auVar271._4_4_ = auVar223._4_4_ * 0.0 + auVar28._4_4_ + auVar26._4_4_ * 0.0;
        auVar271._8_4_ = auVar223._8_4_ * 0.0 + auVar28._8_4_ + auVar26._8_4_ * 0.0;
        auVar271._12_4_ = auVar223._12_4_ * 0.0 + auVar28._12_4_ + auVar26._12_4_ * 0.0;
        auVar271._16_4_ = auVar223._16_4_ * 0.0 + auVar28._16_4_ + auVar26._16_4_ * 0.0;
        auVar271._20_4_ = auVar223._20_4_ * 0.0 + auVar28._20_4_ + auVar26._20_4_ * 0.0;
        auVar271._24_4_ = auVar223._24_4_ * 0.0 + auVar28._24_4_ + auVar26._24_4_ * 0.0;
        auVar271._28_4_ = auVar338._28_4_ + auVar28._28_4_ + auVar175._28_4_;
        auVar25 = vrcpps_avx(auVar271);
        fVar232 = auVar25._0_4_;
        fVar276 = auVar25._4_4_;
        auVar58._4_4_ = auVar271._4_4_ * fVar276;
        auVar58._0_4_ = auVar271._0_4_ * fVar232;
        fVar277 = auVar25._8_4_;
        auVar58._8_4_ = auVar271._8_4_ * fVar277;
        fVar297 = auVar25._12_4_;
        auVar58._12_4_ = auVar271._12_4_ * fVar297;
        fVar312 = auVar25._16_4_;
        auVar58._16_4_ = auVar271._16_4_ * fVar312;
        fVar333 = auVar25._20_4_;
        auVar58._20_4_ = auVar271._20_4_ * fVar333;
        fVar187 = auVar25._24_4_;
        auVar58._24_4_ = auVar271._24_4_ * fVar187;
        auVar58._28_4_ = auVar27._28_4_;
        auVar340._8_4_ = 0x3f800000;
        auVar340._0_8_ = 0x3f8000003f800000;
        auVar340._12_4_ = 0x3f800000;
        auVar340._16_4_ = 0x3f800000;
        auVar340._20_4_ = 0x3f800000;
        auVar340._24_4_ = 0x3f800000;
        auVar340._28_4_ = 0x3f800000;
        auVar30 = vsubps_avx(auVar340,auVar58);
        fVar232 = auVar30._0_4_ * fVar232 + fVar232;
        fVar276 = auVar30._4_4_ * fVar276 + fVar276;
        fVar277 = auVar30._8_4_ * fVar277 + fVar277;
        fVar297 = auVar30._12_4_ * fVar297 + fVar297;
        fVar312 = auVar30._16_4_ * fVar312 + fVar312;
        fVar333 = auVar30._20_4_ * fVar333 + fVar333;
        fVar187 = auVar30._24_4_ * fVar187 + fVar187;
        auVar59._4_4_ =
             (auVar223._4_4_ * fVar310 + auVar26._4_4_ * fVar308 + auVar28._4_4_ * fVar208) *
             fVar276;
        auVar59._0_4_ =
             (auVar223._0_4_ * fVar274 + auVar26._0_4_ * fVar265 + auVar28._0_4_ * fVar161) *
             fVar232;
        auVar59._8_4_ =
             (auVar223._8_4_ * fVar278 + auVar26._8_4_ * fVar228 + auVar28._8_4_ * fVar225) *
             fVar277;
        auVar59._12_4_ =
             (auVar223._12_4_ * fVar291 + auVar26._12_4_ * fVar279 + auVar28._12_4_ * fVar227) *
             fVar297;
        auVar59._16_4_ =
             (auVar223._16_4_ * fVar294 + auVar26._16_4_ * fVar293 + auVar28._16_4_ * fVar230) *
             fVar312;
        auVar59._20_4_ =
             (auVar223._20_4_ * fVar237 + auVar26._20_4_ * fVar296 + auVar28._20_4_ * fVar233) *
             fVar333;
        auVar59._24_4_ =
             (auVar223._24_4_ * fVar157 + auVar26._24_4_ * fVar155 + auVar28._24_4_ * fVar234) *
             fVar187;
        auVar59._28_4_ = auVar216._28_4_ + auVar303._28_4_;
        auVar195 = vpermilps_avx(ZEXT416(uVar125),0);
        auVar143._16_16_ = auVar195;
        auVar143._0_16_ = auVar195;
        auVar223 = vcmpps_avx(auVar143,auVar59,2);
        uVar129 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar219._4_4_ = uVar129;
        auVar219._0_4_ = uVar129;
        auVar219._8_4_ = uVar129;
        auVar219._12_4_ = uVar129;
        auVar219._16_4_ = uVar129;
        auVar219._20_4_ = uVar129;
        auVar219._24_4_ = uVar129;
        auVar219._28_4_ = uVar129;
        auVar26 = vcmpps_avx(auVar59,auVar219,2);
        auVar223 = vandps_avx(auVar26,auVar223);
        auVar195 = vpackssdw_avx(auVar223._0_16_,auVar223._16_16_);
        auVar170 = vpand_avx(auVar170,auVar195);
        auVar195 = vpmovsxwd_avx(auVar170);
        auVar196 = vpshufd_avx(auVar170,0xee);
        auVar196 = vpmovsxwd_avx(auVar196);
        auVar220._16_16_ = auVar196;
        auVar220._0_16_ = auVar195;
        if ((((((((auVar220 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar220 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar220 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar220 >> 0x7f,0) == '\0') &&
              (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar196 >> 0x3f,0) == '\0') &&
            (auVar220 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar196[0xf]) goto LAB_009402a9;
        auVar223 = vcmpps_avx(ZEXT832(0) << 0x20,auVar271,4);
        auVar195 = vpackssdw_avx(auVar223._0_16_,auVar223._16_16_);
        auVar170 = vpand_avx(auVar170,auVar195);
        auVar195 = vpmovsxwd_avx(auVar170);
        auVar170 = vpunpckhwd_avx(auVar170,auVar170);
        auVar261._16_16_ = auVar170;
        auVar261._0_16_ = auVar195;
        auVar307 = ZEXT3264(CONCAT824(uStack_5e8,
                                      CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
        auVar223 = vcmpps_avx(auVar28,auVar28,0xf);
        auVar288 = ZEXT3264(auVar223);
        auVar306 = ZEXT3264(auVar144);
        if ((((((((auVar261 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar261 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar261 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar261 >> 0x7f,0) != '\0') ||
              (auVar261 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar170 >> 0x3f,0) != '\0') ||
            (auVar261 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar170[0xf] < '\0') {
          auVar60._4_4_ = fVar276 * auVar175._4_4_;
          auVar60._0_4_ = fVar232 * auVar175._0_4_;
          auVar60._8_4_ = fVar277 * auVar175._8_4_;
          auVar60._12_4_ = fVar297 * auVar175._12_4_;
          auVar60._16_4_ = fVar312 * auVar175._16_4_;
          auVar60._20_4_ = fVar333 * auVar175._20_4_;
          auVar60._24_4_ = fVar187 * auVar175._24_4_;
          auVar60._28_4_ = SUB84(uStack_5e8,4);
          auVar61._4_4_ = auVar245._4_4_ * fVar276;
          auVar61._0_4_ = auVar245._0_4_ * fVar232;
          auVar61._8_4_ = auVar245._8_4_ * fVar277;
          auVar61._12_4_ = auVar245._12_4_ * fVar297;
          auVar61._16_4_ = auVar245._16_4_ * fVar312;
          auVar61._20_4_ = auVar245._20_4_ * fVar333;
          auVar61._24_4_ = auVar245._24_4_ * fVar187;
          auVar61._28_4_ = auVar30._28_4_ + auVar25._28_4_;
          auVar246._8_4_ = 0x3f800000;
          auVar246._0_8_ = 0x3f8000003f800000;
          auVar246._12_4_ = 0x3f800000;
          auVar246._16_4_ = 0x3f800000;
          auVar246._20_4_ = 0x3f800000;
          auVar246._24_4_ = 0x3f800000;
          auVar246._28_4_ = 0x3f800000;
          auVar144 = vsubps_avx(auVar246,auVar60);
          auVar144 = vblendvps_avx(auVar144,auVar60,auVar285);
          auVar306 = ZEXT3264(auVar144);
          auVar144 = vsubps_avx(auVar246,auVar61);
          _local_4c0 = vblendvps_avx(auVar144,auVar61,auVar285);
          auVar307 = ZEXT3264(auVar261);
          local_4a0 = auVar59;
        }
      }
      auVar355 = ZEXT3264(auVar255);
      auVar347 = ZEXT3264(_local_740);
      auVar144 = auVar307._0_32_;
      auVar273 = ZEXT3264(_local_7c0);
      if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar144 >> 0x7f,0) != '\0') ||
            (auVar307 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
           SUB321(auVar144 >> 0xbf,0) != '\0') ||
          (auVar307 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
          auVar307[0x1f] < '\0') {
        auVar223 = vsubps_avx(auVar255,auVar139);
        fVar167 = auVar139._0_4_ + auVar306._0_4_ * auVar223._0_4_;
        fVar183 = auVar139._4_4_ + auVar306._4_4_ * auVar223._4_4_;
        fVar185 = auVar139._8_4_ + auVar306._8_4_ * auVar223._8_4_;
        fVar232 = auVar139._12_4_ + auVar306._12_4_ * auVar223._12_4_;
        fVar265 = auVar139._16_4_ + auVar306._16_4_ * auVar223._16_4_;
        fVar274 = auVar139._20_4_ + auVar306._20_4_ * auVar223._20_4_;
        fVar276 = auVar139._24_4_ + auVar306._24_4_ * auVar223._24_4_;
        fVar277 = auVar223._28_4_ + 0.0;
        fVar331 = *(float *)((long)local_748->ray_space + k * 4 + -0x20);
        auVar202 = ZEXT3264(CONCAT428(fVar331,CONCAT424(fVar331,CONCAT420(fVar331,CONCAT416(fVar331,
                                                  CONCAT412(fVar331,CONCAT48(fVar331,CONCAT44(
                                                  fVar331,fVar331))))))));
        auVar62._4_4_ = (fVar183 + fVar183) * fVar331;
        auVar62._0_4_ = (fVar167 + fVar167) * fVar331;
        auVar62._8_4_ = (fVar185 + fVar185) * fVar331;
        auVar62._12_4_ = (fVar232 + fVar232) * fVar331;
        auVar62._16_4_ = (fVar265 + fVar265) * fVar331;
        auVar62._20_4_ = (fVar274 + fVar274) * fVar331;
        auVar62._24_4_ = (fVar276 + fVar276) * fVar331;
        auVar62._28_4_ = fVar277 + fVar277;
        auVar223 = vcmpps_avx(local_4a0,auVar62,6);
        auVar26 = auVar144 & auVar223;
        if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar26 >> 0x7f,0) != '\0') ||
              (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar26 >> 0xbf,0) != '\0') ||
            (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar26[0x1f] < '\0') {
          local_3a0 = (float)local_4c0._0_4_ + (float)local_4c0._0_4_ + -1.0;
          fStack_39c = (float)local_4c0._4_4_ + (float)local_4c0._4_4_ + -1.0;
          fStack_398 = (float)uStack_4b8 + (float)uStack_4b8 + -1.0;
          fStack_394 = uStack_4b8._4_4_ + uStack_4b8._4_4_ + -1.0;
          fStack_390 = (float)uStack_4b0 + (float)uStack_4b0 + -1.0;
          fStack_38c = uStack_4b0._4_4_ + uStack_4b0._4_4_ + -1.0;
          fStack_388 = (float)uStack_4a8 + (float)uStack_4a8 + -1.0;
          fStack_384 = uStack_4a8._4_4_ + uStack_4a8._4_4_ + -1.0;
          auVar303 = auVar306._0_32_;
          local_4c0._4_4_ = fStack_39c;
          local_4c0._0_4_ = local_3a0;
          uStack_4b8._0_4_ = fStack_398;
          uStack_4b8._4_4_ = fStack_394;
          uStack_4b0._0_4_ = fStack_390;
          uStack_4b0._4_4_ = fStack_38c;
          auVar117 = _local_4c0;
          uStack_4a8._0_4_ = fStack_388;
          uStack_4a8._4_4_ = fStack_384;
          auVar26 = _local_4c0;
          local_380 = local_4a0;
          local_360 = 0;
          uStack_348 = uStack_8e8;
          uStack_338 = uStack_858;
          uStack_328 = uStack_868;
          auVar202 = ZEXT1664(auVar337);
          _local_4c0 = auVar26;
          if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
            local_640 = vandps_avx(auVar223,auVar144);
            auVar193._0_4_ = 1.0 / (float)local_500._0_4_;
            auVar193._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar170 = vshufps_avx(auVar193,auVar193,0);
            local_2e0[0] = auVar170._0_4_ * (auVar306._0_4_ + 0.0);
            local_2e0[1] = auVar170._4_4_ * (auVar306._4_4_ + 1.0);
            local_2e0[2] = auVar170._8_4_ * (auVar306._8_4_ + 2.0);
            local_2e0[3] = auVar170._12_4_ * (auVar306._12_4_ + 3.0);
            fStack_2d0 = auVar170._0_4_ * (auVar306._16_4_ + 4.0);
            fStack_2cc = auVar170._4_4_ * (auVar306._20_4_ + 5.0);
            fStack_2c8 = auVar170._8_4_ * (auVar306._24_4_ + 6.0);
            fStack_2c4 = auVar306._28_4_ + 7.0;
            uStack_4b0 = auVar117._16_8_;
            uStack_4a8 = auVar26._24_8_;
            local_2c0 = local_4c0;
            uStack_2b8 = uStack_4b8;
            uStack_2b0 = uStack_4b0;
            uStack_2a8 = uStack_4a8;
            local_2a0 = local_4a0;
            auVar144._8_4_ = 0x7f800000;
            auVar144._0_8_ = 0x7f8000007f800000;
            auVar144._12_4_ = 0x7f800000;
            auVar144._16_4_ = 0x7f800000;
            auVar144._20_4_ = 0x7f800000;
            auVar144._24_4_ = 0x7f800000;
            auVar144._28_4_ = 0x7f800000;
            auVar144 = vblendvps_avx(auVar144,local_4a0,local_640);
            auVar223 = vshufps_avx(auVar144,auVar144,0xb1);
            auVar223 = vminps_avx(auVar144,auVar223);
            auVar26 = vshufpd_avx(auVar223,auVar223,5);
            auVar223 = vminps_avx(auVar223,auVar26);
            auVar26 = vperm2f128_avx(auVar223,auVar223,1);
            auVar223 = vminps_avx(auVar223,auVar26);
            auVar223 = vcmpps_avx(auVar144,auVar223,0);
            auVar26 = local_640 & auVar223;
            auVar144 = local_640;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar144 = vandps_avx(auVar223,local_640);
            }
            uVar120 = vmovmskps_avx(auVar144);
            uVar122 = 0;
            if (uVar120 != 0) {
              for (; (uVar120 >> uVar122 & 1) == 0; uVar122 = uVar122 + 1) {
              }
            }
            uVar124 = (ulong)uVar122;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar331 = local_2e0[uVar124];
              fVar183 = 1.0 - fVar331;
              fVar167 = fVar331 * 3.0;
              auVar170 = ZEXT416((uint)((fVar183 * -2.0 * fVar331 + fVar331 * fVar331) * 0.5));
              auVar170 = vshufps_avx(auVar170,auVar170,0);
              auVar195 = ZEXT416((uint)(((fVar183 + fVar183) * (fVar167 + 2.0) +
                                        fVar183 * fVar183 * -3.0) * 0.5));
              auVar195 = vshufps_avx(auVar195,auVar195,0);
              auVar196 = ZEXT416((uint)(((fVar331 + fVar331) * (fVar167 + -5.0) + fVar331 * fVar167)
                                       * 0.5));
              auVar196 = vshufps_avx(auVar196,auVar196,0);
              uVar122 = *(uint *)((long)&local_2c0 + uVar124 * 4);
              auVar202 = ZEXT464(uVar122);
              auVar213 = ZEXT416((uint)((fVar331 * (fVar183 + fVar183) - fVar183 * fVar183) * 0.5));
              auVar213 = vshufps_avx(auVar213,auVar213,0);
              auVar169._0_4_ =
                   auVar213._0_4_ * fVar266 +
                   auVar196._0_4_ * fVar351 +
                   auVar170._0_4_ * auVar337._0_4_ + auVar195._0_4_ * fVar360;
              auVar169._4_4_ =
                   auVar213._4_4_ * fVar275 +
                   auVar196._4_4_ * fVar356 +
                   auVar170._4_4_ * auVar337._4_4_ + auVar195._4_4_ * fVar365;
              auVar169._8_4_ =
                   auVar213._8_4_ * auVar269._8_4_ +
                   auVar196._8_4_ * auVar353._8_4_ +
                   auVar170._8_4_ * auVar337._8_4_ + auVar195._8_4_ * auVar362._8_4_;
              auVar169._12_4_ =
                   auVar213._12_4_ * auVar269._12_4_ +
                   auVar196._12_4_ * auVar353._12_4_ +
                   auVar170._12_4_ * auVar337._12_4_ + auVar195._12_4_ * auVar362._12_4_;
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar124 * 4);
              *(float *)(ray + k * 4 + 0x180) = auVar169._0_4_;
              uVar129 = vextractps_avx(auVar169,1);
              *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar129;
              uVar129 = vextractps_avx(auVar169,2);
              *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar129;
              *(float *)(ray + k * 4 + 0x1e0) = fVar331;
              *(uint *)(ray + k * 4 + 0x200) = uVar122;
              *(uint *)(ray + k * 4 + 0x220) = uVar12;
              *(uint *)(ray + k * 4 + 0x240) = uVar121;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            }
            else {
              auVar170 = vpermilps_avx(ZEXT416(uVar121),0);
              register0x00001210 = auVar170;
              _local_7e0 = auVar170;
              auVar170 = vpermilps_avx(ZEXT416(uVar12),0);
              register0x00001210 = auVar170;
              local_6e0 = auVar170;
              local_660 = ZEXT1632(*local_758);
              uStack_670 = *(undefined8 *)(local_760 + 0x10);
              uStack_668 = *(undefined8 *)(local_760 + 0x18);
              uStack_690 = *(undefined8 *)(local_760 + 0x10);
              _local_6a0 = *local_758;
              uStack_688 = *(undefined8 *)(local_760 + 0x18);
              auVar307 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
              local_3c0 = auVar303;
              local_35c = uVar13;
              local_350 = auVar269._0_8_;
              local_340 = auVar353._0_8_;
              local_330 = auVar362._0_8_;
              local_320 = auVar337;
              while( true ) {
                local_200 = local_2e0[uVar124];
                local_1e0 = *(undefined4 *)((long)&local_2c0 + uVar124 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar124 * 4);
                fVar327 = 1.0 - local_200;
                fVar322 = local_200 * 3.0;
                auVar170 = ZEXT416((uint)((fVar327 * -2.0 * local_200 + local_200 * local_200) * 0.5
                                         ));
                auVar170 = vshufps_avx(auVar170,auVar170,0);
                auVar195 = ZEXT416((uint)(((fVar327 + fVar327) * (fVar322 + 2.0) +
                                          fVar327 * fVar327 * -3.0) * 0.5));
                auVar195 = vshufps_avx(auVar195,auVar195,0);
                auVar196 = ZEXT416((uint)(((local_200 + local_200) * (fVar322 + -5.0) +
                                          local_200 * fVar322) * 0.5));
                auVar196 = vshufps_avx(auVar196,auVar196,0);
                local_850.context = context->user;
                auVar213 = ZEXT416((uint)((local_200 * (fVar327 + fVar327) - fVar327 * fVar327) *
                                         0.5));
                auVar213 = vshufps_avx(auVar213,auVar213,0);
                auVar198._0_4_ =
                     auVar213._0_4_ * fVar266 +
                     auVar196._0_4_ * fVar351 +
                     auVar170._0_4_ * auVar337._0_4_ + auVar195._0_4_ * fVar360;
                auVar198._4_4_ =
                     auVar213._4_4_ * fVar275 +
                     auVar196._4_4_ * fVar356 +
                     auVar170._4_4_ * auVar337._4_4_ + auVar195._4_4_ * fVar365;
                auVar198._8_4_ =
                     auVar213._8_4_ * auVar269._8_4_ +
                     auVar196._8_4_ * auVar353._8_4_ +
                     auVar170._8_4_ * auVar337._8_4_ + auVar195._8_4_ * auVar362._8_4_;
                auVar198._12_4_ =
                     auVar213._12_4_ * auVar269._12_4_ +
                     auVar196._12_4_ * auVar353._12_4_ +
                     auVar170._12_4_ * auVar337._12_4_ + auVar195._12_4_ * auVar362._12_4_;
                auStack_250 = vshufps_avx(auVar198,auVar198,0);
                local_260[0] = (RTCHitN)auStack_250[0];
                local_260[1] = (RTCHitN)auStack_250[1];
                local_260[2] = (RTCHitN)auStack_250[2];
                local_260[3] = (RTCHitN)auStack_250[3];
                local_260[4] = (RTCHitN)auStack_250[4];
                local_260[5] = (RTCHitN)auStack_250[5];
                local_260[6] = (RTCHitN)auStack_250[6];
                local_260[7] = (RTCHitN)auStack_250[7];
                local_260[8] = (RTCHitN)auStack_250[8];
                local_260[9] = (RTCHitN)auStack_250[9];
                local_260[10] = (RTCHitN)auStack_250[10];
                local_260[0xb] = (RTCHitN)auStack_250[0xb];
                local_260[0xc] = (RTCHitN)auStack_250[0xc];
                local_260[0xd] = (RTCHitN)auStack_250[0xd];
                local_260[0xe] = (RTCHitN)auStack_250[0xe];
                local_260[0xf] = (RTCHitN)auStack_250[0xf];
                auStack_230 = vshufps_avx(auVar198,auVar198,0x55);
                local_240 = auStack_230;
                auStack_210 = vshufps_avx(auVar198,auVar198,0xaa);
                local_220 = auStack_210;
                fStack_1fc = local_200;
                fStack_1f8 = local_200;
                fStack_1f4 = local_200;
                fStack_1f0 = local_200;
                fStack_1ec = local_200;
                fStack_1e8 = local_200;
                fStack_1e4 = local_200;
                uStack_1dc = local_1e0;
                uStack_1d8 = local_1e0;
                uStack_1d4 = local_1e0;
                uStack_1d0 = local_1e0;
                uStack_1cc = local_1e0;
                uStack_1c8 = local_1e0;
                uStack_1c4 = local_1e0;
                local_1c0 = local_6e0._0_8_;
                uStack_1b8 = local_6e0._8_8_;
                uStack_1b0 = uStack_6d0;
                uStack_1a8 = uStack_6c8;
                local_1a0 = local_7e0;
                uStack_198 = uStack_7d8;
                uStack_190 = uStack_7d0;
                uStack_188 = uStack_7c8;
                local_750[1] = auVar288._0_32_;
                *local_750 = auVar288._0_32_;
                local_180 = (local_850.context)->instID[0];
                uStack_17c = local_180;
                uStack_178 = local_180;
                uStack_174 = local_180;
                uStack_170 = local_180;
                uStack_16c = local_180;
                uStack_168 = local_180;
                uStack_164 = local_180;
                local_160 = (local_850.context)->instPrimID[0];
                uStack_15c = local_160;
                uStack_158 = local_160;
                uStack_154 = local_160;
                uStack_150 = local_160;
                uStack_14c = local_160;
                uStack_148 = local_160;
                uStack_144 = local_160;
                local_7a0 = local_6a0;
                uStack_798 = uStack_698;
                uStack_790 = uStack_690;
                uStack_788 = uStack_688;
                local_850.valid = (int *)&local_7a0;
                local_850.geometryUserPtr = pGVar14->userPtr;
                local_850.hit = local_260;
                local_850.N = 8;
                auVar173 = local_660._0_16_;
                auVar138 = _local_680;
                local_850.ray = (RTCRayN *)ray;
                if (pGVar14->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar144 = ZEXT1632(auVar288._0_16_);
                  auVar355 = ZEXT1664(auVar355._0_16_);
                  (*pGVar14->intersectionFilterN)(&local_850);
                  auVar307 = ZEXT1664(auVar307._0_16_);
                  auVar347 = ZEXT3264(_local_740);
                  auVar306 = ZEXT3264(auVar303);
                  auVar144 = vcmpps_avx(auVar144,auVar144,0xf);
                  auVar288 = ZEXT3264(auVar144);
                  auVar173._8_8_ = uStack_798;
                  auVar173._0_8_ = local_7a0;
                  auVar138._8_8_ = uStack_788;
                  auVar138._0_8_ = uStack_790;
                }
                auVar170 = vpcmpeqd_avx(auVar173,ZEXT816(0) << 0x40);
                auVar195 = vpcmpeqd_avx(auVar138,ZEXT816(0) << 0x40);
                auVar201._16_16_ = auVar195;
                auVar201._0_16_ = auVar170;
                auVar144 = auVar288._0_32_ & ~auVar201;
                fVar207 = (float)local_800._0_4_;
                fVar224 = (float)local_800._4_4_;
                fVar226 = fStack_7f8;
                fVar229 = fStack_7f4;
                fVar322 = fStack_7f0;
                fVar327 = fStack_7ec;
                fVar329 = fStack_7e8;
                if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar144 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar144 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar144 >> 0x7f,0) == '\0') &&
                      (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar144 >> 0xbf,0) == '\0') &&
                    (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar144[0x1f]) {
                  auVar150._0_4_ = auVar288._0_4_ ^ auVar170._0_4_;
                  auVar150._4_4_ = auVar288._4_4_ ^ auVar170._4_4_;
                  auVar150._8_4_ = auVar288._8_4_ ^ auVar170._8_4_;
                  auVar150._12_4_ = auVar288._12_4_ ^ auVar170._12_4_;
                  auVar150._16_4_ = auVar288._16_4_ ^ auVar195._0_4_;
                  auVar150._20_4_ = auVar288._20_4_ ^ auVar195._4_4_;
                  auVar150._24_4_ = auVar288._24_4_ ^ auVar195._8_4_;
                  auVar150._28_4_ = auVar288._28_4_ ^ auVar195._12_4_;
                  auVar273 = ZEXT3264(_local_7c0);
                }
                else {
                  p_Var17 = context->args->filter;
                  auVar273 = ZEXT3264(_local_7c0);
                  if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar14->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    auVar144 = ZEXT1632(auVar288._0_16_);
                    auVar355 = ZEXT1664(auVar355._0_16_);
                    (*p_Var17)(&local_850);
                    auVar307 = ZEXT1664(auVar307._0_16_);
                    auVar273 = ZEXT3264(_local_7c0);
                    auVar347 = ZEXT3264(_local_740);
                    auVar306 = ZEXT3264(auVar303);
                    auVar144 = vcmpps_avx(auVar144,auVar144,0xf);
                    auVar288 = ZEXT3264(auVar144);
                    auVar173._8_8_ = uStack_798;
                    auVar173._0_8_ = local_7a0;
                    auVar138._8_8_ = uStack_788;
                    auVar138._0_8_ = uStack_790;
                    fVar207 = (float)local_800._0_4_;
                    fVar224 = (float)local_800._4_4_;
                    fVar226 = fStack_7f8;
                    fVar229 = fStack_7f4;
                    fVar322 = fStack_7f0;
                    fVar327 = fStack_7ec;
                    fVar329 = fStack_7e8;
                  }
                  auVar170 = vpcmpeqd_avx(auVar173,ZEXT816(0) << 0x40);
                  auVar195 = vpcmpeqd_avx(auVar138,ZEXT816(0) << 0x40);
                  auVar180._16_16_ = auVar195;
                  auVar180._0_16_ = auVar170;
                  auVar150._0_4_ = auVar288._0_4_ ^ auVar170._0_4_;
                  auVar150._4_4_ = auVar288._4_4_ ^ auVar170._4_4_;
                  auVar150._8_4_ = auVar288._8_4_ ^ auVar170._8_4_;
                  auVar150._12_4_ = auVar288._12_4_ ^ auVar170._12_4_;
                  auVar150._16_4_ = auVar288._16_4_ ^ auVar195._0_4_;
                  auVar150._20_4_ = auVar288._20_4_ ^ auVar195._4_4_;
                  auVar150._24_4_ = auVar288._24_4_ ^ auVar195._8_4_;
                  auVar150._28_4_ = auVar288._28_4_ ^ auVar195._12_4_;
                  auVar144 = auVar288._0_32_ & ~auVar180;
                  if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar144 >> 0x7f,0) != '\0') ||
                        (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar144 >> 0xbf,0) != '\0') ||
                      (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar144[0x1f] < '\0') {
                    auVar144 = vmaskmovps_avx(auVar150,*(undefined1 (*) [32])local_850.hit);
                    *(undefined1 (*) [32])(local_850.ray + 0x180) = auVar144;
                    auVar144 = vmaskmovps_avx(auVar150,*(undefined1 (*) [32])(local_850.hit + 0x20))
                    ;
                    *(undefined1 (*) [32])(local_850.ray + 0x1a0) = auVar144;
                    auVar144 = vmaskmovps_avx(auVar150,*(undefined1 (*) [32])(local_850.hit + 0x40))
                    ;
                    *(undefined1 (*) [32])(local_850.ray + 0x1c0) = auVar144;
                    auVar144 = vmaskmovps_avx(auVar150,*(undefined1 (*) [32])(local_850.hit + 0x60))
                    ;
                    *(undefined1 (*) [32])(local_850.ray + 0x1e0) = auVar144;
                    auVar144 = vmaskmovps_avx(auVar150,*(undefined1 (*) [32])(local_850.hit + 0x80))
                    ;
                    *(undefined1 (*) [32])(local_850.ray + 0x200) = auVar144;
                    auVar144 = vmaskmovps_avx(auVar150,*(undefined1 (*) [32])(local_850.hit + 0xa0))
                    ;
                    *(undefined1 (*) [32])(local_850.ray + 0x220) = auVar144;
                    auVar144 = vmaskmovps_avx(auVar150,*(undefined1 (*) [32])(local_850.hit + 0xc0))
                    ;
                    *(undefined1 (*) [32])(local_850.ray + 0x240) = auVar144;
                    auVar144 = vmaskmovps_avx(auVar150,*(undefined1 (*) [32])(local_850.hit + 0xe0))
                    ;
                    *(undefined1 (*) [32])(local_850.ray + 0x260) = auVar144;
                    auVar144 = vmaskmovps_avx(auVar150,*(undefined1 (*) [32])(local_850.hit + 0x100)
                                             );
                    *(undefined1 (*) [32])(local_850.ray + 0x280) = auVar144;
                  }
                }
                auVar144 = local_4a0;
                if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar150 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar150 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar150 >> 0x7f,0) == '\0') &&
                      (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar150 >> 0xbf,0) == '\0') &&
                    (auVar150 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar150[0x1f]) {
                  *(int *)(ray + k * 4 + 0x100) = auVar307._0_4_;
                }
                else {
                  auVar307 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                }
                *(undefined4 *)(local_640 + uVar124 * 4) = 0;
                auVar170 = vshufps_avx(auVar307._0_16_,auVar307._0_16_,0);
                auVar151._16_16_ = auVar170;
                auVar151._0_16_ = auVar170;
                auVar26 = vcmpps_avx(auVar144,auVar151,2);
                auVar202 = ZEXT3264(local_640);
                auVar223 = vandps_avx(auVar26,local_640);
                local_640 = local_640 & auVar26;
                if ((((((((local_640 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_640 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_640 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_640 >> 0x7f,0) == '\0') &&
                      (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_640 >> 0xbf,0) == '\0') &&
                    (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_640[0x1f]) break;
                auVar181._8_4_ = 0x7f800000;
                auVar181._0_8_ = 0x7f8000007f800000;
                auVar181._12_4_ = 0x7f800000;
                auVar181._16_4_ = 0x7f800000;
                auVar181._20_4_ = 0x7f800000;
                auVar181._24_4_ = 0x7f800000;
                auVar181._28_4_ = 0x7f800000;
                auVar144 = vblendvps_avx(auVar181,auVar144,auVar223);
                auVar26 = vshufps_avx(auVar144,auVar144,0xb1);
                auVar26 = vminps_avx(auVar144,auVar26);
                auVar25 = vshufpd_avx(auVar26,auVar26,5);
                auVar26 = vminps_avx(auVar26,auVar25);
                auVar25 = vperm2f128_avx(auVar26,auVar26,1);
                auVar26 = vminps_avx(auVar26,auVar25);
                auVar26 = vcmpps_avx(auVar144,auVar26,0);
                auVar25 = auVar223 & auVar26;
                auVar144 = auVar223;
                if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar25 >> 0x7f,0) != '\0') ||
                      (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar25 >> 0xbf,0) != '\0') ||
                    (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar25[0x1f] < '\0') {
                  auVar144 = vandps_avx(auVar26,auVar223);
                }
                uVar122 = vmovmskps_avx(auVar144);
                uVar121 = 0;
                if (uVar122 != 0) {
                  for (; (uVar122 >> uVar121 & 1) == 0; uVar121 = uVar121 + 1) {
                  }
                }
                uVar124 = (ulong)uVar121;
                local_640 = auVar223;
              }
            }
          }
        }
        fVar323 = (float)local_720._0_4_;
        fVar328 = (float)local_720._4_4_;
        fVar330 = fStack_718;
        fVar332 = fStack_714;
        fVar331 = fStack_710;
        fVar167 = fStack_70c;
        fVar183 = fStack_708;
        fVar185 = fStack_704;
      }
    }
    if (8 < (int)uVar13) {
      auVar170 = vpshufd_avx(ZEXT416(uVar13),0);
      local_440._0_16_ = auVar170;
      auVar170 = vshufps_avx(_local_820,_local_820,0);
      register0x00001210 = auVar170;
      _local_460 = auVar170;
      auVar170 = vpermilps_avx(ZEXT416(uVar125),0);
      register0x00001210 = auVar170;
      _local_480 = auVar170;
      auVar136._0_4_ = 1.0 / (float)local_500._0_4_;
      auVar136._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar170 = vshufps_avx(auVar136,auVar136,0);
      register0x00001210 = auVar170;
      _local_140 = auVar170;
      auVar170 = vpermilps_avx(local_540._0_16_,0);
      local_540._16_16_ = auVar170;
      local_540._0_16_ = auVar170;
      auVar170 = vpermilps_avx(local_520._0_16_,0);
      local_120._16_16_ = auVar170;
      local_120._0_16_ = auVar170;
      lVar126 = 8;
      auVar144 = auVar306._0_32_;
      _local_740 = auVar347._0_32_;
      local_6e0._0_8_ = (long)(int)uVar13;
      local_35c = uVar13;
      while( true ) {
        if ((long)local_6e0._0_8_ <= lVar126) break;
        pauVar7 = (undefined1 (*) [28])(catmullrom_basis0 + lVar126 * 4 + lVar128);
        fVar232 = *(float *)*pauVar7;
        fVar265 = *(float *)(*pauVar7 + 4);
        fVar274 = *(float *)(*pauVar7 + 8);
        fVar276 = *(float *)(*pauVar7 + 0xc);
        fVar277 = *(float *)(*pauVar7 + 0x10);
        fVar297 = *(float *)(*pauVar7 + 0x14);
        fVar308 = *(float *)(*pauVar7 + 0x18);
        auVar116 = *pauVar7;
        pauVar7 = (undefined1 (*) [28])(lVar128 + 0x22047f0 + lVar126 * 4);
        fVar310 = *(float *)*pauVar7;
        fVar312 = *(float *)(*pauVar7 + 4);
        fVar333 = *(float *)(*pauVar7 + 8);
        fVar187 = *(float *)(*pauVar7 + 0xc);
        fVar228 = *(float *)(*pauVar7 + 0x10);
        fVar278 = *(float *)(*pauVar7 + 0x14);
        fVar289 = *(float *)(*pauVar7 + 0x18);
        auVar115 = *pauVar7;
        pauVar8 = (undefined1 (*) [28])(lVar128 + 0x2204c74 + lVar126 * 4);
        fVar290 = *(float *)*pauVar8;
        fVar231 = *(float *)(*pauVar8 + 4);
        fVar279 = *(float *)(*pauVar8 + 8);
        fVar291 = *(float *)(*pauVar8 + 0xc);
        fVar292 = *(float *)(*pauVar8 + 0x10);
        fVar159 = *(float *)(*pauVar8 + 0x14);
        fVar162 = *(float *)(*pauVar8 + 0x18);
        auVar114 = *pauVar8;
        pfVar1 = (float *)(lVar128 + 0x22050f8 + lVar126 * 4);
        fVar293 = *pfVar1;
        fVar294 = pfVar1[1];
        fVar235 = pfVar1[2];
        fVar281 = pfVar1[3];
        fVar295 = pfVar1[4];
        fVar296 = pfVar1[5];
        fVar237 = pfVar1[6];
        fVar130 = pfVar1[7];
        fVar206 = fVar130 + auVar202._28_4_;
        fVar252 = fVar130 + fVar206;
        auVar341._0_4_ =
             auVar347._0_4_ * fVar310 + (float)local_560._0_4_ * fVar293 + fVar166 * fVar290 +
             fVar232 * (float)local_420._0_4_;
        auVar341._4_4_ =
             auVar347._4_4_ * fVar312 + (float)local_560._4_4_ * fVar294 + fVar182 * fVar231 +
             fVar265 * (float)local_420._4_4_;
        auVar341._8_4_ =
             auVar347._8_4_ * fVar333 + fStack_558 * fVar235 + fVar184 * fVar279 +
             fVar274 * fStack_418;
        auVar341._12_4_ =
             auVar347._12_4_ * fVar187 + fStack_554 * fVar281 + fVar186 * fVar291 +
             fVar276 * fStack_414;
        auVar341._16_4_ =
             auVar347._16_4_ * fVar228 + fStack_550 * fVar295 + fVar166 * fVar292 +
             fVar277 * fStack_410;
        auVar341._20_4_ =
             auVar347._20_4_ * fVar278 + fStack_54c * fVar296 + fVar182 * fVar159 +
             fVar297 * fStack_40c;
        auVar341._24_4_ =
             auVar347._24_4_ * fVar289 + fStack_548 * fVar237 + fVar184 * fVar162 +
             fVar308 * fStack_408;
        auVar341._28_4_ = fVar130 + auVar355._28_4_ + fVar130 + fVar206;
        auVar221._0_4_ =
             fVar232 * fVar207 + auVar273._0_4_ * fVar310 + fVar188 * fVar290 + fVar323 * fVar293;
        auVar221._4_4_ =
             fVar265 * fVar224 + auVar273._4_4_ * fVar312 + fVar203 * fVar231 + fVar328 * fVar294;
        auVar221._8_4_ =
             fVar274 * fVar226 + auVar273._8_4_ * fVar333 + fVar204 * fVar279 + fVar330 * fVar235;
        auVar221._12_4_ =
             fVar276 * fVar229 + auVar273._12_4_ * fVar187 + fVar205 * fVar291 + fVar332 * fVar281;
        auVar221._16_4_ =
             fVar277 * fVar322 + auVar273._16_4_ * fVar228 + fVar188 * fVar292 + fVar331 * fVar295;
        auVar221._20_4_ =
             fVar297 * fVar327 + auVar273._20_4_ * fVar278 + fVar203 * fVar159 + fVar167 * fVar296;
        auVar221._24_4_ =
             fVar308 * fVar329 + auVar273._24_4_ * fVar289 + fVar204 * fVar162 + fVar183 * fVar237;
        auVar221._28_4_ = *(float *)pauVar7[1] + fVar130 + fVar130 + fStack_5c4;
        fVar130 = fVar232 * (float)local_c0._0_4_ +
                  fVar310 * (float)local_280._0_4_ +
                  (float)local_80._0_4_ * fVar290 + (float)local_a0._0_4_ * fVar293;
        fVar206 = fVar265 * (float)local_c0._4_4_ +
                  fVar312 * (float)local_280._4_4_ +
                  (float)local_80._4_4_ * fVar231 + (float)local_a0._4_4_ * fVar294;
        fVar153 = fVar274 * fStack_b8 +
                  fVar333 * fStack_278 + fStack_78 * fVar279 + fStack_98 * fVar235;
        fVar155 = fVar276 * fStack_b4 +
                  fVar187 * fStack_274 + fStack_74 * fVar291 + fStack_94 * fVar281;
        fVar157 = fVar277 * fStack_b0 +
                  fVar228 * fStack_270 + fStack_70 * fVar292 + fStack_90 * fVar295;
        fVar159 = fVar297 * fStack_ac +
                  fVar278 * fStack_26c + fStack_6c * fVar159 + fStack_8c * fVar296;
        fVar162 = fVar308 * fStack_a8 +
                  fVar289 * fStack_268 + fStack_68 * fVar162 + fStack_88 * fVar237;
        fVar164 = *(float *)pauVar7[1] + fVar252;
        auVar117 = *(undefined1 (*) [24])(catmullrom_basis1 + lVar126 * 4 + lVar128);
        uVar106 = *(undefined8 *)
                   ((undefined1 (*) [24])(catmullrom_basis1 + lVar126 * 4 + lVar128))[1];
        pauVar9 = (undefined1 (*) [32])(lVar128 + 0x2206c10 + lVar126 * 4);
        auVar118 = *(undefined1 (*) [28])*pauVar9;
        fVar291 = *(float *)(*pauVar9 + 0x1c);
        _local_820 = *pauVar9;
        pfVar1 = (float *)(lVar128 + 0x2207094 + lVar126 * 4);
        local_580 = *pfVar1;
        fStack_57c = pfVar1[1];
        fStack_578 = pfVar1[2];
        fStack_574 = pfVar1[3];
        fStack_570 = pfVar1[4];
        fStack_56c = pfVar1[5];
        fStack_568 = pfVar1[6];
        fStack_564 = pfVar1[7];
        pauVar10 = (undefined1 (*) [16])(lVar128 + 0x2207518 + lVar126 * 4);
        fVar276 = *(float *)*pauVar10;
        fVar277 = *(float *)(*pauVar10 + 4);
        fVar308 = *(float *)(*pauVar10 + 8);
        auVar119 = *(undefined1 (*) [12])*pauVar10;
        fVar292 = *(float *)(*pauVar10 + 0xc);
        fStack_4f0 = *(float *)pauVar10[1];
        fStack_4ec = *(float *)(pauVar10[1] + 4);
        fStack_4e8 = *(float *)(pauVar10[1] + 8);
        fStack_4e4 = *(float *)(pauVar10[1] + 0xc);
        fVar161 = auVar273._28_4_;
        local_960 = auVar117._0_4_;
        fStack_95c = auVar117._4_4_;
        fStack_958 = auVar117._8_4_;
        fStack_954 = auVar117._12_4_;
        fStack_950 = auVar117._16_4_;
        fStack_94c = auVar117._20_4_;
        fStack_948 = (float)uVar106;
        fStack_944 = (float)((ulong)uVar106 >> 0x20);
        auVar355 = ZEXT3264(_local_820);
        fVar232 = auVar118._0_4_;
        fVar265 = auVar118._4_4_;
        fVar274 = auVar118._8_4_;
        fVar297 = auVar118._12_4_;
        fVar312 = auVar118._16_4_;
        fVar228 = auVar118._20_4_;
        fVar290 = auVar118._24_4_;
        fVar310 = fVar161 + fVar161 + fVar252;
        auVar262._0_4_ =
             (float)local_420._0_4_ * local_960 +
             auVar347._0_4_ * fVar232 + fVar166 * local_580 + (float)local_560._0_4_ * fVar276;
        auVar262._4_4_ =
             (float)local_420._4_4_ * fStack_95c +
             auVar347._4_4_ * fVar265 + fVar182 * fStack_57c + (float)local_560._4_4_ * fVar277;
        auVar262._8_4_ =
             fStack_418 * fStack_958 +
             auVar347._8_4_ * fVar274 + fVar184 * fStack_578 + fStack_558 * fVar308;
        auVar262._12_4_ =
             fStack_414 * fStack_954 +
             auVar347._12_4_ * fVar297 + fVar186 * fStack_574 + fStack_554 * fVar292;
        auVar262._16_4_ =
             fStack_410 * fStack_950 +
             auVar347._16_4_ * fVar312 + fVar166 * fStack_570 + fStack_550 * fStack_4f0;
        auVar262._20_4_ =
             fStack_40c * fStack_94c +
             auVar347._20_4_ * fVar228 + fVar182 * fStack_56c + fStack_54c * fStack_4ec;
        auVar262._24_4_ =
             fStack_408 * fStack_948 +
             auVar347._24_4_ * fVar290 + fVar184 * fStack_568 + fStack_548 * fStack_4e8;
        auVar262._28_4_ = fVar161 + fVar185 + fVar310;
        local_660._0_4_ =
             fVar207 * local_960 +
             auVar273._0_4_ * fVar232 + fVar188 * local_580 + fVar276 * fVar323;
        local_660._4_4_ =
             fVar224 * fStack_95c +
             auVar273._4_4_ * fVar265 + fVar203 * fStack_57c + fVar277 * fVar328;
        local_660._8_4_ =
             fVar226 * fStack_958 +
             auVar273._8_4_ * fVar274 + fVar204 * fStack_578 + fVar308 * fVar330;
        local_660._12_4_ =
             fVar229 * fStack_954 +
             auVar273._12_4_ * fVar297 + fVar205 * fStack_574 + fVar292 * fVar332;
        local_660._16_4_ =
             fVar322 * fStack_950 +
             auVar273._16_4_ * fVar312 + fVar188 * fStack_570 + fStack_4f0 * fVar331;
        local_660._20_4_ =
             fVar327 * fStack_94c +
             auVar273._20_4_ * fVar228 + fVar203 * fStack_56c + fStack_4ec * fVar167;
        local_660._24_4_ =
             fVar329 * fStack_948 +
             auVar273._24_4_ * fVar290 + fVar204 * fStack_568 + fStack_4e8 * fVar183;
        local_660._28_4_ = fVar310 + fVar161 + fVar161 + fVar291;
        auVar272._0_4_ =
             fVar232 * (float)local_280._0_4_ +
             (float)local_80._0_4_ * local_580 + (float)local_a0._0_4_ * fVar276 +
             (float)local_c0._0_4_ * local_960;
        auVar272._4_4_ =
             fVar265 * (float)local_280._4_4_ +
             (float)local_80._4_4_ * fStack_57c + (float)local_a0._4_4_ * fVar277 +
             (float)local_c0._4_4_ * fStack_95c;
        auVar272._8_4_ =
             fVar274 * fStack_278 + fStack_78 * fStack_578 + fStack_98 * fVar308 +
             fStack_b8 * fStack_958;
        auVar272._12_4_ =
             fVar297 * fStack_274 + fStack_74 * fStack_574 + fStack_94 * fVar292 +
             fStack_b4 * fStack_954;
        auVar272._16_4_ =
             fVar312 * fStack_270 + fStack_70 * fStack_570 + fStack_90 * fStack_4f0 +
             fStack_b0 * fStack_950;
        auVar272._20_4_ =
             fVar228 * fStack_26c + fStack_6c * fStack_56c + fStack_8c * fStack_4ec +
             fStack_ac * fStack_94c;
        auVar272._24_4_ =
             fVar290 * fStack_268 + fStack_68 * fStack_568 + fStack_88 * fStack_4e8 +
             fStack_a8 * fStack_948;
        auVar272._28_4_ = fVar161 + fVar161 + fVar185 + fVar310;
        auVar26 = vsubps_avx(auVar262,auVar341);
        auVar202 = ZEXT3264(auVar26);
        auVar303 = vsubps_avx(local_660,auVar221);
        fVar331 = auVar26._0_4_;
        fVar183 = auVar26._4_4_;
        auVar63._4_4_ = auVar221._4_4_ * fVar183;
        auVar63._0_4_ = auVar221._0_4_ * fVar331;
        fVar276 = auVar26._8_4_;
        auVar63._8_4_ = auVar221._8_4_ * fVar276;
        fVar308 = auVar26._12_4_;
        auVar63._12_4_ = auVar221._12_4_ * fVar308;
        fVar333 = auVar26._16_4_;
        auVar63._16_4_ = auVar221._16_4_ * fVar333;
        fVar278 = auVar26._20_4_;
        auVar63._20_4_ = auVar221._20_4_ * fVar278;
        fVar231 = auVar26._24_4_;
        auVar63._24_4_ = auVar221._24_4_ * fVar231;
        auVar63._28_4_ = fVar310;
        fVar167 = auVar303._0_4_;
        fVar185 = auVar303._4_4_;
        auVar64._4_4_ = auVar341._4_4_ * fVar185;
        auVar64._0_4_ = auVar341._0_4_ * fVar167;
        fVar277 = auVar303._8_4_;
        auVar64._8_4_ = auVar341._8_4_ * fVar277;
        fVar310 = auVar303._12_4_;
        auVar64._12_4_ = auVar341._12_4_ * fVar310;
        fVar187 = auVar303._16_4_;
        auVar64._16_4_ = auVar341._16_4_ * fVar187;
        fVar289 = auVar303._20_4_;
        auVar64._20_4_ = auVar341._20_4_ * fVar289;
        fVar279 = auVar303._24_4_;
        auVar64._24_4_ = auVar341._24_4_ * fVar279;
        auVar64._28_4_ = local_660._28_4_;
        auVar25 = vsubps_avx(auVar63,auVar64);
        auVar110._4_4_ = fVar206;
        auVar110._0_4_ = fVar130;
        auVar110._8_4_ = fVar153;
        auVar110._12_4_ = fVar155;
        auVar110._16_4_ = fVar157;
        auVar110._20_4_ = fVar159;
        auVar110._24_4_ = fVar162;
        auVar110._28_4_ = fVar164;
        auVar223 = vmaxps_avx(auVar110,auVar272);
        auVar65._4_4_ = auVar223._4_4_ * auVar223._4_4_ * (fVar183 * fVar183 + fVar185 * fVar185);
        auVar65._0_4_ = auVar223._0_4_ * auVar223._0_4_ * (fVar331 * fVar331 + fVar167 * fVar167);
        auVar65._8_4_ = auVar223._8_4_ * auVar223._8_4_ * (fVar276 * fVar276 + fVar277 * fVar277);
        auVar65._12_4_ = auVar223._12_4_ * auVar223._12_4_ * (fVar308 * fVar308 + fVar310 * fVar310)
        ;
        auVar65._16_4_ = auVar223._16_4_ * auVar223._16_4_ * (fVar333 * fVar333 + fVar187 * fVar187)
        ;
        auVar65._20_4_ = auVar223._20_4_ * auVar223._20_4_ * (fVar278 * fVar278 + fVar289 * fVar289)
        ;
        auVar65._24_4_ = auVar223._24_4_ * auVar223._24_4_ * (fVar231 * fVar231 + fVar279 * fVar279)
        ;
        auVar65._28_4_ = auVar262._28_4_ + local_660._28_4_;
        auVar66._4_4_ = auVar25._4_4_ * auVar25._4_4_;
        auVar66._0_4_ = auVar25._0_4_ * auVar25._0_4_;
        auVar66._8_4_ = auVar25._8_4_ * auVar25._8_4_;
        auVar66._12_4_ = auVar25._12_4_ * auVar25._12_4_;
        auVar66._16_4_ = auVar25._16_4_ * auVar25._16_4_;
        auVar66._20_4_ = auVar25._20_4_ * auVar25._20_4_;
        auVar66._24_4_ = auVar25._24_4_ * auVar25._24_4_;
        auVar66._28_4_ = auVar25._28_4_;
        _local_6a0 = vcmpps_avx(auVar66,auVar65,2);
        local_360 = (uint)lVar126;
        auVar195 = vpshufd_avx(ZEXT416(local_360),0);
        auVar170 = vpor_avx(auVar195,_DAT_01f4ad30);
        auVar195 = vpor_avx(auVar195,_DAT_01f7afa0);
        auVar170 = vpcmpgtd_avx(local_440._0_16_,auVar170);
        auVar195 = vpcmpgtd_avx(local_440._0_16_,auVar195);
        auVar247._16_16_ = auVar195;
        auVar247._0_16_ = auVar170;
        auVar223 = auVar247 & _local_6a0;
        fVar323 = (float)local_720._0_4_;
        fVar328 = (float)local_720._4_4_;
        fVar330 = fStack_718;
        fVar332 = fStack_714;
        fVar331 = fStack_710;
        fVar167 = fStack_70c;
        fVar183 = fStack_708;
        fVar185 = fStack_704;
        if ((((((((auVar223 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar223 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar223 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar223 >> 0x7f,0) == '\0') &&
              (auVar223 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar223 >> 0xbf,0) == '\0') &&
            (auVar223 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar223[0x1f]) {
          auVar273 = ZEXT3264(auVar273._0_32_);
        }
        else {
          local_500._0_4_ = auVar119._0_4_;
          local_500._4_4_ = auVar119._4_4_;
          fStack_4f8 = auVar119._8_4_;
          local_820._0_4_ =
               local_960 * (float)local_5c0._0_4_ +
               fVar232 * (float)local_e0._0_4_ +
               (float)local_100._0_4_ * local_580 + (float)local_400._0_4_ * (float)local_500._0_4_;
          local_820._4_4_ =
               fStack_95c * (float)local_5c0._4_4_ +
               fVar265 * (float)local_e0._4_4_ +
               (float)local_100._4_4_ * fStack_57c + (float)local_400._4_4_ * (float)local_500._4_4_
          ;
          fStack_818 = fStack_958 * fStack_5b8 +
                       fVar274 * fStack_d8 + fStack_f8 * fStack_578 + fStack_3f8 * fStack_4f8;
          fStack_814 = fStack_954 * fStack_5b4 +
                       fVar297 * fStack_d4 + fStack_f4 * fStack_574 + fStack_3f4 * fVar292;
          uStack_810._0_4_ =
               fStack_950 * fStack_5b0 +
               fVar312 * fStack_d0 + fStack_f0 * fStack_570 + fStack_3f0 * fStack_4f0;
          uStack_810._4_4_ =
               fStack_94c * fStack_5ac +
               fVar228 * fStack_cc + fStack_ec * fStack_56c + fStack_3ec * fStack_4ec;
          uStack_808._0_4_ =
               fStack_948 * fStack_5a8 +
               fVar290 * fStack_c8 + fStack_e8 * fStack_568 + fStack_3e8 * fStack_4e8;
          uStack_808._4_4_ = fStack_4e4 + fVar161 + fStack_944 + 0.0;
          local_700._0_4_ = auVar115._0_4_;
          local_700._4_4_ = auVar115._4_4_;
          fStack_6f8 = auVar115._8_4_;
          fStack_6f4 = auVar115._12_4_;
          fStack_6f0 = auVar115._16_4_;
          fStack_6ec = auVar115._20_4_;
          fStack_6e8 = auVar115._24_4_;
          fVar131 = (float)local_e0._0_4_ * (float)local_700._0_4_;
          fVar152 = (float)local_e0._4_4_ * (float)local_700._4_4_;
          fVar154 = fStack_d8 * fStack_6f8;
          fVar156 = fStack_d4 * fStack_6f4;
          fVar158 = fStack_d0 * fStack_6f0;
          fVar160 = fStack_cc * fStack_6ec;
          fVar163 = fStack_c8 * fStack_6e8;
          local_980._0_4_ = auVar114._0_4_;
          local_980._4_4_ = auVar114._4_4_;
          fStack_978 = auVar114._8_4_;
          fStack_974 = auVar114._12_4_;
          fStack_970 = auVar114._16_4_;
          fStack_96c = auVar114._20_4_;
          fStack_968 = auVar114._24_4_;
          pfVar1 = (float *)(lVar128 + 0x2205e84 + lVar126 * 4);
          fVar232 = *pfVar1;
          fVar265 = pfVar1[1];
          fVar274 = pfVar1[2];
          fVar276 = pfVar1[3];
          fVar277 = pfVar1[4];
          fVar297 = pfVar1[5];
          fVar308 = pfVar1[6];
          pfVar2 = (float *)(lVar128 + 0x2206308 + lVar126 * 4);
          fVar310 = *pfVar2;
          fVar312 = pfVar2[1];
          fVar333 = pfVar2[2];
          fVar187 = pfVar2[3];
          fVar228 = pfVar2[4];
          fVar278 = pfVar2[5];
          fVar289 = pfVar2[6];
          pfVar3 = (float *)(lVar128 + 0x2205a00 + lVar126 * 4);
          fVar290 = *pfVar3;
          fVar231 = pfVar3[1];
          fVar279 = pfVar3[2];
          fVar292 = pfVar3[3];
          fVar252 = pfVar3[4];
          fVar161 = pfVar3[5];
          fVar208 = pfVar3[6];
          fVar165 = pfVar1[7] + pfVar2[7];
          fStack_6a4 = pfVar2[7] + fVar291 + 0.0;
          fVar264 = fVar291 + auVar347._28_4_ + fVar291 + 0.0;
          pfVar1 = (float *)(lVar128 + 0x220557c + lVar126 * 4);
          fVar291 = *pfVar1;
          fVar225 = pfVar1[1];
          fVar227 = pfVar1[2];
          fVar230 = pfVar1[3];
          fVar233 = pfVar1[4];
          fVar234 = pfVar1[5];
          fVar236 = pfVar1[6];
          local_700._4_4_ =
               (float)local_420._4_4_ * fVar225 +
               fVar231 * (float)local_740._4_4_ +
               fVar182 * fVar265 + (float)local_560._4_4_ * fVar312;
          local_700._0_4_ =
               (float)local_420._0_4_ * fVar291 +
               fVar290 * (float)local_740._0_4_ +
               fVar166 * fVar232 + (float)local_560._0_4_ * fVar310;
          fStack_6f8 = fStack_418 * fVar227 +
                       fVar279 * fStack_738 + fVar184 * fVar274 + fStack_558 * fVar333;
          fStack_6f4 = fStack_414 * fVar230 +
                       fVar292 * fStack_734 + fVar186 * fVar276 + fStack_554 * fVar187;
          fStack_6f0 = fStack_410 * fVar233 +
                       fVar252 * fStack_730 + fVar166 * fVar277 + fStack_550 * fVar228;
          fStack_6ec = fStack_40c * fVar234 +
                       fVar161 * fStack_72c + fVar182 * fVar297 + fStack_54c * fVar278;
          fStack_6e8 = fStack_408 * fVar236 +
                       fVar208 * fStack_728 + fVar184 * fVar308 + fStack_548 * fVar289;
          fStack_6e4 = fVar165 + fStack_6a4;
          local_6c0 = fVar291 * fVar207 +
                      fVar188 * fVar232 + (float)local_720._0_4_ * fVar310 +
                      fVar290 * (float)local_7c0._0_4_;
          fStack_6bc = fVar225 * fVar224 +
                       fVar203 * fVar265 + (float)local_720._4_4_ * fVar312 +
                       fVar231 * (float)local_7c0._4_4_;
          fStack_6b8 = fVar227 * fVar226 +
                       fVar204 * fVar274 + fStack_718 * fVar333 + fVar279 * fStack_7b8;
          fStack_6b4 = fVar230 * fVar229 +
                       fVar205 * fVar276 + fStack_714 * fVar187 + fVar292 * fStack_7b4;
          fStack_6b0 = fVar233 * fVar322 +
                       fVar188 * fVar277 + fStack_710 * fVar228 + fVar252 * fStack_7b0;
          fStack_6ac = fVar234 * fVar327 +
                       fVar203 * fVar297 + fStack_70c * fVar278 + fVar161 * fStack_7ac;
          fStack_6a8 = fVar236 * fVar329 +
                       fVar204 * fVar308 + fStack_708 * fVar289 + fVar208 * fStack_7a8;
          fStack_6a4 = fStack_6a4 + fVar264;
          auVar345._0_4_ =
               fVar290 * (float)local_e0._0_4_ +
               (float)local_100._0_4_ * fVar232 + (float)local_400._0_4_ * fVar310 +
               fVar291 * (float)local_5c0._0_4_;
          auVar345._4_4_ =
               fVar231 * (float)local_e0._4_4_ +
               (float)local_100._4_4_ * fVar265 + (float)local_400._4_4_ * fVar312 +
               fVar225 * (float)local_5c0._4_4_;
          auVar345._8_4_ =
               fVar279 * fStack_d8 + fStack_f8 * fVar274 + fStack_3f8 * fVar333 +
               fVar227 * fStack_5b8;
          auVar345._12_4_ =
               fVar292 * fStack_d4 + fStack_f4 * fVar276 + fStack_3f4 * fVar187 +
               fVar230 * fStack_5b4;
          auVar345._16_4_ =
               fVar252 * fStack_d0 + fStack_f0 * fVar277 + fStack_3f0 * fVar228 +
               fVar233 * fStack_5b0;
          auVar345._20_4_ =
               fVar161 * fStack_cc + fStack_ec * fVar297 + fStack_3ec * fVar278 +
               fVar234 * fStack_5ac;
          auVar345._24_4_ =
               fVar208 * fStack_c8 + fStack_e8 * fVar308 + fStack_3e8 * fVar289 +
               fVar236 * fStack_5a8;
          auVar345._28_4_ = pfVar3[7] + fVar165 + fVar264;
          pfVar1 = (float *)(lVar128 + 0x22082a4 + lVar126 * 4);
          fVar232 = *pfVar1;
          fVar265 = pfVar1[1];
          fVar274 = pfVar1[2];
          fVar276 = pfVar1[3];
          fVar277 = pfVar1[4];
          fVar297 = pfVar1[5];
          fVar308 = pfVar1[6];
          pfVar2 = (float *)(lVar128 + 0x2208728 + lVar126 * 4);
          fVar310 = *pfVar2;
          fVar312 = pfVar2[1];
          fVar333 = pfVar2[2];
          fVar187 = pfVar2[3];
          fVar228 = pfVar2[4];
          fVar278 = pfVar2[5];
          fVar289 = pfVar2[6];
          pfVar3 = (float *)(lVar128 + 0x2207e20 + lVar126 * 4);
          fVar290 = *pfVar3;
          fVar231 = pfVar3[1];
          fVar279 = pfVar3[2];
          fVar291 = pfVar3[3];
          fVar292 = pfVar3[4];
          fVar252 = pfVar3[5];
          fVar161 = pfVar3[6];
          pfVar4 = (float *)(lVar128 + 0x220799c + lVar126 * 4);
          fVar208 = *pfVar4;
          fVar225 = pfVar4[1];
          fVar227 = pfVar4[2];
          fVar230 = pfVar4[3];
          fVar233 = pfVar4[4];
          fVar234 = pfVar4[5];
          fVar236 = pfVar4[6];
          auVar304._0_4_ =
               (float)local_420._0_4_ * fVar208 +
               fVar290 * (float)local_740._0_4_ +
               fVar166 * fVar232 + (float)local_560._0_4_ * fVar310;
          auVar304._4_4_ =
               (float)local_420._4_4_ * fVar225 +
               fVar231 * (float)local_740._4_4_ +
               fVar182 * fVar265 + (float)local_560._4_4_ * fVar312;
          auVar304._8_4_ =
               fStack_418 * fVar227 +
               fVar279 * fStack_738 + fVar184 * fVar274 + fStack_558 * fVar333;
          auVar304._12_4_ =
               fStack_414 * fVar230 +
               fVar291 * fStack_734 + fVar186 * fVar276 + fStack_554 * fVar187;
          auVar304._16_4_ =
               fStack_410 * fVar233 +
               fVar292 * fStack_730 + fVar166 * fVar277 + fStack_550 * fVar228;
          auVar304._20_4_ =
               fStack_40c * fVar234 +
               fVar252 * fStack_72c + fVar182 * fVar297 + fStack_54c * fVar278;
          auVar304._24_4_ =
               fStack_408 * fVar236 +
               fVar161 * fStack_728 + fVar184 * fVar308 + fStack_548 * fVar289;
          auVar304._28_4_ = fVar205 + fVar205 + fStack_544 + fStack_6a4;
          auVar342._0_4_ =
               fVar208 * fVar207 +
               fVar290 * (float)local_7c0._0_4_ +
               fVar188 * fVar232 + (float)local_720._0_4_ * fVar310;
          auVar342._4_4_ =
               fVar225 * fVar224 +
               fVar231 * (float)local_7c0._4_4_ +
               fVar203 * fVar265 + (float)local_720._4_4_ * fVar312;
          auVar342._8_4_ =
               fVar227 * fVar226 + fVar279 * fStack_7b8 + fVar204 * fVar274 + fStack_718 * fVar333;
          auVar342._12_4_ =
               fVar230 * fVar229 + fVar291 * fStack_7b4 + fVar205 * fVar276 + fStack_714 * fVar187;
          auVar342._16_4_ =
               fVar233 * fVar322 + fVar292 * fStack_7b0 + fVar188 * fVar277 + fStack_710 * fVar228;
          auVar342._20_4_ =
               fVar234 * fVar327 + fVar252 * fStack_7ac + fVar203 * fVar297 + fStack_70c * fVar278;
          auVar342._24_4_ =
               fVar236 * fVar329 + fVar161 * fStack_7a8 + fVar204 * fVar308 + fStack_708 * fVar289;
          auVar342._28_4_ = fVar205 + fVar205 + fStack_704 + fStack_6a4;
          auVar256._8_4_ = 0x7fffffff;
          auVar256._0_8_ = 0x7fffffff7fffffff;
          auVar256._12_4_ = 0x7fffffff;
          auVar256._16_4_ = 0x7fffffff;
          auVar256._20_4_ = 0x7fffffff;
          auVar256._24_4_ = 0x7fffffff;
          auVar256._28_4_ = 0x7fffffff;
          auVar223 = vandps_avx(_local_700,auVar256);
          auVar112._4_4_ = fStack_6bc;
          auVar112._0_4_ = local_6c0;
          auVar112._8_4_ = fStack_6b8;
          auVar112._12_4_ = fStack_6b4;
          auVar112._16_4_ = fStack_6b0;
          auVar112._20_4_ = fStack_6ac;
          auVar112._24_4_ = fStack_6a8;
          auVar112._28_4_ = fStack_6a4;
          auVar25 = vandps_avx(auVar112,auVar256);
          auVar25 = vmaxps_avx(auVar223,auVar25);
          auVar223 = vandps_avx(auVar345,auVar256);
          auVar25 = vmaxps_avx(auVar25,auVar223);
          auVar25 = vcmpps_avx(auVar25,_local_460,1);
          auVar30 = vblendvps_avx(_local_700,auVar26,auVar25);
          auVar145._0_4_ =
               fVar208 * (float)local_5c0._0_4_ +
               fVar290 * (float)local_e0._0_4_ +
               fVar310 * (float)local_400._0_4_ + (float)local_100._0_4_ * fVar232;
          auVar145._4_4_ =
               fVar225 * (float)local_5c0._4_4_ +
               fVar231 * (float)local_e0._4_4_ +
               fVar312 * (float)local_400._4_4_ + (float)local_100._4_4_ * fVar265;
          auVar145._8_4_ =
               fVar227 * fStack_5b8 +
               fVar279 * fStack_d8 + fVar333 * fStack_3f8 + fStack_f8 * fVar274;
          auVar145._12_4_ =
               fVar230 * fStack_5b4 +
               fVar291 * fStack_d4 + fVar187 * fStack_3f4 + fStack_f4 * fVar276;
          auVar145._16_4_ =
               fVar233 * fStack_5b0 +
               fVar292 * fStack_d0 + fVar228 * fStack_3f0 + fStack_f0 * fVar277;
          auVar145._20_4_ =
               fVar234 * fStack_5ac +
               fVar252 * fStack_cc + fVar278 * fStack_3ec + fStack_ec * fVar297;
          auVar145._24_4_ =
               fVar236 * fStack_5a8 +
               fVar161 * fStack_c8 + fVar289 * fStack_3e8 + fStack_e8 * fVar308;
          auVar145._28_4_ = auVar223._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
          auVar18 = vblendvps_avx(auVar112,auVar303,auVar25);
          auVar223 = vandps_avx(auVar304,auVar256);
          auVar25 = vandps_avx(auVar342,auVar256);
          auVar139 = vmaxps_avx(auVar223,auVar25);
          auVar223 = vandps_avx(auVar145,auVar256);
          auVar223 = vmaxps_avx(auVar139,auVar223);
          local_680._0_4_ = auVar116._0_4_;
          local_680._4_4_ = auVar116._4_4_;
          fStack_678 = auVar116._8_4_;
          fStack_674 = auVar116._12_4_;
          uStack_670._0_4_ = auVar116._16_4_;
          uStack_670._4_4_ = auVar116._20_4_;
          uStack_668._0_4_ = auVar116._24_4_;
          auVar25 = vcmpps_avx(auVar223,_local_460,1);
          auVar223 = vblendvps_avx(auVar304,auVar26,auVar25);
          auVar146._0_4_ =
               (float)local_5c0._0_4_ * (float)local_680._0_4_ +
               fVar131 + (float)local_100._0_4_ * (float)local_980._0_4_ +
                         (float)local_400._0_4_ * fVar293;
          auVar146._4_4_ =
               (float)local_5c0._4_4_ * (float)local_680._4_4_ +
               fVar152 + (float)local_100._4_4_ * (float)local_980._4_4_ +
                         (float)local_400._4_4_ * fVar294;
          auVar146._8_4_ =
               fStack_5b8 * fStack_678 + fVar154 + fStack_f8 * fStack_978 + fStack_3f8 * fVar235;
          auVar146._12_4_ =
               fStack_5b4 * fStack_674 + fVar156 + fStack_f4 * fStack_974 + fStack_3f4 * fVar281;
          auVar146._16_4_ =
               fStack_5b0 * (float)uStack_670 +
               fVar158 + fStack_f0 * fStack_970 + fStack_3f0 * fVar295;
          auVar146._20_4_ =
               fStack_5ac * uStack_670._4_4_ +
               fVar160 + fStack_ec * fStack_96c + fStack_3ec * fVar296;
          auVar146._24_4_ =
               fStack_5a8 * (float)uStack_668 +
               fVar163 + fStack_e8 * fStack_968 + fStack_3e8 * fVar237;
          auVar146._28_4_ = auVar139._28_4_ + uStack_808._4_4_ + fStack_944 + 0.0;
          auVar26 = vblendvps_avx(auVar342,auVar303,auVar25);
          fVar233 = auVar30._0_4_;
          fVar234 = auVar30._4_4_;
          fVar236 = auVar30._8_4_;
          fVar207 = auVar30._12_4_;
          fVar224 = auVar30._16_4_;
          fVar226 = auVar30._20_4_;
          fVar229 = auVar30._24_4_;
          fVar131 = auVar30._28_4_;
          fVar228 = auVar223._0_4_;
          fVar289 = auVar223._4_4_;
          fVar231 = auVar223._8_4_;
          fVar291 = auVar223._12_4_;
          fVar293 = auVar223._16_4_;
          fVar235 = auVar223._20_4_;
          fVar295 = auVar223._24_4_;
          fVar322 = auVar18._0_4_;
          fVar329 = auVar18._4_4_;
          fVar265 = auVar18._8_4_;
          fVar276 = auVar18._12_4_;
          fVar297 = auVar18._16_4_;
          fVar310 = auVar18._20_4_;
          fVar333 = auVar18._24_4_;
          auVar319._0_4_ = fVar322 * fVar322 + fVar233 * fVar233;
          auVar319._4_4_ = fVar329 * fVar329 + fVar234 * fVar234;
          auVar319._8_4_ = fVar265 * fVar265 + fVar236 * fVar236;
          auVar319._12_4_ = fVar276 * fVar276 + fVar207 * fVar207;
          auVar319._16_4_ = fVar297 * fVar297 + fVar224 * fVar224;
          auVar319._20_4_ = fVar310 * fVar310 + fVar226 * fVar226;
          auVar319._24_4_ = fVar333 * fVar333 + fVar229 * fVar229;
          auVar319._28_4_ = fStack_404 + auVar303._28_4_;
          auVar303 = vrsqrtps_avx(auVar319);
          fVar327 = auVar303._0_4_;
          fVar232 = auVar303._4_4_;
          auVar67._4_4_ = fVar232 * 1.5;
          auVar67._0_4_ = fVar327 * 1.5;
          fVar274 = auVar303._8_4_;
          auVar67._8_4_ = fVar274 * 1.5;
          fVar277 = auVar303._12_4_;
          auVar67._12_4_ = fVar277 * 1.5;
          fVar308 = auVar303._16_4_;
          auVar67._16_4_ = fVar308 * 1.5;
          fVar312 = auVar303._20_4_;
          auVar67._20_4_ = fVar312 * 1.5;
          fVar187 = auVar303._24_4_;
          auVar67._24_4_ = fVar187 * 1.5;
          auVar67._28_4_ = auVar342._28_4_;
          auVar68._4_4_ = fVar232 * fVar232 * fVar232 * auVar319._4_4_ * 0.5;
          auVar68._0_4_ = fVar327 * fVar327 * fVar327 * auVar319._0_4_ * 0.5;
          auVar68._8_4_ = fVar274 * fVar274 * fVar274 * auVar319._8_4_ * 0.5;
          auVar68._12_4_ = fVar277 * fVar277 * fVar277 * auVar319._12_4_ * 0.5;
          auVar68._16_4_ = fVar308 * fVar308 * fVar308 * auVar319._16_4_ * 0.5;
          auVar68._20_4_ = fVar312 * fVar312 * fVar312 * auVar319._20_4_ * 0.5;
          auVar68._24_4_ = fVar187 * fVar187 * fVar187 * auVar319._24_4_ * 0.5;
          auVar68._28_4_ = auVar319._28_4_;
          auVar25 = vsubps_avx(auVar67,auVar68);
          fVar237 = auVar25._0_4_;
          fVar252 = auVar25._4_4_;
          fVar161 = auVar25._8_4_;
          fVar208 = auVar25._12_4_;
          fVar225 = auVar25._16_4_;
          fVar227 = auVar25._20_4_;
          fVar230 = auVar25._24_4_;
          fVar327 = auVar26._0_4_;
          fVar232 = auVar26._4_4_;
          fVar274 = auVar26._8_4_;
          fVar277 = auVar26._12_4_;
          fVar308 = auVar26._16_4_;
          fVar312 = auVar26._20_4_;
          fVar187 = auVar26._24_4_;
          auVar286._0_4_ = fVar327 * fVar327 + fVar228 * fVar228;
          auVar286._4_4_ = fVar232 * fVar232 + fVar289 * fVar289;
          auVar286._8_4_ = fVar274 * fVar274 + fVar231 * fVar231;
          auVar286._12_4_ = fVar277 * fVar277 + fVar291 * fVar291;
          auVar286._16_4_ = fVar308 * fVar308 + fVar293 * fVar293;
          auVar286._20_4_ = fVar312 * fVar312 + fVar235 * fVar235;
          auVar286._24_4_ = fVar187 * fVar187 + fVar295 * fVar295;
          auVar286._28_4_ = auVar303._28_4_ + auVar223._28_4_;
          auVar223 = vrsqrtps_avx(auVar286);
          fVar278 = auVar223._0_4_;
          fVar290 = auVar223._4_4_;
          auVar69._4_4_ = fVar290 * 1.5;
          auVar69._0_4_ = fVar278 * 1.5;
          fVar279 = auVar223._8_4_;
          auVar69._8_4_ = fVar279 * 1.5;
          fVar292 = auVar223._12_4_;
          auVar69._12_4_ = fVar292 * 1.5;
          fVar294 = auVar223._16_4_;
          auVar69._16_4_ = fVar294 * 1.5;
          fVar281 = auVar223._20_4_;
          auVar69._20_4_ = fVar281 * 1.5;
          fVar296 = auVar223._24_4_;
          auVar69._24_4_ = fVar296 * 1.5;
          auVar69._28_4_ = auVar342._28_4_;
          auVar70._4_4_ = fVar290 * fVar290 * fVar290 * auVar286._4_4_ * 0.5;
          auVar70._0_4_ = fVar278 * fVar278 * fVar278 * auVar286._0_4_ * 0.5;
          auVar70._8_4_ = fVar279 * fVar279 * fVar279 * auVar286._8_4_ * 0.5;
          auVar70._12_4_ = fVar292 * fVar292 * fVar292 * auVar286._12_4_ * 0.5;
          auVar70._16_4_ = fVar294 * fVar294 * fVar294 * auVar286._16_4_ * 0.5;
          auVar70._20_4_ = fVar281 * fVar281 * fVar281 * auVar286._20_4_ * 0.5;
          auVar70._24_4_ = fVar296 * fVar296 * fVar296 * auVar286._24_4_ * 0.5;
          auVar70._28_4_ = auVar286._28_4_;
          auVar26 = vsubps_avx(auVar69,auVar70);
          fVar278 = auVar26._0_4_;
          fVar290 = auVar26._4_4_;
          fVar279 = auVar26._8_4_;
          fVar292 = auVar26._12_4_;
          fVar294 = auVar26._16_4_;
          fVar281 = auVar26._20_4_;
          fVar296 = auVar26._24_4_;
          fVar322 = fVar130 * fVar237 * fVar322;
          fVar329 = fVar206 * fVar252 * fVar329;
          auVar71._4_4_ = fVar329;
          auVar71._0_4_ = fVar322;
          fVar265 = fVar153 * fVar161 * fVar265;
          auVar71._8_4_ = fVar265;
          fVar276 = fVar155 * fVar208 * fVar276;
          auVar71._12_4_ = fVar276;
          fVar297 = fVar157 * fVar225 * fVar297;
          auVar71._16_4_ = fVar297;
          fVar310 = fVar159 * fVar227 * fVar310;
          auVar71._20_4_ = fVar310;
          fVar333 = fVar162 * fVar230 * fVar333;
          auVar71._24_4_ = fVar333;
          auVar71._28_4_ = auVar223._28_4_;
          local_680._4_4_ = fVar329 + auVar341._4_4_;
          local_680._0_4_ = fVar322 + auVar341._0_4_;
          fStack_678 = fVar265 + auVar341._8_4_;
          fStack_674 = fVar276 + auVar341._12_4_;
          uStack_670._0_4_ = fVar297 + auVar341._16_4_;
          uStack_670._4_4_ = fVar310 + auVar341._20_4_;
          uStack_668._0_4_ = fVar333 + auVar341._24_4_;
          uStack_668._4_4_ = auVar223._28_4_ + auVar341._28_4_;
          fVar322 = fVar130 * fVar237 * -fVar233;
          fVar329 = fVar206 * fVar252 * -fVar234;
          auVar72._4_4_ = fVar329;
          auVar72._0_4_ = fVar322;
          fVar265 = fVar153 * fVar161 * -fVar236;
          auVar72._8_4_ = fVar265;
          fVar276 = fVar155 * fVar208 * -fVar207;
          auVar72._12_4_ = fVar276;
          fVar297 = fVar157 * fVar225 * -fVar224;
          auVar72._16_4_ = fVar297;
          fVar310 = fVar159 * fVar227 * -fVar226;
          auVar72._20_4_ = fVar310;
          fVar333 = fVar162 * fVar230 * -fVar229;
          auVar72._24_4_ = fVar333;
          auVar72._28_4_ = -fVar131;
          local_980._4_4_ = auVar221._4_4_ + fVar329;
          local_980._0_4_ = auVar221._0_4_ + fVar322;
          fStack_978 = auVar221._8_4_ + fVar265;
          fStack_974 = auVar221._12_4_ + fVar276;
          fStack_970 = auVar221._16_4_ + fVar297;
          fStack_96c = auVar221._20_4_ + fVar310;
          fStack_968 = auVar221._24_4_ + fVar333;
          fStack_964 = auVar221._28_4_ + -fVar131;
          fVar322 = fVar237 * 0.0 * fVar130;
          fVar329 = fVar252 * 0.0 * fVar206;
          auVar73._4_4_ = fVar329;
          auVar73._0_4_ = fVar322;
          fVar265 = fVar161 * 0.0 * fVar153;
          auVar73._8_4_ = fVar265;
          fVar276 = fVar208 * 0.0 * fVar155;
          auVar73._12_4_ = fVar276;
          fVar297 = fVar225 * 0.0 * fVar157;
          auVar73._16_4_ = fVar297;
          fVar310 = fVar227 * 0.0 * fVar159;
          auVar73._20_4_ = fVar310;
          fVar333 = fVar230 * 0.0 * fVar162;
          auVar73._24_4_ = fVar333;
          auVar73._28_4_ = fVar131;
          auVar139 = vsubps_avx(auVar341,auVar71);
          auVar364._0_4_ = fVar322 + auVar146._0_4_;
          auVar364._4_4_ = fVar329 + auVar146._4_4_;
          auVar364._8_4_ = fVar265 + auVar146._8_4_;
          auVar364._12_4_ = fVar276 + auVar146._12_4_;
          auVar364._16_4_ = fVar297 + auVar146._16_4_;
          auVar364._20_4_ = fVar310 + auVar146._20_4_;
          auVar364._24_4_ = fVar333 + auVar146._24_4_;
          auVar364._28_4_ = fVar131 + auVar146._28_4_;
          fVar322 = auVar272._0_4_ * fVar278 * fVar327;
          fVar327 = auVar272._4_4_ * fVar290 * fVar232;
          auVar74._4_4_ = fVar327;
          auVar74._0_4_ = fVar322;
          fVar329 = auVar272._8_4_ * fVar279 * fVar274;
          auVar74._8_4_ = fVar329;
          fVar232 = auVar272._12_4_ * fVar292 * fVar277;
          auVar74._12_4_ = fVar232;
          fVar265 = auVar272._16_4_ * fVar294 * fVar308;
          auVar74._16_4_ = fVar265;
          fVar274 = auVar272._20_4_ * fVar281 * fVar312;
          auVar74._20_4_ = fVar274;
          fVar276 = auVar272._24_4_ * fVar296 * fVar187;
          auVar74._24_4_ = fVar276;
          auVar74._28_4_ = fVar164;
          auVar255 = vsubps_avx(auVar221,auVar72);
          auVar346._0_4_ = auVar262._0_4_ + fVar322;
          auVar346._4_4_ = auVar262._4_4_ + fVar327;
          auVar346._8_4_ = auVar262._8_4_ + fVar329;
          auVar346._12_4_ = auVar262._12_4_ + fVar232;
          auVar346._16_4_ = auVar262._16_4_ + fVar265;
          auVar346._20_4_ = auVar262._20_4_ + fVar274;
          auVar346._24_4_ = auVar262._24_4_ + fVar276;
          auVar346._28_4_ = auVar262._28_4_ + fVar164;
          fVar322 = fVar278 * -fVar228 * auVar272._0_4_;
          fVar327 = fVar290 * -fVar289 * auVar272._4_4_;
          auVar75._4_4_ = fVar327;
          auVar75._0_4_ = fVar322;
          fVar329 = fVar279 * -fVar231 * auVar272._8_4_;
          auVar75._8_4_ = fVar329;
          fVar232 = fVar292 * -fVar291 * auVar272._12_4_;
          auVar75._12_4_ = fVar232;
          fVar265 = fVar294 * -fVar293 * auVar272._16_4_;
          auVar75._16_4_ = fVar265;
          fVar274 = fVar281 * -fVar235 * auVar272._20_4_;
          auVar75._20_4_ = fVar274;
          fVar276 = fVar296 * -fVar295 * auVar272._24_4_;
          auVar75._24_4_ = fVar276;
          auVar75._28_4_ = auVar341._28_4_;
          auVar285 = vsubps_avx(auVar146,auVar73);
          auVar248._0_4_ = local_660._0_4_ + fVar322;
          auVar248._4_4_ = local_660._4_4_ + fVar327;
          auVar248._8_4_ = local_660._8_4_ + fVar329;
          auVar248._12_4_ = local_660._12_4_ + fVar232;
          auVar248._16_4_ = local_660._16_4_ + fVar265;
          auVar248._20_4_ = local_660._20_4_ + fVar274;
          auVar248._24_4_ = local_660._24_4_ + fVar276;
          auVar248._28_4_ = local_660._28_4_ + auVar341._28_4_;
          fVar322 = fVar278 * 0.0 * auVar272._0_4_;
          fVar327 = fVar290 * 0.0 * auVar272._4_4_;
          auVar76._4_4_ = fVar327;
          auVar76._0_4_ = fVar322;
          fVar329 = fVar279 * 0.0 * auVar272._8_4_;
          auVar76._8_4_ = fVar329;
          fVar232 = fVar292 * 0.0 * auVar272._12_4_;
          auVar76._12_4_ = fVar232;
          fVar265 = fVar294 * 0.0 * auVar272._16_4_;
          auVar76._16_4_ = fVar265;
          fVar274 = fVar281 * 0.0 * auVar272._20_4_;
          auVar76._20_4_ = fVar274;
          fVar276 = fVar296 * 0.0 * auVar272._24_4_;
          auVar76._24_4_ = fVar276;
          auVar76._28_4_ = auVar146._28_4_;
          auVar223 = vsubps_avx(auVar262,auVar74);
          auVar305._0_4_ = (float)local_820._0_4_ + fVar322;
          auVar305._4_4_ = (float)local_820._4_4_ + fVar327;
          auVar305._8_4_ = fStack_818 + fVar329;
          auVar305._12_4_ = fStack_814 + fVar232;
          auVar305._16_4_ = (float)uStack_810 + fVar265;
          auVar305._20_4_ = uStack_810._4_4_ + fVar274;
          auVar305._24_4_ = (float)uStack_808 + fVar276;
          auVar305._28_4_ = uStack_808._4_4_ + auVar146._28_4_;
          auVar303 = vsubps_avx(local_660,auVar75);
          auVar25 = vsubps_avx(_local_820,auVar76);
          auVar30 = vsubps_avx(auVar248,auVar255);
          auVar18 = vsubps_avx(auVar305,auVar285);
          auVar77._4_4_ = auVar285._4_4_ * auVar30._4_4_;
          auVar77._0_4_ = auVar285._0_4_ * auVar30._0_4_;
          auVar77._8_4_ = auVar285._8_4_ * auVar30._8_4_;
          auVar77._12_4_ = auVar285._12_4_ * auVar30._12_4_;
          auVar77._16_4_ = auVar285._16_4_ * auVar30._16_4_;
          auVar77._20_4_ = auVar285._20_4_ * auVar30._20_4_;
          auVar77._24_4_ = auVar285._24_4_ * auVar30._24_4_;
          auVar77._28_4_ = auVar342._28_4_;
          auVar78._4_4_ = auVar255._4_4_ * auVar18._4_4_;
          auVar78._0_4_ = auVar255._0_4_ * auVar18._0_4_;
          auVar78._8_4_ = auVar255._8_4_ * auVar18._8_4_;
          auVar78._12_4_ = auVar255._12_4_ * auVar18._12_4_;
          auVar78._16_4_ = auVar255._16_4_ * auVar18._16_4_;
          auVar78._20_4_ = auVar255._20_4_ * auVar18._20_4_;
          auVar78._24_4_ = auVar255._24_4_ * auVar18._24_4_;
          auVar78._28_4_ = uStack_808._4_4_;
          auVar216 = vsubps_avx(auVar78,auVar77);
          auVar79._4_4_ = auVar139._4_4_ * auVar18._4_4_;
          auVar79._0_4_ = auVar139._0_4_ * auVar18._0_4_;
          auVar79._8_4_ = auVar139._8_4_ * auVar18._8_4_;
          auVar79._12_4_ = auVar139._12_4_ * auVar18._12_4_;
          auVar79._16_4_ = auVar139._16_4_ * auVar18._16_4_;
          auVar79._20_4_ = auVar139._20_4_ * auVar18._20_4_;
          auVar79._24_4_ = auVar139._24_4_ * auVar18._24_4_;
          auVar79._28_4_ = auVar18._28_4_;
          auVar18 = vsubps_avx(auVar346,auVar139);
          auVar80._4_4_ = auVar285._4_4_ * auVar18._4_4_;
          auVar80._0_4_ = auVar285._0_4_ * auVar18._0_4_;
          auVar80._8_4_ = auVar285._8_4_ * auVar18._8_4_;
          auVar80._12_4_ = auVar285._12_4_ * auVar18._12_4_;
          auVar80._16_4_ = auVar285._16_4_ * auVar18._16_4_;
          auVar80._20_4_ = auVar285._20_4_ * auVar18._20_4_;
          auVar80._24_4_ = auVar285._24_4_ * auVar18._24_4_;
          auVar80._28_4_ = auVar26._28_4_;
          auVar217 = vsubps_avx(auVar80,auVar79);
          auVar81._4_4_ = auVar255._4_4_ * auVar18._4_4_;
          auVar81._0_4_ = auVar255._0_4_ * auVar18._0_4_;
          auVar81._8_4_ = auVar255._8_4_ * auVar18._8_4_;
          auVar81._12_4_ = auVar255._12_4_ * auVar18._12_4_;
          auVar81._16_4_ = auVar255._16_4_ * auVar18._16_4_;
          auVar81._20_4_ = auVar255._20_4_ * auVar18._20_4_;
          auVar81._24_4_ = auVar255._24_4_ * auVar18._24_4_;
          auVar81._28_4_ = auVar26._28_4_;
          auVar82._4_4_ = auVar139._4_4_ * auVar30._4_4_;
          auVar82._0_4_ = auVar139._0_4_ * auVar30._0_4_;
          auVar82._8_4_ = auVar139._8_4_ * auVar30._8_4_;
          auVar82._12_4_ = auVar139._12_4_ * auVar30._12_4_;
          auVar82._16_4_ = auVar139._16_4_ * auVar30._16_4_;
          auVar82._20_4_ = auVar139._20_4_ * auVar30._20_4_;
          auVar82._24_4_ = auVar139._24_4_ * auVar30._24_4_;
          auVar82._28_4_ = auVar30._28_4_;
          auVar26 = vsubps_avx(auVar82,auVar81);
          auVar176._0_4_ = auVar216._0_4_ * 0.0 + auVar26._0_4_ + auVar217._0_4_ * 0.0;
          auVar176._4_4_ = auVar216._4_4_ * 0.0 + auVar26._4_4_ + auVar217._4_4_ * 0.0;
          auVar176._8_4_ = auVar216._8_4_ * 0.0 + auVar26._8_4_ + auVar217._8_4_ * 0.0;
          auVar176._12_4_ = auVar216._12_4_ * 0.0 + auVar26._12_4_ + auVar217._12_4_ * 0.0;
          auVar176._16_4_ = auVar216._16_4_ * 0.0 + auVar26._16_4_ + auVar217._16_4_ * 0.0;
          auVar176._20_4_ = auVar216._20_4_ * 0.0 + auVar26._20_4_ + auVar217._20_4_ * 0.0;
          auVar176._24_4_ = auVar216._24_4_ * 0.0 + auVar26._24_4_ + auVar217._24_4_ * 0.0;
          auVar176._28_4_ = auVar216._28_4_ + auVar26._28_4_ + auVar217._28_4_;
          auVar243 = vcmpps_avx(auVar176,ZEXT832(0) << 0x20,2);
          auVar202 = ZEXT3264(auVar243);
          auVar223 = vblendvps_avx(auVar223,_local_680,auVar243);
          auVar26 = vblendvps_avx(auVar303,_local_980,auVar243);
          auVar303 = vblendvps_avx(auVar25,auVar364,auVar243);
          auVar25 = vblendvps_avx(auVar139,auVar346,auVar243);
          auVar30 = vblendvps_avx(auVar255,auVar248,auVar243);
          auVar18 = vblendvps_avx(auVar285,auVar305,auVar243);
          auVar139 = vblendvps_avx(auVar346,auVar139,auVar243);
          auVar216 = vblendvps_avx(auVar248,auVar255,auVar243);
          auVar217 = vblendvps_avx(auVar305,auVar285,auVar243);
          _local_820 = vandps_avx(_local_6a0,auVar247);
          auVar139 = vsubps_avx(auVar139,auVar223);
          auVar338 = vsubps_avx(auVar216,auVar26);
          auVar217 = vsubps_avx(auVar217,auVar303);
          auVar29 = vsubps_avx(auVar26,auVar30);
          fVar322 = auVar338._0_4_;
          fVar165 = auVar303._0_4_;
          fVar277 = auVar338._4_4_;
          fVar264 = auVar303._4_4_;
          auVar83._4_4_ = fVar264 * fVar277;
          auVar83._0_4_ = fVar165 * fVar322;
          fVar228 = auVar338._8_4_;
          fVar249 = auVar303._8_4_;
          auVar83._8_4_ = fVar249 * fVar228;
          fVar292 = auVar338._12_4_;
          fVar250 = auVar303._12_4_;
          auVar83._12_4_ = fVar250 * fVar292;
          fVar237 = auVar338._16_4_;
          fVar251 = auVar303._16_4_;
          auVar83._16_4_ = fVar251 * fVar237;
          fVar233 = auVar338._20_4_;
          fVar280 = auVar303._20_4_;
          auVar83._20_4_ = fVar280 * fVar233;
          fVar131 = auVar338._24_4_;
          fVar282 = auVar303._24_4_;
          auVar83._24_4_ = fVar282 * fVar131;
          auVar83._28_4_ = auVar216._28_4_;
          fVar327 = auVar26._0_4_;
          fVar298 = auVar217._0_4_;
          fVar297 = auVar26._4_4_;
          fVar309 = auVar217._4_4_;
          auVar84._4_4_ = fVar309 * fVar297;
          auVar84._0_4_ = fVar298 * fVar327;
          fVar278 = auVar26._8_4_;
          fVar311 = auVar217._8_4_;
          auVar84._8_4_ = fVar311 * fVar278;
          fVar293 = auVar26._12_4_;
          fVar313 = auVar217._12_4_;
          auVar84._12_4_ = fVar313 * fVar293;
          fVar252 = auVar26._16_4_;
          fVar314 = auVar217._16_4_;
          auVar84._16_4_ = fVar314 * fVar252;
          fVar234 = auVar26._20_4_;
          fVar315 = auVar217._20_4_;
          auVar84._20_4_ = fVar315 * fVar234;
          fVar152 = auVar26._24_4_;
          fVar316 = auVar217._24_4_;
          uVar129 = auVar255._28_4_;
          auVar84._24_4_ = fVar316 * fVar152;
          auVar84._28_4_ = uVar129;
          auVar216 = vsubps_avx(auVar84,auVar83);
          fVar329 = auVar223._0_4_;
          fVar308 = auVar223._4_4_;
          auVar85._4_4_ = fVar309 * fVar308;
          auVar85._0_4_ = fVar298 * fVar329;
          fVar289 = auVar223._8_4_;
          auVar85._8_4_ = fVar311 * fVar289;
          fVar294 = auVar223._12_4_;
          auVar85._12_4_ = fVar313 * fVar294;
          fVar161 = auVar223._16_4_;
          auVar85._16_4_ = fVar314 * fVar161;
          fVar236 = auVar223._20_4_;
          auVar85._20_4_ = fVar315 * fVar236;
          fVar154 = auVar223._24_4_;
          auVar85._24_4_ = fVar316 * fVar154;
          auVar85._28_4_ = uVar129;
          fVar232 = auVar139._0_4_;
          fVar310 = auVar139._4_4_;
          auVar86._4_4_ = fVar264 * fVar310;
          auVar86._0_4_ = fVar165 * fVar232;
          fVar290 = auVar139._8_4_;
          auVar86._8_4_ = fVar249 * fVar290;
          fVar235 = auVar139._12_4_;
          auVar86._12_4_ = fVar250 * fVar235;
          fVar208 = auVar139._16_4_;
          auVar86._16_4_ = fVar251 * fVar208;
          fVar207 = auVar139._20_4_;
          auVar86._20_4_ = fVar280 * fVar207;
          fVar156 = auVar139._24_4_;
          auVar86._24_4_ = fVar282 * fVar156;
          auVar86._28_4_ = auVar346._28_4_;
          auVar255 = vsubps_avx(auVar86,auVar85);
          auVar87._4_4_ = fVar297 * fVar310;
          auVar87._0_4_ = fVar327 * fVar232;
          auVar87._8_4_ = fVar278 * fVar290;
          auVar87._12_4_ = fVar293 * fVar235;
          auVar87._16_4_ = fVar252 * fVar208;
          auVar87._20_4_ = fVar234 * fVar207;
          auVar87._24_4_ = fVar152 * fVar156;
          auVar87._28_4_ = uVar129;
          auVar88._4_4_ = fVar308 * fVar277;
          auVar88._0_4_ = fVar329 * fVar322;
          auVar88._8_4_ = fVar289 * fVar228;
          auVar88._12_4_ = fVar294 * fVar292;
          auVar88._16_4_ = fVar161 * fVar237;
          auVar88._20_4_ = fVar236 * fVar233;
          auVar88._24_4_ = fVar154 * fVar131;
          auVar88._28_4_ = auVar285._28_4_;
          auVar285 = vsubps_avx(auVar88,auVar87);
          auVar303 = vsubps_avx(auVar303,auVar18);
          fVar274 = auVar285._28_4_ + auVar255._28_4_;
          auVar320._0_4_ = auVar285._0_4_ + auVar255._0_4_ * 0.0 + auVar216._0_4_ * 0.0;
          auVar320._4_4_ = auVar285._4_4_ + auVar255._4_4_ * 0.0 + auVar216._4_4_ * 0.0;
          auVar320._8_4_ = auVar285._8_4_ + auVar255._8_4_ * 0.0 + auVar216._8_4_ * 0.0;
          auVar320._12_4_ = auVar285._12_4_ + auVar255._12_4_ * 0.0 + auVar216._12_4_ * 0.0;
          auVar320._16_4_ = auVar285._16_4_ + auVar255._16_4_ * 0.0 + auVar216._16_4_ * 0.0;
          auVar320._20_4_ = auVar285._20_4_ + auVar255._20_4_ * 0.0 + auVar216._20_4_ * 0.0;
          auVar320._24_4_ = auVar285._24_4_ + auVar255._24_4_ * 0.0 + auVar216._24_4_ * 0.0;
          auVar320._28_4_ = fVar274 + auVar216._28_4_;
          fVar265 = auVar29._0_4_;
          fVar312 = auVar29._4_4_;
          auVar89._4_4_ = auVar18._4_4_ * fVar312;
          auVar89._0_4_ = auVar18._0_4_ * fVar265;
          fVar231 = auVar29._8_4_;
          auVar89._8_4_ = auVar18._8_4_ * fVar231;
          fVar281 = auVar29._12_4_;
          auVar89._12_4_ = auVar18._12_4_ * fVar281;
          fVar225 = auVar29._16_4_;
          auVar89._16_4_ = auVar18._16_4_ * fVar225;
          fVar224 = auVar29._20_4_;
          auVar89._20_4_ = auVar18._20_4_ * fVar224;
          fVar158 = auVar29._24_4_;
          auVar89._24_4_ = auVar18._24_4_ * fVar158;
          auVar89._28_4_ = fVar274;
          fVar274 = auVar303._0_4_;
          fVar333 = auVar303._4_4_;
          auVar90._4_4_ = auVar30._4_4_ * fVar333;
          auVar90._0_4_ = auVar30._0_4_ * fVar274;
          fVar279 = auVar303._8_4_;
          auVar90._8_4_ = auVar30._8_4_ * fVar279;
          fVar295 = auVar303._12_4_;
          auVar90._12_4_ = auVar30._12_4_ * fVar295;
          fVar227 = auVar303._16_4_;
          auVar90._16_4_ = auVar30._16_4_ * fVar227;
          fVar226 = auVar303._20_4_;
          auVar90._20_4_ = auVar30._20_4_ * fVar226;
          fVar160 = auVar303._24_4_;
          auVar90._24_4_ = auVar30._24_4_ * fVar160;
          auVar90._28_4_ = auVar285._28_4_;
          auVar255 = vsubps_avx(auVar90,auVar89);
          auVar355 = ZEXT3264(auVar255);
          auVar223 = vsubps_avx(auVar223,auVar25);
          fVar276 = auVar223._0_4_;
          fVar187 = auVar223._4_4_;
          auVar91._4_4_ = auVar18._4_4_ * fVar187;
          auVar91._0_4_ = auVar18._0_4_ * fVar276;
          fVar291 = auVar223._8_4_;
          auVar91._8_4_ = auVar18._8_4_ * fVar291;
          fVar296 = auVar223._12_4_;
          auVar91._12_4_ = auVar18._12_4_ * fVar296;
          fVar230 = auVar223._16_4_;
          auVar91._16_4_ = auVar18._16_4_ * fVar230;
          fVar229 = auVar223._20_4_;
          auVar91._20_4_ = auVar18._20_4_ * fVar229;
          fVar163 = auVar223._24_4_;
          auVar91._24_4_ = auVar18._24_4_ * fVar163;
          auVar91._28_4_ = auVar18._28_4_;
          auVar92._4_4_ = fVar333 * auVar25._4_4_;
          auVar92._0_4_ = fVar274 * auVar25._0_4_;
          auVar92._8_4_ = fVar279 * auVar25._8_4_;
          auVar92._12_4_ = fVar295 * auVar25._12_4_;
          auVar92._16_4_ = fVar227 * auVar25._16_4_;
          auVar92._20_4_ = fVar226 * auVar25._20_4_;
          auVar92._24_4_ = fVar160 * auVar25._24_4_;
          auVar92._28_4_ = auVar216._28_4_;
          auVar223 = vsubps_avx(auVar91,auVar92);
          auVar93._4_4_ = auVar30._4_4_ * fVar187;
          auVar93._0_4_ = auVar30._0_4_ * fVar276;
          auVar93._8_4_ = auVar30._8_4_ * fVar291;
          auVar93._12_4_ = auVar30._12_4_ * fVar296;
          auVar93._16_4_ = auVar30._16_4_ * fVar230;
          auVar93._20_4_ = auVar30._20_4_ * fVar229;
          auVar93._24_4_ = auVar30._24_4_ * fVar163;
          auVar93._28_4_ = auVar30._28_4_;
          auVar94._4_4_ = fVar312 * auVar25._4_4_;
          auVar94._0_4_ = fVar265 * auVar25._0_4_;
          auVar94._8_4_ = fVar231 * auVar25._8_4_;
          auVar94._12_4_ = fVar281 * auVar25._12_4_;
          auVar94._16_4_ = fVar225 * auVar25._16_4_;
          auVar94._20_4_ = fVar224 * auVar25._20_4_;
          auVar94._24_4_ = fVar158 * auVar25._24_4_;
          auVar94._28_4_ = auVar25._28_4_;
          auVar25 = vsubps_avx(auVar94,auVar93);
          auVar147._0_4_ = auVar255._0_4_ * 0.0 + auVar25._0_4_ + auVar223._0_4_ * 0.0;
          auVar147._4_4_ = auVar255._4_4_ * 0.0 + auVar25._4_4_ + auVar223._4_4_ * 0.0;
          auVar147._8_4_ = auVar255._8_4_ * 0.0 + auVar25._8_4_ + auVar223._8_4_ * 0.0;
          auVar147._12_4_ = auVar255._12_4_ * 0.0 + auVar25._12_4_ + auVar223._12_4_ * 0.0;
          auVar147._16_4_ = auVar255._16_4_ * 0.0 + auVar25._16_4_ + auVar223._16_4_ * 0.0;
          auVar147._20_4_ = auVar255._20_4_ * 0.0 + auVar25._20_4_ + auVar223._20_4_ * 0.0;
          auVar147._24_4_ = auVar255._24_4_ * 0.0 + auVar25._24_4_ + auVar223._24_4_ * 0.0;
          auVar147._28_4_ = auVar223._28_4_ + auVar25._28_4_ + auVar223._28_4_;
          auVar223 = vmaxps_avx(auVar320,auVar147);
          auVar223 = vcmpps_avx(auVar223,ZEXT432(0) << 0x20,2);
          auVar25 = _local_820 & auVar223;
          if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar25 >> 0x7f,0) == '\0') &&
                (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar25 >> 0xbf,0) == '\0') &&
              (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar25[0x1f]) {
LAB_0093fd79:
            auVar306 = ZEXT3264(CONCAT824(uStack_5e8,
                                          CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
            auVar321._4_4_ = fVar206;
            auVar321._0_4_ = fVar130;
            auVar321._8_4_ = fVar153;
            auVar321._12_4_ = fVar155;
            auVar321._16_4_ = fVar157;
            auVar321._20_4_ = fVar159;
            auVar321._24_4_ = fVar162;
            auVar321._28_4_ = fVar164;
          }
          else {
            auVar25 = vandps_avx(auVar223,_local_820);
            auVar95._4_4_ = fVar333 * fVar277;
            auVar95._0_4_ = fVar274 * fVar322;
            auVar95._8_4_ = fVar279 * fVar228;
            auVar95._12_4_ = fVar295 * fVar292;
            auVar95._16_4_ = fVar227 * fVar237;
            auVar95._20_4_ = fVar226 * fVar233;
            auVar95._24_4_ = fVar160 * fVar131;
            auVar95._28_4_ = local_820._28_4_;
            auVar96._4_4_ = fVar312 * fVar309;
            auVar96._0_4_ = fVar265 * fVar298;
            auVar96._8_4_ = fVar231 * fVar311;
            auVar96._12_4_ = fVar281 * fVar313;
            auVar96._16_4_ = fVar225 * fVar314;
            auVar96._20_4_ = fVar224 * fVar315;
            auVar96._24_4_ = fVar158 * fVar316;
            auVar96._28_4_ = auVar223._28_4_;
            auVar30 = vsubps_avx(auVar96,auVar95);
            auVar97._4_4_ = fVar187 * fVar309;
            auVar97._0_4_ = fVar276 * fVar298;
            auVar97._8_4_ = fVar291 * fVar311;
            auVar97._12_4_ = fVar296 * fVar313;
            auVar97._16_4_ = fVar230 * fVar314;
            auVar97._20_4_ = fVar229 * fVar315;
            auVar97._24_4_ = fVar163 * fVar316;
            auVar97._28_4_ = auVar217._28_4_;
            auVar98._4_4_ = fVar333 * fVar310;
            auVar98._0_4_ = fVar274 * fVar232;
            auVar98._8_4_ = fVar279 * fVar290;
            auVar98._12_4_ = fVar295 * fVar235;
            auVar98._16_4_ = fVar227 * fVar208;
            auVar98._20_4_ = fVar226 * fVar207;
            auVar98._24_4_ = fVar160 * fVar156;
            auVar98._28_4_ = auVar303._28_4_;
            auVar18 = vsubps_avx(auVar98,auVar97);
            auVar99._4_4_ = fVar312 * fVar310;
            auVar99._0_4_ = fVar265 * fVar232;
            auVar99._8_4_ = fVar231 * fVar290;
            auVar99._12_4_ = fVar281 * fVar235;
            auVar99._16_4_ = fVar225 * fVar208;
            auVar99._20_4_ = fVar224 * fVar207;
            auVar99._24_4_ = fVar158 * fVar156;
            auVar99._28_4_ = auVar139._28_4_;
            auVar100._4_4_ = fVar187 * fVar277;
            auVar100._0_4_ = fVar276 * fVar322;
            auVar100._8_4_ = fVar291 * fVar228;
            auVar100._12_4_ = fVar296 * fVar292;
            auVar100._16_4_ = fVar230 * fVar237;
            auVar100._20_4_ = fVar229 * fVar233;
            auVar100._24_4_ = fVar163 * fVar131;
            auVar100._28_4_ = auVar338._28_4_;
            auVar216 = vsubps_avx(auVar100,auVar99);
            auVar287._0_4_ = auVar30._0_4_ * 0.0 + auVar216._0_4_ + auVar18._0_4_ * 0.0;
            auVar287._4_4_ = auVar30._4_4_ * 0.0 + auVar216._4_4_ + auVar18._4_4_ * 0.0;
            auVar287._8_4_ = auVar30._8_4_ * 0.0 + auVar216._8_4_ + auVar18._8_4_ * 0.0;
            auVar287._12_4_ = auVar30._12_4_ * 0.0 + auVar216._12_4_ + auVar18._12_4_ * 0.0;
            auVar287._16_4_ = auVar30._16_4_ * 0.0 + auVar216._16_4_ + auVar18._16_4_ * 0.0;
            auVar287._20_4_ = auVar30._20_4_ * 0.0 + auVar216._20_4_ + auVar18._20_4_ * 0.0;
            auVar287._24_4_ = auVar30._24_4_ * 0.0 + auVar216._24_4_ + auVar18._24_4_ * 0.0;
            auVar287._28_4_ = auVar29._28_4_ + auVar216._28_4_ + auVar139._28_4_;
            auVar223 = vrcpps_avx(auVar287);
            fVar322 = auVar223._0_4_;
            fVar232 = auVar223._4_4_;
            auVar101._4_4_ = auVar287._4_4_ * fVar232;
            auVar101._0_4_ = auVar287._0_4_ * fVar322;
            fVar265 = auVar223._8_4_;
            auVar101._8_4_ = auVar287._8_4_ * fVar265;
            fVar274 = auVar223._12_4_;
            auVar101._12_4_ = auVar287._12_4_ * fVar274;
            fVar276 = auVar223._16_4_;
            auVar101._16_4_ = auVar287._16_4_ * fVar276;
            fVar277 = auVar223._20_4_;
            auVar101._20_4_ = auVar287._20_4_ * fVar277;
            fVar310 = auVar223._24_4_;
            auVar101._24_4_ = auVar287._24_4_ * fVar310;
            auVar101._28_4_ = auVar303._28_4_;
            auVar343._8_4_ = 0x3f800000;
            auVar343._0_8_ = 0x3f8000003f800000;
            auVar343._12_4_ = 0x3f800000;
            auVar343._16_4_ = 0x3f800000;
            auVar343._20_4_ = 0x3f800000;
            auVar343._24_4_ = 0x3f800000;
            auVar343._28_4_ = 0x3f800000;
            auVar223 = vsubps_avx(auVar343,auVar101);
            fVar322 = auVar223._0_4_ * fVar322 + fVar322;
            fVar232 = auVar223._4_4_ * fVar232 + fVar232;
            fVar265 = auVar223._8_4_ * fVar265 + fVar265;
            fVar274 = auVar223._12_4_ * fVar274 + fVar274;
            fVar276 = auVar223._16_4_ * fVar276 + fVar276;
            fVar277 = auVar223._20_4_ * fVar277 + fVar277;
            fVar310 = auVar223._24_4_ * fVar310 + fVar310;
            auVar102._4_4_ =
                 (fVar308 * auVar30._4_4_ + auVar18._4_4_ * fVar297 + fVar264 * auVar216._4_4_) *
                 fVar232;
            auVar102._0_4_ =
                 (fVar329 * auVar30._0_4_ + auVar18._0_4_ * fVar327 + fVar165 * auVar216._0_4_) *
                 fVar322;
            auVar102._8_4_ =
                 (fVar289 * auVar30._8_4_ + auVar18._8_4_ * fVar278 + fVar249 * auVar216._8_4_) *
                 fVar265;
            auVar102._12_4_ =
                 (fVar294 * auVar30._12_4_ + auVar18._12_4_ * fVar293 + fVar250 * auVar216._12_4_) *
                 fVar274;
            auVar102._16_4_ =
                 (fVar161 * auVar30._16_4_ + auVar18._16_4_ * fVar252 + fVar251 * auVar216._16_4_) *
                 fVar276;
            auVar102._20_4_ =
                 (fVar236 * auVar30._20_4_ + auVar18._20_4_ * fVar234 + fVar280 * auVar216._20_4_) *
                 fVar277;
            auVar102._24_4_ =
                 (fVar154 * auVar30._24_4_ + auVar18._24_4_ * fVar152 + fVar282 * auVar216._24_4_) *
                 fVar310;
            auVar102._28_4_ = auVar26._28_4_ + auVar216._28_4_;
            uVar129 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar222._4_4_ = uVar129;
            auVar222._0_4_ = uVar129;
            auVar222._8_4_ = uVar129;
            auVar222._12_4_ = uVar129;
            auVar222._16_4_ = uVar129;
            auVar222._20_4_ = uVar129;
            auVar222._24_4_ = uVar129;
            auVar222._28_4_ = uVar129;
            auVar26 = vcmpps_avx(_local_480,auVar102,2);
            auVar223 = vcmpps_avx(auVar102,auVar222,2);
            auVar223 = vandps_avx(auVar26,auVar223);
            auVar303 = auVar25 & auVar223;
            if ((((((((auVar303 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar303 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar303 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar303 >> 0x7f,0) == '\0') &&
                  (auVar303 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar303 >> 0xbf,0) == '\0') &&
                (auVar303 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar303[0x1f]) goto LAB_0093fd79;
            auVar223 = vandps_avx(auVar25,auVar223);
            auVar303 = vcmpps_avx(auVar287,ZEXT432(0) << 0x20,4);
            auVar25 = auVar223 & auVar303;
            auVar306 = ZEXT3264(CONCAT824(uStack_5e8,
                                          CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
            auVar321._4_4_ = fVar206;
            auVar321._0_4_ = fVar130;
            auVar321._8_4_ = fVar153;
            auVar321._12_4_ = fVar155;
            auVar321._16_4_ = fVar157;
            auVar321._20_4_ = fVar159;
            auVar321._24_4_ = fVar162;
            auVar321._28_4_ = fVar164;
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0x7f,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0xbf,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar25[0x1f] < '\0') {
              auVar223 = vandps_avx(auVar303,auVar223);
              auVar306 = ZEXT3264(auVar223);
              auVar103._4_4_ = fVar232 * auVar320._4_4_;
              auVar103._0_4_ = fVar322 * auVar320._0_4_;
              auVar103._8_4_ = fVar265 * auVar320._8_4_;
              auVar103._12_4_ = fVar274 * auVar320._12_4_;
              auVar103._16_4_ = fVar276 * auVar320._16_4_;
              auVar103._20_4_ = fVar277 * auVar320._20_4_;
              auVar103._24_4_ = fVar310 * auVar320._24_4_;
              auVar103._28_4_ = auVar26._28_4_;
              auVar104._4_4_ = auVar147._4_4_ * fVar232;
              auVar104._0_4_ = auVar147._0_4_ * fVar322;
              auVar104._8_4_ = auVar147._8_4_ * fVar265;
              auVar104._12_4_ = auVar147._12_4_ * fVar274;
              auVar104._16_4_ = auVar147._16_4_ * fVar276;
              auVar104._20_4_ = auVar147._20_4_ * fVar277;
              auVar104._24_4_ = auVar147._24_4_ * fVar310;
              auVar104._28_4_ = auVar147._28_4_;
              auVar263._8_4_ = 0x3f800000;
              auVar263._0_8_ = 0x3f8000003f800000;
              auVar263._12_4_ = 0x3f800000;
              auVar263._16_4_ = 0x3f800000;
              auVar263._20_4_ = 0x3f800000;
              auVar263._24_4_ = 0x3f800000;
              auVar263._28_4_ = 0x3f800000;
              auVar223 = vsubps_avx(auVar263,auVar103);
              _local_5e0 = vblendvps_avx(auVar223,auVar103,auVar243);
              auVar223 = vsubps_avx(auVar263,auVar104);
              _local_4e0 = vblendvps_avx(auVar223,auVar104,auVar243);
              local_5a0 = auVar102;
            }
          }
          auVar223 = auVar306._0_32_;
          auVar347 = ZEXT3264(_local_740);
          fVar207 = (float)local_800._0_4_;
          fVar224 = (float)local_800._4_4_;
          fVar226 = fStack_7f8;
          fVar229 = fStack_7f4;
          fVar322 = fStack_7f0;
          fVar327 = fStack_7ec;
          fVar329 = fStack_7e8;
          local_520 = auVar247;
          if ((((((((auVar223 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar223 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar223 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar223 >> 0x7f,0) != '\0') ||
                (auVar306 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
               SUB321(auVar223 >> 0xbf,0) != '\0') ||
              (auVar306 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
              auVar306[0x1f] < '\0') {
            auVar26 = vsubps_avx(auVar272,auVar321);
            fVar265 = auVar321._0_4_ + auVar26._0_4_ * (float)local_5e0._0_4_;
            fVar274 = auVar321._4_4_ + auVar26._4_4_ * (float)local_5e0._4_4_;
            fVar276 = auVar321._8_4_ + auVar26._8_4_ * fStack_5d8;
            fVar277 = auVar321._12_4_ + auVar26._12_4_ * fStack_5d4;
            fVar297 = auVar321._16_4_ + auVar26._16_4_ * fStack_5d0;
            fVar308 = auVar321._20_4_ + auVar26._20_4_ * fStack_5cc;
            fVar310 = auVar321._24_4_ + auVar26._24_4_ * fStack_5c8;
            fVar312 = auVar321._28_4_ + auVar26._28_4_;
            fVar232 = *(float *)((long)local_748->ray_space + k * 4 + -0x20);
            auVar105._4_4_ = (fVar274 + fVar274) * fVar232;
            auVar105._0_4_ = (fVar265 + fVar265) * fVar232;
            auVar105._8_4_ = (fVar276 + fVar276) * fVar232;
            auVar105._12_4_ = (fVar277 + fVar277) * fVar232;
            auVar105._16_4_ = (fVar297 + fVar297) * fVar232;
            auVar105._20_4_ = (fVar308 + fVar308) * fVar232;
            auVar105._24_4_ = (fVar310 + fVar310) * fVar232;
            auVar105._28_4_ = fVar312 + fVar312;
            auVar26 = vcmpps_avx(local_5a0,auVar105,6);
            auVar303 = auVar223 & auVar26;
            auVar273 = ZEXT3264(_local_7c0);
            if ((((((((auVar303 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar303 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar303 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar303 >> 0x7f,0) != '\0') ||
                  (auVar303 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar303 >> 0xbf,0) != '\0') ||
                (auVar303 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar303[0x1f] < '\0') {
              auVar202 = ZEXT3264(CONCAT428(0xbf800000,
                                            CONCAT424(0xbf800000,
                                                      CONCAT420(0xbf800000,
                                                                CONCAT416(0xbf800000,
                                                                          CONCAT412(0xbf800000,
                                                                                    CONCAT48(
                                                  0xbf800000,0xbf800000bf800000)))))));
              local_3a0 = (float)local_4e0._0_4_ + (float)local_4e0._0_4_ + -1.0;
              fStack_39c = (float)local_4e0._4_4_ + (float)local_4e0._4_4_ + -1.0;
              fStack_398 = (float)uStack_4d8 + (float)uStack_4d8 + -1.0;
              fStack_394 = uStack_4d8._4_4_ + uStack_4d8._4_4_ + -1.0;
              fStack_390 = (float)uStack_4d0 + (float)uStack_4d0 + -1.0;
              fStack_38c = uStack_4d0._4_4_ + uStack_4d0._4_4_ + -1.0;
              fStack_388 = (float)uStack_4c8 + (float)uStack_4c8 + -1.0;
              fStack_384 = uStack_4c8._4_4_ + uStack_4c8._4_4_ + -1.0;
              local_3c0 = _local_5e0;
              local_4e0._4_4_ = fStack_39c;
              local_4e0._0_4_ = local_3a0;
              uStack_4d8._0_4_ = fStack_398;
              uStack_4d8._4_4_ = fStack_394;
              uStack_4d0._0_4_ = fStack_390;
              uStack_4d0._4_4_ = fStack_38c;
              auVar117 = _local_4e0;
              uStack_4c8._0_4_ = fStack_388;
              uStack_4c8._4_4_ = fStack_384;
              auVar303 = _local_4e0;
              local_380 = local_5a0;
              uStack_348 = uStack_8e8;
              uStack_338 = uStack_858;
              uStack_328 = uStack_868;
              pGVar14 = (context->scene->geometries).items[local_770].ptr;
              if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                local_640 = vandps_avx(auVar26,auVar223);
                auVar194._0_4_ = (float)(int)local_360;
                auVar194._4_12_ = auVar255._4_12_;
                auVar170 = vshufps_avx(auVar194,auVar194,0);
                local_2e0[0] = (auVar170._0_4_ + (float)local_5e0._0_4_ + 0.0) *
                               (float)local_140._0_4_;
                local_2e0[1] = (auVar170._4_4_ + (float)local_5e0._4_4_ + 1.0) *
                               (float)local_140._4_4_;
                local_2e0[2] = (auVar170._8_4_ + fStack_5d8 + 2.0) * fStack_138;
                local_2e0[3] = (auVar170._12_4_ + fStack_5d4 + 3.0) * fStack_134;
                fStack_2d0 = (auVar170._0_4_ + fStack_5d0 + 4.0) * fStack_130;
                fStack_2cc = (auVar170._4_4_ + fStack_5cc + 5.0) * fStack_12c;
                fStack_2c8 = (auVar170._8_4_ + fStack_5c8 + 6.0) * fStack_128;
                fStack_2c4 = auVar170._12_4_ + fStack_5c4 + 7.0;
                uStack_4d0 = auVar117._16_8_;
                uStack_4c8 = auVar303._24_8_;
                local_2c0 = local_4e0;
                uStack_2b8 = uStack_4d8;
                uStack_2b0 = uStack_4d0;
                uStack_2a8 = uStack_4c8;
                local_2a0 = local_5a0;
                auVar177._8_4_ = 0x7f800000;
                auVar177._0_8_ = 0x7f8000007f800000;
                auVar177._12_4_ = 0x7f800000;
                auVar177._16_4_ = 0x7f800000;
                auVar177._20_4_ = 0x7f800000;
                auVar177._24_4_ = 0x7f800000;
                auVar177._28_4_ = 0x7f800000;
                auVar223 = vblendvps_avx(auVar177,local_5a0,local_640);
                auVar26 = vshufps_avx(auVar223,auVar223,0xb1);
                auVar26 = vminps_avx(auVar223,auVar26);
                auVar25 = vshufpd_avx(auVar26,auVar26,5);
                auVar26 = vminps_avx(auVar26,auVar25);
                auVar25 = vperm2f128_avx(auVar26,auVar26,1);
                auVar26 = vminps_avx(auVar26,auVar25);
                auVar26 = vcmpps_avx(auVar223,auVar26,0);
                auVar25 = local_640 & auVar26;
                auVar223 = local_640;
                if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar25 >> 0x7f,0) != '\0') ||
                      (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar25 >> 0xbf,0) != '\0') ||
                    (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar25[0x1f] < '\0') {
                  auVar223 = vandps_avx(auVar26,local_640);
                }
                uVar121 = vmovmskps_avx(auVar223);
                uVar125 = 0;
                if (uVar121 != 0) {
                  for (; (uVar121 >> uVar125 & 1) == 0; uVar125 = uVar125 + 1) {
                  }
                }
                uVar124 = (ulong)uVar125;
                _local_4e0 = auVar303;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar322 = local_2e0[uVar124];
                  fVar329 = 1.0 - fVar322;
                  fVar327 = fVar322 * 3.0;
                  auVar170 = ZEXT416((uint)((fVar329 * -2.0 * fVar322 + fVar322 * fVar322) * 0.5));
                  auVar170 = vshufps_avx(auVar170,auVar170,0);
                  auVar195 = ZEXT416((uint)(((fVar329 + fVar329) * (fVar327 + 2.0) +
                                            fVar329 * fVar329 * -3.0) * 0.5));
                  auVar195 = vshufps_avx(auVar195,auVar195,0);
                  auVar196 = ZEXT416((uint)(((fVar322 + fVar322) * (fVar327 + -5.0) +
                                            fVar322 * fVar327) * 0.5));
                  auVar196 = vshufps_avx(auVar196,auVar196,0);
                  uVar125 = *(uint *)((long)&local_2c0 + uVar124 * 4);
                  auVar202 = ZEXT464(uVar125);
                  auVar213 = ZEXT416((uint)((fVar322 * (fVar329 + fVar329) - fVar329 * fVar329) *
                                           0.5));
                  auVar213 = vshufps_avx(auVar213,auVar213,0);
                  auVar171._0_4_ =
                       auVar213._0_4_ * fVar266 +
                       auVar196._0_4_ * fVar351 +
                       auVar170._0_4_ * auVar337._0_4_ + auVar195._0_4_ * fVar360;
                  auVar171._4_4_ =
                       auVar213._4_4_ * fVar275 +
                       auVar196._4_4_ * fVar356 +
                       auVar170._4_4_ * auVar337._4_4_ + auVar195._4_4_ * fVar365;
                  auVar171._8_4_ =
                       auVar213._8_4_ * auVar269._8_4_ +
                       auVar196._8_4_ * auVar353._8_4_ +
                       auVar170._8_4_ * auVar337._8_4_ + auVar195._8_4_ * auVar362._8_4_;
                  auVar171._12_4_ =
                       auVar213._12_4_ * auVar269._12_4_ +
                       auVar196._12_4_ * auVar353._12_4_ +
                       auVar170._12_4_ * auVar337._12_4_ + auVar195._12_4_ * auVar362._12_4_;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar124 * 4);
                  *(float *)(ray + k * 4 + 0x180) = auVar171._0_4_;
                  uVar129 = vextractps_avx(auVar171,1);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar129;
                  uVar129 = vextractps_avx(auVar171,2);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar129;
                  *(float *)(ray + k * 4 + 0x1e0) = fVar322;
                  *(uint *)(ray + k * 4 + 0x200) = uVar125;
                  *(uint *)(ray + k * 4 + 0x220) = uVar12;
                  *(int *)(ray + k * 4 + 0x240) = (int)local_770;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                }
                else {
                  stack0xfffffffffffff928 = auVar262._8_24_;
                  stack0xfffffffffffff824 = auVar341._4_28_;
                  local_7e0._0_4_ = local_35c;
                  auVar195 = *local_758;
                  auVar170 = *local_758;
                  uVar106 = *(undefined8 *)(local_760 + 0x10);
                  uVar107 = *(undefined8 *)(local_760 + 0x18);
                  uStack_810 = uVar106;
                  uStack_808 = uVar107;
                  auVar307 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                  auVar223 = vcmpps_avx(auVar174,auVar174,0xf);
                  auVar306 = ZEXT3264(auVar223);
                  _local_500 = *pauVar10;
                  local_350 = auVar269._0_8_;
                  local_340 = auVar353._0_8_;
                  local_330 = auVar362._0_8_;
                  local_320 = auVar337;
                  while( true ) {
                    local_200 = local_2e0[uVar124];
                    local_1e0 = *(undefined4 *)((long)&local_2c0 + uVar124 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2a0 + uVar124 * 4);
                    fVar327 = 1.0 - local_200;
                    fVar322 = local_200 * 3.0;
                    auVar196 = ZEXT416((uint)((fVar327 * -2.0 * local_200 + local_200 * local_200) *
                                             0.5));
                    auVar196 = vshufps_avx(auVar196,auVar196,0);
                    auVar213 = ZEXT416((uint)(((fVar327 + fVar327) * (fVar322 + 2.0) +
                                              fVar327 * fVar327 * -3.0) * 0.5));
                    auVar213 = vshufps_avx(auVar213,auVar213,0);
                    auVar214 = ZEXT416((uint)(((local_200 + local_200) * (fVar322 + -5.0) +
                                              local_200 * fVar322) * 0.5));
                    auVar214 = vshufps_avx(auVar214,auVar214,0);
                    local_850.context = context->user;
                    auVar215 = ZEXT416((uint)((local_200 * (fVar327 + fVar327) - fVar327 * fVar327)
                                             * 0.5));
                    auVar215 = vshufps_avx(auVar215,auVar215,0);
                    auVar197._0_4_ =
                         auVar215._0_4_ * fVar266 +
                         auVar214._0_4_ * fVar351 +
                         auVar196._0_4_ * auVar337._0_4_ + auVar213._0_4_ * fVar360;
                    auVar197._4_4_ =
                         auVar215._4_4_ * fVar275 +
                         auVar214._4_4_ * fVar356 +
                         auVar196._4_4_ * auVar337._4_4_ + auVar213._4_4_ * fVar365;
                    auVar197._8_4_ =
                         auVar215._8_4_ * auVar269._8_4_ +
                         auVar214._8_4_ * auVar353._8_4_ +
                         auVar196._8_4_ * auVar337._8_4_ + auVar213._8_4_ * auVar362._8_4_;
                    auVar197._12_4_ =
                         auVar215._12_4_ * auVar269._12_4_ +
                         auVar214._12_4_ * auVar353._12_4_ +
                         auVar196._12_4_ * auVar337._12_4_ + auVar213._12_4_ * auVar362._12_4_;
                    auStack_250 = vshufps_avx(auVar197,auVar197,0);
                    local_260[0] = (RTCHitN)auStack_250[0];
                    local_260[1] = (RTCHitN)auStack_250[1];
                    local_260[2] = (RTCHitN)auStack_250[2];
                    local_260[3] = (RTCHitN)auStack_250[3];
                    local_260[4] = (RTCHitN)auStack_250[4];
                    local_260[5] = (RTCHitN)auStack_250[5];
                    local_260[6] = (RTCHitN)auStack_250[6];
                    local_260[7] = (RTCHitN)auStack_250[7];
                    local_260[8] = (RTCHitN)auStack_250[8];
                    local_260[9] = (RTCHitN)auStack_250[9];
                    local_260[10] = (RTCHitN)auStack_250[10];
                    local_260[0xb] = (RTCHitN)auStack_250[0xb];
                    local_260[0xc] = (RTCHitN)auStack_250[0xc];
                    local_260[0xd] = (RTCHitN)auStack_250[0xd];
                    local_260[0xe] = (RTCHitN)auStack_250[0xe];
                    local_260[0xf] = (RTCHitN)auStack_250[0xf];
                    auStack_230 = vshufps_avx(auVar197,auVar197,0x55);
                    local_240 = auStack_230;
                    auStack_210 = vshufps_avx(auVar197,auVar197,0xaa);
                    local_220 = auStack_210;
                    fStack_1fc = local_200;
                    fStack_1f8 = local_200;
                    fStack_1f4 = local_200;
                    fStack_1f0 = local_200;
                    fStack_1ec = local_200;
                    fStack_1e8 = local_200;
                    fStack_1e4 = local_200;
                    uStack_1dc = local_1e0;
                    uStack_1d8 = local_1e0;
                    uStack_1d4 = local_1e0;
                    uStack_1d0 = local_1e0;
                    uStack_1cc = local_1e0;
                    uStack_1c8 = local_1e0;
                    uStack_1c4 = local_1e0;
                    local_1c0 = local_120._0_8_;
                    uStack_1b8 = local_120._8_8_;
                    uStack_1b0 = local_120._16_8_;
                    uStack_1a8 = local_120._24_8_;
                    local_1a0 = local_540._0_8_;
                    uStack_198 = local_540._8_8_;
                    uStack_190 = local_540._16_8_;
                    uStack_188 = local_540._24_8_;
                    local_750[1] = auVar306._0_32_;
                    *local_750 = auVar306._0_32_;
                    local_180 = (local_850.context)->instID[0];
                    uStack_17c = local_180;
                    uStack_178 = local_180;
                    uStack_174 = local_180;
                    uStack_170 = local_180;
                    uStack_16c = local_180;
                    uStack_168 = local_180;
                    uStack_164 = local_180;
                    local_160 = (local_850.context)->instPrimID[0];
                    uStack_15c = local_160;
                    uStack_158 = local_160;
                    uStack_154 = local_160;
                    uStack_150 = local_160;
                    uStack_14c = local_160;
                    uStack_148 = local_160;
                    uStack_144 = local_160;
                    local_8e0 = auVar195._0_8_;
                    uStack_8d8 = auVar195._8_8_;
                    local_7a0 = local_8e0;
                    uStack_798 = uStack_8d8;
                    local_850.valid = (int *)&local_7a0;
                    local_850.geometryUserPtr = pGVar14->userPtr;
                    local_850.hit = local_260;
                    local_850.N = 8;
                    auVar137 = _local_820;
                    auVar172 = auVar170;
                    local_850.ray = (RTCRayN *)ray;
                    uStack_790 = uVar106;
                    uStack_788 = uVar107;
                    if (pGVar14->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar223 = ZEXT1632(auVar306._0_16_);
                      auVar355 = ZEXT1664(auVar355._0_16_);
                      (*pGVar14->intersectionFilterN)(&local_850);
                      auVar307 = ZEXT1664(auVar307._0_16_);
                      auVar223 = vcmpps_avx(auVar223,auVar223,0xf);
                      auVar306 = ZEXT3264(auVar223);
                      auVar172._8_8_ = uStack_798;
                      auVar172._0_8_ = local_7a0;
                      auVar137._8_8_ = uStack_788;
                      auVar137._0_8_ = uStack_790;
                    }
                    auVar196 = vpcmpeqd_avx(auVar172,ZEXT816(0) << 0x40);
                    auVar213 = vpcmpeqd_avx(auVar137,ZEXT816(0) << 0x40);
                    auVar200._16_16_ = auVar213;
                    auVar200._0_16_ = auVar196;
                    auVar223 = auVar306._0_32_ & ~auVar200;
                    if ((((((((auVar223 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar223 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar223 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar223 >> 0x7f,0) == '\0') &&
                          (auVar223 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar223 >> 0xbf,0) == '\0') &&
                        (auVar223 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar223[0x1f]) {
                      auVar148._0_4_ = auVar306._0_4_ ^ auVar196._0_4_;
                      auVar148._4_4_ = auVar306._4_4_ ^ auVar196._4_4_;
                      auVar148._8_4_ = auVar306._8_4_ ^ auVar196._8_4_;
                      auVar148._12_4_ = auVar306._12_4_ ^ auVar196._12_4_;
                      auVar148._16_4_ = auVar306._16_4_ ^ auVar213._0_4_;
                      auVar148._20_4_ = auVar306._20_4_ ^ auVar213._4_4_;
                      auVar148._24_4_ = auVar306._24_4_ ^ auVar213._8_4_;
                      auVar148._28_4_ = auVar306._28_4_ ^ auVar213._12_4_;
                    }
                    else {
                      p_Var17 = context->args->filter;
                      if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar223 = ZEXT1632(auVar306._0_16_);
                        auVar355 = ZEXT1664(auVar355._0_16_);
                        (*p_Var17)(&local_850);
                        auVar307 = ZEXT1664(auVar307._0_16_);
                        auVar223 = vcmpps_avx(auVar223,auVar223,0xf);
                        auVar306 = ZEXT3264(auVar223);
                        auVar172._8_8_ = uStack_798;
                        auVar172._0_8_ = local_7a0;
                        auVar137._8_8_ = uStack_788;
                        auVar137._0_8_ = uStack_790;
                      }
                      auVar196 = vpcmpeqd_avx(auVar172,ZEXT816(0) << 0x40);
                      auVar213 = vpcmpeqd_avx(auVar137,ZEXT816(0) << 0x40);
                      auVar178._16_16_ = auVar213;
                      auVar178._0_16_ = auVar196;
                      auVar148._0_4_ = auVar306._0_4_ ^ auVar196._0_4_;
                      auVar148._4_4_ = auVar306._4_4_ ^ auVar196._4_4_;
                      auVar148._8_4_ = auVar306._8_4_ ^ auVar196._8_4_;
                      auVar148._12_4_ = auVar306._12_4_ ^ auVar196._12_4_;
                      auVar148._16_4_ = auVar306._16_4_ ^ auVar213._0_4_;
                      auVar148._20_4_ = auVar306._20_4_ ^ auVar213._4_4_;
                      auVar148._24_4_ = auVar306._24_4_ ^ auVar213._8_4_;
                      auVar148._28_4_ = auVar306._28_4_ ^ auVar213._12_4_;
                      auVar223 = auVar306._0_32_ & ~auVar178;
                      if ((((((((auVar223 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar223 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar223 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar223 >> 0x7f,0) != '\0') ||
                            (auVar223 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar223 >> 0xbf,0) != '\0') ||
                          (auVar223 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar223[0x1f] < '\0') {
                        auVar223 = vmaskmovps_avx(auVar148,*(undefined1 (*) [32])local_850.hit);
                        *(undefined1 (*) [32])(local_850.ray + 0x180) = auVar223;
                        auVar223 = vmaskmovps_avx(auVar148,*(undefined1 (*) [32])
                                                            (local_850.hit + 0x20));
                        *(undefined1 (*) [32])(local_850.ray + 0x1a0) = auVar223;
                        auVar223 = vmaskmovps_avx(auVar148,*(undefined1 (*) [32])
                                                            (local_850.hit + 0x40));
                        *(undefined1 (*) [32])(local_850.ray + 0x1c0) = auVar223;
                        auVar223 = vmaskmovps_avx(auVar148,*(undefined1 (*) [32])
                                                            (local_850.hit + 0x60));
                        *(undefined1 (*) [32])(local_850.ray + 0x1e0) = auVar223;
                        auVar223 = vmaskmovps_avx(auVar148,*(undefined1 (*) [32])
                                                            (local_850.hit + 0x80));
                        *(undefined1 (*) [32])(local_850.ray + 0x200) = auVar223;
                        auVar223 = vmaskmovps_avx(auVar148,*(undefined1 (*) [32])
                                                            (local_850.hit + 0xa0));
                        *(undefined1 (*) [32])(local_850.ray + 0x220) = auVar223;
                        auVar223 = vmaskmovps_avx(auVar148,*(undefined1 (*) [32])
                                                            (local_850.hit + 0xc0));
                        *(undefined1 (*) [32])(local_850.ray + 0x240) = auVar223;
                        auVar223 = vmaskmovps_avx(auVar148,*(undefined1 (*) [32])
                                                            (local_850.hit + 0xe0));
                        *(undefined1 (*) [32])(local_850.ray + 0x260) = auVar223;
                        auVar223 = vmaskmovps_avx(auVar148,*(undefined1 (*) [32])
                                                            (local_850.hit + 0x100));
                        *(undefined1 (*) [32])(local_850.ray + 0x280) = auVar223;
                      }
                    }
                    auVar223 = local_5a0;
                    if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar148 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar148 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar148 >> 0x7f,0) == '\0') &&
                          (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar148 >> 0xbf,0) == '\0') &&
                        (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar148[0x1f]) {
                      *(int *)(ray + k * 4 + 0x100) = auVar307._0_4_;
                    }
                    else {
                      auVar307 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                    }
                    *(undefined4 *)(local_640 + uVar124 * 4) = 0;
                    auVar196 = vshufps_avx(auVar307._0_16_,auVar307._0_16_,0);
                    auVar149._16_16_ = auVar196;
                    auVar149._0_16_ = auVar196;
                    auVar303 = vcmpps_avx(auVar223,auVar149,2);
                    auVar202 = ZEXT3264(local_640);
                    auVar26 = vandps_avx(auVar303,local_640);
                    local_640 = local_640 & auVar303;
                    if ((((((((local_640 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             && (local_640 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_640 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(local_640 >> 0x7f,0) == '\0') &&
                          (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(local_640 >> 0xbf,0) == '\0') &&
                        (local_640 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < local_640[0x1f]) break;
                    auVar179._8_4_ = 0x7f800000;
                    auVar179._0_8_ = 0x7f8000007f800000;
                    auVar179._12_4_ = 0x7f800000;
                    auVar179._16_4_ = 0x7f800000;
                    auVar179._20_4_ = 0x7f800000;
                    auVar179._24_4_ = 0x7f800000;
                    auVar179._28_4_ = 0x7f800000;
                    auVar223 = vblendvps_avx(auVar179,auVar223,auVar26);
                    auVar303 = vshufps_avx(auVar223,auVar223,0xb1);
                    auVar303 = vminps_avx(auVar223,auVar303);
                    auVar25 = vshufpd_avx(auVar303,auVar303,5);
                    auVar303 = vminps_avx(auVar303,auVar25);
                    auVar25 = vperm2f128_avx(auVar303,auVar303,1);
                    auVar303 = vminps_avx(auVar303,auVar25);
                    auVar303 = vcmpps_avx(auVar223,auVar303,0);
                    auVar25 = auVar26 & auVar303;
                    auVar223 = auVar26;
                    if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar25 >> 0x7f,0) != '\0') ||
                          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar25 >> 0xbf,0) != '\0') ||
                        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar25[0x1f] < '\0') {
                      auVar223 = vandps_avx(auVar303,auVar26);
                    }
                    uVar121 = vmovmskps_avx(auVar223);
                    uVar125 = 0;
                    if (uVar121 != 0) {
                      for (; (uVar121 >> uVar125 & 1) == 0; uVar125 = uVar125 + 1) {
                      }
                    }
                    uVar124 = (ulong)uVar125;
                    local_640 = auVar26;
                  }
                  auVar347 = ZEXT3264(_local_740);
                  auVar273 = ZEXT3264(_local_7c0);
                  local_35c = local_7e0._0_4_;
                }
                fVar207 = (float)local_800._0_4_;
                fVar224 = (float)local_800._4_4_;
                fVar226 = fStack_7f8;
                fVar229 = fStack_7f4;
                fVar322 = fStack_7f0;
                fVar327 = fStack_7ec;
                fVar329 = fStack_7e8;
              }
              fVar323 = (float)local_720._0_4_;
              fVar328 = (float)local_720._4_4_;
              fVar330 = fStack_718;
              fVar332 = fStack_714;
              fVar331 = fStack_710;
              fVar167 = fStack_70c;
              fVar183 = fStack_708;
              fVar185 = fStack_704;
              goto LAB_0093fa58;
            }
          }
          auVar273 = ZEXT3264(_local_7c0);
        }
LAB_0093fa58:
        auVar306 = ZEXT3264(auVar144);
        lVar126 = lVar126 + 8;
      }
    }
    uVar129 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar135._4_4_ = uVar129;
    auVar135._0_4_ = uVar129;
    auVar135._8_4_ = uVar129;
    auVar135._12_4_ = uVar129;
    auVar170 = vcmpps_avx(local_3d0,auVar135,2);
    uVar125 = vmovmskps_avx(auVar170);
    uVar123 = (ulong)((uint)uVar123 & (uint)uVar123 + 0xf & uVar125);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }